

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNv_intersector.h
# Opt level: O2

bool embree::avx::CurveNvIntersector1<4>::
     occluded_t<embree::avx::SweepCurve1Intersector1<embree::BSplineCurveT>,embree::avx::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  undefined4 uVar1;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar2;
  anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1 aVar3;
  undefined1 auVar4 [16];
  Primitive PVar5;
  Geometry *pGVar6;
  RTCFilterFunctionN p_Var7;
  long lVar8;
  undefined1 auVar9 [32];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [16];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  undefined1 auVar20 [32];
  undefined1 auVar21 [32];
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined4 uVar47;
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [32];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  ulong uVar66;
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  byte bVar76;
  uint uVar77;
  long lVar78;
  ulong uVar79;
  ulong extraout_RAX;
  ulong extraout_RAX_00;
  ulong extraout_RAX_01;
  ulong extraout_RAX_02;
  ulong extraout_RAX_03;
  ulong extraout_RAX_04;
  ulong extraout_RAX_05;
  ulong extraout_RAX_06;
  uint uVar80;
  uint uVar81;
  ulong uVar82;
  byte bVar83;
  ulong uVar84;
  uint uVar85;
  bool bVar86;
  float fVar87;
  float fVar113;
  float fVar114;
  vint4 bi_2;
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  float fVar116;
  float fVar118;
  float fVar120;
  undefined1 auVar104 [32];
  undefined1 auVar105 [32];
  undefined1 auVar106 [32];
  float fVar115;
  float fVar117;
  float fVar119;
  float fVar121;
  undefined1 auVar107 [32];
  undefined1 auVar108 [32];
  undefined1 auVar90 [16];
  undefined1 auVar109 [32];
  undefined1 auVar110 [32];
  undefined1 auVar111 [32];
  undefined1 auVar112 [32];
  float fVar122;
  float fVar144;
  float fVar146;
  vint4 bi_1;
  undefined1 auVar124 [16];
  undefined1 auVar125 [16];
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aVar148;
  undefined1 auVar126 [16];
  float fVar123;
  undefined1 auVar127 [16];
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  float fVar149;
  undefined1 auVar132 [32];
  float fVar145;
  float fVar147;
  float fVar150;
  undefined1 auVar133 [32];
  undefined1 auVar134 [32];
  undefined1 auVar135 [32];
  undefined1 auVar136 [32];
  undefined1 auVar137 [32];
  undefined1 auVar138 [32];
  undefined1 auVar139 [32];
  undefined1 auVar140 [32];
  undefined1 auVar141 [32];
  undefined1 auVar142 [32];
  undefined1 auVar143 [32];
  float fVar151;
  float fVar170;
  float fVar171;
  vint4 ai;
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar160 [16];
  float fVar172;
  undefined1 auVar161 [32];
  undefined1 auVar162 [32];
  undefined1 auVar163 [32];
  undefined1 auVar164 [32];
  undefined1 auVar157 [16];
  undefined1 auVar165 [32];
  undefined1 auVar166 [32];
  undefined1 auVar167 [32];
  undefined1 auVar168 [32];
  undefined1 auVar169 [32];
  float fVar173;
  float fVar192;
  float fVar193;
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar176 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar179 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar182 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  float fVar194;
  undefined1 auVar187 [32];
  undefined1 auVar188 [32];
  undefined1 auVar189 [32];
  undefined1 auVar190 [32];
  undefined1 auVar191 [32];
  vint4 bi;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  undefined1 auVar204 [16];
  undefined1 auVar205 [28];
  undefined1 auVar206 [32];
  undefined1 auVar207 [32];
  undefined1 auVar208 [32];
  undefined1 auVar209 [32];
  float fVar210;
  float fVar227;
  float fVar228;
  vint4 ai_2;
  undefined1 auVar211 [16];
  float fVar229;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  undefined1 auVar215 [16];
  undefined1 auVar216 [28];
  float fVar232;
  undefined1 auVar217 [32];
  undefined1 auVar218 [32];
  undefined1 auVar219 [32];
  undefined1 auVar220 [32];
  undefined1 auVar221 [32];
  undefined1 auVar222 [32];
  undefined1 auVar223 [32];
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  float fVar230;
  float fVar231;
  undefined1 auVar226 [64];
  float fVar233;
  float fVar234;
  float fVar241;
  float fVar244;
  vint4 ai_1;
  undefined1 auVar235 [16];
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar238 [16];
  float fVar242;
  float fVar243;
  float fVar245;
  float fVar246;
  float fVar247;
  float fVar248;
  float fVar249;
  float fVar251;
  float fVar252;
  float fVar254;
  float fVar255;
  float fVar257;
  float fVar258;
  undefined1 auVar239 [32];
  float fVar250;
  float fVar253;
  float fVar256;
  undefined1 auVar240 [64];
  float fVar259;
  float fVar265;
  float fVar266;
  undefined1 auVar260 [16];
  undefined1 auVar261 [16];
  undefined1 auVar262 [16];
  float fVar267;
  undefined1 auVar263 [32];
  float fVar268;
  float fVar269;
  float fVar270;
  undefined1 auVar264 [64];
  float fVar271;
  float fVar272;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  undefined1 auVar277 [16];
  undefined1 auVar278 [16];
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  float fVar287;
  float fVar288;
  float fVar289;
  float fVar290;
  float fVar291;
  float fVar292;
  float fVar293;
  float fVar294;
  float fVar295;
  float fVar296;
  float fVar297;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  float fVar304;
  float fVar305;
  float fVar306;
  float fVar307;
  float fVar308;
  float fVar309;
  float fVar310;
  float fVar311;
  float fVar312;
  float fVar313;
  float fVar314;
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  undefined1 auVar281 [32];
  undefined1 auVar282 [32];
  undefined1 auVar315 [16];
  float fVar319;
  float fVar320;
  undefined1 auVar316 [32];
  undefined1 auVar317 [32];
  undefined1 auVar318 [64];
  float fVar321;
  undefined1 auVar322 [16];
  float fVar330;
  float fVar334;
  undefined1 auVar323 [32];
  undefined1 auVar324 [32];
  undefined1 auVar325 [32];
  undefined1 auVar326 [32];
  float fVar328;
  float fVar329;
  float fVar331;
  float fVar332;
  float fVar333;
  undefined1 auVar327 [64];
  float fVar335;
  float fVar336;
  float fVar340;
  float fVar342;
  float fVar344;
  float fVar346;
  float fVar348;
  float fVar350;
  float fVar351;
  undefined1 auVar337 [32];
  float fVar339;
  float fVar341;
  float fVar343;
  float fVar345;
  float fVar347;
  float fVar349;
  undefined1 auVar338 [64];
  float fVar352;
  float fVar357;
  float fVar358;
  undefined1 auVar353 [16];
  float fVar360;
  float fVar361;
  float fVar362;
  undefined1 auVar354 [32];
  float fVar359;
  undefined1 auVar355 [32];
  undefined1 auVar363 [16];
  undefined1 auVar364 [32];
  undefined1 auVar365 [32];
  undefined1 auVar366 [32];
  undefined1 auVar367 [32];
  float fVar368;
  float fVar370;
  float fVar371;
  float fVar372;
  float fVar373;
  float fVar374;
  float fVar375;
  undefined1 auVar369 [32];
  undefined1 auVar376 [32];
  RTCFilterFunctionNArguments args;
  BBox<embree::vfloat_impl<8>_> tp1;
  BBox<embree::vfloat_impl<8>_> tp0;
  StackEntry stack [3];
  uint local_b54;
  undefined1 local_b00 [8];
  float fStack_af8;
  float fStack_af4;
  float fStack_af0;
  float fStack_aec;
  float fStack_ae8;
  float fStack_ae4;
  undefined1 local_ae0 [8];
  float fStack_ad8;
  float fStack_ad4;
  float fStack_ad0;
  float fStack_acc;
  float fStack_ac8;
  int local_a84;
  undefined1 local_a80 [8];
  float fStack_a78;
  float fStack_a74;
  undefined1 auStack_a70 [16];
  undefined1 local_a60 [32];
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_9f0 [8];
  float fStack_9e8;
  float fStack_9e4;
  undefined1 local_9e0 [8];
  float fStack_9d8;
  float fStack_9d4;
  undefined1 local_9d0 [8];
  float fStack_9c8;
  float fStack_9c4;
  undefined1 local_9c0 [8];
  float fStack_9b8;
  float fStack_9b4;
  RTCFilterFunctionNArguments local_9b0;
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [32];
  undefined8 local_930;
  undefined4 local_928;
  float local_924;
  undefined4 local_920;
  undefined4 local_91c;
  uint local_918;
  uint local_914;
  uint local_910;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined1 local_8c0 [32];
  undefined1 local_8a0 [32];
  float local_880;
  float fStack_87c;
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  float fStack_864;
  float local_860;
  float fStack_85c;
  float fStack_858;
  anon_union_4_3_4e909a83_for_anon_struct_16_4_dc41325d_for_anon_union_16_2_47237d3f_for_Vec3fx_0_1_3
  aStack_854;
  float fStack_850;
  float fStack_84c;
  float fStack_848;
  float fStack_844;
  undefined1 local_830 [16];
  Primitive *local_818;
  ulong local_810;
  ulong local_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [8];
  float fStack_7d8;
  float fStack_7d4;
  float fStack_7d0;
  float fStack_7cc;
  float fStack_7c8;
  float fStack_7c4;
  undefined1 local_7c0 [32];
  float local_7a0;
  float fStack_79c;
  float fStack_798;
  float fStack_794;
  float fStack_790;
  float fStack_78c;
  float fStack_788;
  float fStack_784;
  float local_780;
  float fStack_77c;
  float fStack_778;
  float fStack_774;
  float fStack_770;
  float fStack_76c;
  float fStack_768;
  float fStack_764;
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_700 [16];
  float fStack_6f0;
  float fStack_6ec;
  float fStack_6e8;
  float fStack_6e4;
  undefined1 local_6e0 [32];
  undefined1 local_6c0 [8];
  float fStack_6b8;
  float fStack_6b4;
  float fStack_6b0;
  float fStack_6ac;
  float fStack_6a8;
  float fStack_6a4;
  undefined1 local_6a0 [32];
  undefined1 local_680 [32];
  undefined1 local_660 [32];
  undefined1 local_640 [32];
  float local_620;
  float fStack_61c;
  float fStack_618;
  float fStack_614;
  float fStack_610;
  float fStack_60c;
  float fStack_608;
  float fStack_604;
  undefined1 local_600 [16];
  undefined1 local_5f0 [16];
  undefined1 local_5e0 [8];
  float fStack_5d8;
  float fStack_5d4;
  float fStack_5d0;
  float fStack_5cc;
  float fStack_5c8;
  float fStack_5c4;
  undefined1 local_5c0 [32];
  undefined1 local_5a0 [32];
  undefined1 local_580 [32];
  float local_560;
  float fStack_55c;
  float fStack_558;
  float fStack_554;
  float fStack_550;
  float fStack_54c;
  float fStack_548;
  float fStack_544;
  undefined1 local_540 [32];
  undefined1 local_520 [32];
  undefined1 local_500 [8];
  float fStack_4f8;
  float fStack_4f4;
  float fStack_4f0;
  float fStack_4ec;
  float fStack_4e8;
  undefined1 local_4e0 [8];
  float fStack_4d8;
  float fStack_4d4;
  float fStack_4d0;
  float fStack_4cc;
  float fStack_4c8;
  undefined1 local_4c0 [8];
  float fStack_4b8;
  float fStack_4b4;
  float fStack_4b0;
  float fStack_4ac;
  float fStack_4a8;
  undefined1 local_4a0 [8];
  float fStack_498;
  float fStack_494;
  float fStack_490;
  float fStack_48c;
  float fStack_488;
  undefined1 local_480 [8];
  float fStack_478;
  float fStack_474;
  float fStack_470;
  float fStack_46c;
  float fStack_468;
  undefined1 local_460 [8];
  float fStack_458;
  float fStack_454;
  float fStack_450;
  float fStack_44c;
  float fStack_448;
  undefined1 local_440 [8];
  float fStack_438;
  float fStack_434;
  float fStack_430;
  float fStack_42c;
  float fStack_428;
  undefined1 local_420 [8];
  float fStack_418;
  float fStack_414;
  float fStack_410;
  float fStack_40c;
  float fStack_408;
  undefined1 local_400 [8];
  float fStack_3f8;
  float fStack_3f4;
  float fStack_3f0;
  float fStack_3ec;
  float fStack_3e8;
  undefined1 local_3e0 [32];
  undefined1 local_3c0 [32];
  undefined1 local_3a0 [32];
  float local_380;
  float fStack_37c;
  float fStack_378;
  float fStack_374;
  float fStack_370;
  float fStack_36c;
  float fStack_368;
  undefined4 uStack_364;
  float local_360;
  float fStack_35c;
  float fStack_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  float fStack_348;
  undefined4 uStack_344;
  undefined1 local_340 [32];
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  undefined1 local_2e0 [32];
  undefined1 local_2c0 [32];
  undefined1 local_2a0 [32];
  undefined1 local_280 [8];
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  undefined1 local_260 [8];
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  undefined1 local_240 [8];
  float fStack_238;
  float fStack_234;
  float fStack_230;
  float fStack_22c;
  float fStack_228;
  undefined1 local_220 [8];
  float fStack_218;
  float fStack_214;
  float fStack_210;
  float fStack_20c;
  float fStack_208;
  float fStack_204;
  undefined1 local_200 [8];
  float fStack_1f8;
  float fStack_1f4;
  float fStack_1f0;
  float fStack_1ec;
  float fStack_1e8;
  undefined4 uStack_1e4;
  undefined1 local_1e0 [8];
  float fStack_1d8;
  float fStack_1d4;
  float fStack_1d0;
  float fStack_1cc;
  float fStack_1c8;
  float local_1c0 [4];
  float fStack_1b0;
  float fStack_1ac;
  float fStack_1a8;
  float fStack_1a4;
  float local_1a0 [4];
  float fStack_190;
  float fStack_18c;
  float fStack_188;
  float fStack_184;
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  ulong uStack_140;
  uint auStack_138 [66];
  undefined1 auVar356 [64];
  
  PVar5 = prim[1];
  uVar82 = (ulong)(byte)PVar5;
  local_818 = prim + uVar82 * 0x19 + 0x16;
  fVar210 = *(float *)(prim + uVar82 * 0x19 + 0x12);
  auVar16 = vsubps_avx((undefined1  [16])(ray->org).field_0,
                       *(undefined1 (*) [16])(prim + uVar82 * 0x19 + 6));
  auVar124._0_4_ = fVar210 * auVar16._0_4_;
  auVar124._4_4_ = fVar210 * auVar16._4_4_;
  auVar124._8_4_ = fVar210 * auVar16._8_4_;
  auVar124._12_4_ = fVar210 * auVar16._12_4_;
  auVar260._0_4_ = fVar210 * (ray->dir).field_0.m128[0];
  auVar260._4_4_ = fVar210 * (ray->dir).field_0.m128[1];
  auVar260._8_4_ = fVar210 * (ray->dir).field_0.m128[2];
  auVar260._12_4_ = fVar210 * (ray->dir).field_0.m128[3];
  auVar16 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 4 + 6)));
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar179 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 5 + 6)));
  auVar179 = vcvtdq2ps_avx(auVar179);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 6 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  auVar11 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0xb + 6)));
  auVar11 = vcvtdq2ps_avx(auVar11);
  auVar93 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0xc + 6)));
  auVar93 = vcvtdq2ps_avx(auVar93);
  auVar100 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0xd + 6)));
  auVar100 = vcvtdq2ps_avx(auVar100);
  auVar92 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0x12 + 6)));
  auVar92 = vcvtdq2ps_avx(auVar92);
  auVar99 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0x13 + 6)));
  auVar99 = vcvtdq2ps_avx(auVar99);
  auVar131 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar82 * 0x14 + 6)));
  auVar131 = vcvtdq2ps_avx(auVar131);
  auVar327 = ZEXT1664(auVar131);
  auVar88 = vshufps_avx(auVar260,auVar260,0);
  auVar125 = vshufps_avx(auVar260,auVar260,0x55);
  auVar152 = vshufps_avx(auVar260,auVar260,0xaa);
  fVar210 = auVar152._0_4_;
  fVar173 = auVar152._4_4_;
  fVar227 = auVar152._8_4_;
  fVar192 = auVar152._12_4_;
  fVar271 = auVar125._0_4_;
  fVar283 = auVar125._4_4_;
  fVar289 = auVar125._8_4_;
  fVar295 = auVar125._12_4_;
  fVar228 = auVar88._0_4_;
  fVar193 = auVar88._4_4_;
  fVar229 = auVar88._8_4_;
  fVar194 = auVar88._12_4_;
  auVar353._0_4_ = fVar228 * auVar16._0_4_ + fVar271 * auVar179._0_4_ + fVar210 * auVar10._0_4_;
  auVar353._4_4_ = fVar193 * auVar16._4_4_ + fVar283 * auVar179._4_4_ + fVar173 * auVar10._4_4_;
  auVar353._8_4_ = fVar229 * auVar16._8_4_ + fVar289 * auVar179._8_4_ + fVar227 * auVar10._8_4_;
  auVar353._12_4_ = fVar194 * auVar16._12_4_ + fVar295 * auVar179._12_4_ + fVar192 * auVar10._12_4_;
  auVar356 = ZEXT1664(auVar353);
  auVar363._0_4_ = fVar228 * auVar11._0_4_ + fVar271 * auVar93._0_4_ + auVar100._0_4_ * fVar210;
  auVar363._4_4_ = fVar193 * auVar11._4_4_ + fVar283 * auVar93._4_4_ + auVar100._4_4_ * fVar173;
  auVar363._8_4_ = fVar229 * auVar11._8_4_ + fVar289 * auVar93._8_4_ + auVar100._8_4_ * fVar227;
  auVar363._12_4_ = fVar194 * auVar11._12_4_ + fVar295 * auVar93._12_4_ + auVar100._12_4_ * fVar192;
  auVar261._0_4_ = fVar228 * auVar92._0_4_ + fVar271 * auVar99._0_4_ + auVar131._0_4_ * fVar210;
  auVar261._4_4_ = fVar193 * auVar92._4_4_ + fVar283 * auVar99._4_4_ + auVar131._4_4_ * fVar173;
  auVar261._8_4_ = fVar229 * auVar92._8_4_ + fVar289 * auVar99._8_4_ + auVar131._8_4_ * fVar227;
  auVar261._12_4_ = fVar194 * auVar92._12_4_ + fVar295 * auVar99._12_4_ + auVar131._12_4_ * fVar192;
  auVar88 = vshufps_avx(auVar124,auVar124,0);
  auVar338 = ZEXT1664(auVar88);
  auVar125 = vshufps_avx(auVar124,auVar124,0x55);
  auVar152 = vshufps_avx(auVar124,auVar124,0xaa);
  fVar210 = auVar152._0_4_;
  fVar173 = auVar152._4_4_;
  fVar227 = auVar152._8_4_;
  fVar192 = auVar152._12_4_;
  fVar271 = auVar125._0_4_;
  fVar283 = auVar125._4_4_;
  fVar289 = auVar125._8_4_;
  fVar295 = auVar125._12_4_;
  fVar228 = auVar88._0_4_;
  fVar193 = auVar88._4_4_;
  fVar229 = auVar88._8_4_;
  fVar194 = auVar88._12_4_;
  auVar235._0_4_ = fVar228 * auVar16._0_4_ + fVar271 * auVar179._0_4_ + fVar210 * auVar10._0_4_;
  auVar235._4_4_ = fVar193 * auVar16._4_4_ + fVar283 * auVar179._4_4_ + fVar173 * auVar10._4_4_;
  auVar235._8_4_ = fVar229 * auVar16._8_4_ + fVar289 * auVar179._8_4_ + fVar227 * auVar10._8_4_;
  auVar235._12_4_ = fVar194 * auVar16._12_4_ + fVar295 * auVar179._12_4_ + fVar192 * auVar10._12_4_;
  auVar125._0_4_ = fVar228 * auVar11._0_4_ + auVar100._0_4_ * fVar210 + fVar271 * auVar93._0_4_;
  auVar125._4_4_ = fVar193 * auVar11._4_4_ + auVar100._4_4_ * fVar173 + fVar283 * auVar93._4_4_;
  auVar125._8_4_ = fVar229 * auVar11._8_4_ + auVar100._8_4_ * fVar227 + fVar289 * auVar93._8_4_;
  auVar125._12_4_ = fVar194 * auVar11._12_4_ + auVar100._12_4_ * fVar192 + fVar295 * auVar93._12_4_;
  auVar88._0_4_ = fVar271 * auVar99._0_4_ + auVar131._0_4_ * fVar210 + fVar228 * auVar92._0_4_;
  auVar88._4_4_ = fVar283 * auVar99._4_4_ + auVar131._4_4_ * fVar173 + fVar193 * auVar92._4_4_;
  auVar88._8_4_ = fVar289 * auVar99._8_4_ + auVar131._8_4_ * fVar227 + fVar229 * auVar92._8_4_;
  auVar88._12_4_ = fVar295 * auVar99._12_4_ + auVar131._12_4_ * fVar192 + fVar194 * auVar92._12_4_;
  auVar211._8_4_ = 0x7fffffff;
  auVar211._0_8_ = 0x7fffffff7fffffff;
  auVar211._12_4_ = 0x7fffffff;
  auVar16 = vandps_avx(auVar353,auVar211);
  auVar174._8_4_ = 0x219392ef;
  auVar174._0_8_ = 0x219392ef219392ef;
  auVar174._12_4_ = 0x219392ef;
  auVar16 = vcmpps_avx(auVar16,auVar174,1);
  auVar179 = vblendvps_avx(auVar353,auVar174,auVar16);
  auVar16 = vandps_avx(auVar363,auVar211);
  auVar16 = vcmpps_avx(auVar16,auVar174,1);
  auVar10 = vblendvps_avx(auVar363,auVar174,auVar16);
  auVar16 = vandps_avx(auVar261,auVar211);
  auVar16 = vcmpps_avx(auVar16,auVar174,1);
  auVar16 = vblendvps_avx(auVar261,auVar174,auVar16);
  auVar11 = vrcpps_avx(auVar179);
  fVar271 = auVar11._0_4_;
  auVar152._0_4_ = fVar271 * auVar179._0_4_;
  fVar283 = auVar11._4_4_;
  auVar152._4_4_ = fVar283 * auVar179._4_4_;
  fVar289 = auVar11._8_4_;
  auVar152._8_4_ = fVar289 * auVar179._8_4_;
  fVar295 = auVar11._12_4_;
  auVar152._12_4_ = fVar295 * auVar179._12_4_;
  auVar262._8_4_ = 0x3f800000;
  auVar262._0_8_ = 0x3f8000003f800000;
  auVar262._12_4_ = 0x3f800000;
  auVar179 = vsubps_avx(auVar262,auVar152);
  fVar271 = fVar271 + fVar271 * auVar179._0_4_;
  fVar283 = fVar283 + fVar283 * auVar179._4_4_;
  fVar289 = fVar289 + fVar289 * auVar179._8_4_;
  fVar295 = fVar295 + fVar295 * auVar179._12_4_;
  auVar179 = vrcpps_avx(auVar10);
  fVar210 = auVar179._0_4_;
  auVar195._0_4_ = fVar210 * auVar10._0_4_;
  fVar227 = auVar179._4_4_;
  auVar195._4_4_ = fVar227 * auVar10._4_4_;
  fVar228 = auVar179._8_4_;
  auVar195._8_4_ = fVar228 * auVar10._8_4_;
  fVar229 = auVar179._12_4_;
  auVar195._12_4_ = fVar229 * auVar10._12_4_;
  auVar179 = vsubps_avx(auVar262,auVar195);
  fVar210 = fVar210 + fVar210 * auVar179._0_4_;
  fVar227 = fVar227 + fVar227 * auVar179._4_4_;
  fVar228 = fVar228 + fVar228 * auVar179._8_4_;
  fVar229 = fVar229 + fVar229 * auVar179._12_4_;
  auVar179 = vrcpps_avx(auVar16);
  fVar173 = auVar179._0_4_;
  auVar175._0_4_ = fVar173 * auVar16._0_4_;
  fVar192 = auVar179._4_4_;
  auVar175._4_4_ = fVar192 * auVar16._4_4_;
  fVar193 = auVar179._8_4_;
  auVar175._8_4_ = fVar193 * auVar16._8_4_;
  fVar194 = auVar179._12_4_;
  auVar175._12_4_ = fVar194 * auVar16._12_4_;
  auVar16 = vsubps_avx(auVar262,auVar175);
  fVar173 = fVar173 + fVar173 * auVar16._0_4_;
  fVar192 = fVar192 + fVar192 * auVar16._4_4_;
  fVar193 = fVar193 + fVar193 * auVar16._8_4_;
  fVar194 = fVar194 + fVar194 * auVar16._12_4_;
  auVar16._8_8_ = 0;
  auVar16._0_8_ = *(ulong *)(prim + uVar82 * 7 + 6);
  auVar16 = vpmovsxwd_avx(auVar16);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar235);
  auVar153._0_4_ = fVar271 * auVar16._0_4_;
  auVar153._4_4_ = fVar283 * auVar16._4_4_;
  auVar153._8_4_ = fVar289 * auVar16._8_4_;
  auVar153._12_4_ = fVar295 * auVar16._12_4_;
  auVar179._8_8_ = 0;
  auVar179._0_8_ = *(ulong *)(prim + uVar82 * 9 + 6);
  auVar16 = vpmovsxwd_avx(auVar179);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar235);
  auVar196._0_4_ = fVar271 * auVar16._0_4_;
  auVar196._4_4_ = fVar283 * auVar16._4_4_;
  auVar196._8_4_ = fVar289 * auVar16._8_4_;
  auVar196._12_4_ = fVar295 * auVar16._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar82 * 0xe + 6);
  auVar16 = vpmovsxwd_avx(auVar10);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar125);
  auVar236._0_4_ = auVar16._0_4_ * fVar210;
  auVar236._4_4_ = auVar16._4_4_ * fVar227;
  auVar236._8_4_ = auVar16._8_4_ * fVar228;
  auVar236._12_4_ = auVar16._12_4_ * fVar229;
  auVar11._8_8_ = 0;
  auVar11._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar5 * 0x10 + 6);
  auVar16 = vpmovsxwd_avx(auVar11);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar179 = vsubps_avx(auVar16,auVar125);
  auVar93._8_8_ = 0;
  auVar93._0_8_ = *(ulong *)(prim + uVar82 * 0x15 + 6);
  auVar16 = vpmovsxwd_avx(auVar93);
  auVar131._0_4_ = fVar210 * auVar179._0_4_;
  auVar131._4_4_ = fVar227 * auVar179._4_4_;
  auVar131._8_4_ = fVar228 * auVar179._8_4_;
  auVar131._12_4_ = fVar229 * auVar179._12_4_;
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar88);
  auVar212._0_4_ = auVar16._0_4_ * fVar173;
  auVar212._4_4_ = auVar16._4_4_ * fVar192;
  auVar212._8_4_ = auVar16._8_4_ * fVar193;
  auVar212._12_4_ = auVar16._12_4_ * fVar194;
  auVar100._8_8_ = 0;
  auVar100._0_8_ = *(ulong *)(prim + uVar82 * 0x17 + 6);
  auVar16 = vpmovsxwd_avx(auVar100);
  auVar16 = vcvtdq2ps_avx(auVar16);
  auVar16 = vsubps_avx(auVar16,auVar88);
  auVar92._0_4_ = auVar16._0_4_ * fVar173;
  auVar92._4_4_ = auVar16._4_4_ * fVar192;
  auVar92._8_4_ = auVar16._8_4_ * fVar193;
  auVar92._12_4_ = auVar16._12_4_ * fVar194;
  auVar16 = vpminsd_avx(auVar153,auVar196);
  auVar179 = vpminsd_avx(auVar236,auVar131);
  auVar16 = vmaxps_avx(auVar16,auVar179);
  auVar179 = vpminsd_avx(auVar212,auVar92);
  uVar1 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar315._4_4_ = uVar1;
  auVar315._0_4_ = uVar1;
  auVar315._8_4_ = uVar1;
  auVar315._12_4_ = uVar1;
  auVar179 = vmaxps_avx(auVar179,auVar315);
  auVar16 = vmaxps_avx(auVar16,auVar179);
  local_600._0_4_ = auVar16._0_4_ * 0.99999964;
  local_600._4_4_ = auVar16._4_4_ * 0.99999964;
  local_600._8_4_ = auVar16._8_4_ * 0.99999964;
  local_600._12_4_ = auVar16._12_4_ * 0.99999964;
  auVar16 = vpmaxsd_avx(auVar153,auVar196);
  auVar179 = vpmaxsd_avx(auVar236,auVar131);
  auVar16 = vminps_avx(auVar16,auVar179);
  auVar179 = vpmaxsd_avx(auVar212,auVar92);
  fVar210 = ray->tfar;
  auVar154._4_4_ = fVar210;
  auVar154._0_4_ = fVar210;
  auVar154._8_4_ = fVar210;
  auVar154._12_4_ = fVar210;
  auVar179 = vminps_avx(auVar179,auVar154);
  auVar16 = vminps_avx(auVar16,auVar179);
  auVar99._0_4_ = auVar16._0_4_ * 1.0000004;
  auVar99._4_4_ = auVar16._4_4_ * 1.0000004;
  auVar99._8_4_ = auVar16._8_4_ * 1.0000004;
  auVar99._12_4_ = auVar16._12_4_ * 1.0000004;
  auVar16 = vpshufd_avx(ZEXT116((byte)PVar5),0);
  auVar179 = vpcmpgtd_avx(auVar16,_DAT_01f4ad30);
  auVar16 = vcmpps_avx(local_600,auVar99,2);
  auVar16 = vandps_avx(auVar16,auVar179);
  uVar80 = vmovmskps_avx(auVar16);
  auVar104._16_16_ = mm_lookupmask_ps._240_16_;
  auVar104._0_16_ = mm_lookupmask_ps._240_16_;
  local_340 = vblendps_avx(auVar104,ZEXT832(0) << 0x20,0x80);
LAB_007ab087:
  local_808 = (ulong)uVar80;
  if (local_808 == 0) {
LAB_007ad8b8:
    return local_808 != 0;
  }
  lVar78 = 0;
  if (local_808 != 0) {
    for (; (uVar80 >> lVar78 & 1) == 0; lVar78 = lVar78 + 1) {
    }
  }
  local_810 = local_808 - 1 & local_808;
  uVar1 = *(undefined4 *)(prim + lVar78 * 4 + 6);
  lVar78 = lVar78 * 0x40;
  lVar8 = 0;
  if (local_810 != 0) {
    for (; (local_810 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  uVar80 = *(uint *)(prim + 2);
  auVar16 = *(undefined1 (*) [16])(local_818 + lVar78);
  if (((local_810 != 0) && (uVar82 = local_810 - 1 & local_810, uVar82 != 0)) &&
     (lVar8 = 0, uVar82 != 0)) {
    for (; (uVar82 >> lVar8 & 1) == 0; lVar8 = lVar8 + 1) {
    }
  }
  auVar179 = *(undefined1 (*) [16])(local_818 + lVar78 + 0x10);
  auVar10 = *(undefined1 (*) [16])(local_818 + lVar78 + 0x20);
  auVar11 = *(undefined1 (*) [16])(local_818 + lVar78 + 0x30);
  auVar89._0_4_ = (auVar16._0_4_ + auVar179._0_4_ + auVar10._0_4_ + auVar11._0_4_) * 0.25;
  auVar89._4_4_ = (auVar16._4_4_ + auVar179._4_4_ + auVar10._4_4_ + auVar11._4_4_) * 0.25;
  auVar89._8_4_ = (auVar16._8_4_ + auVar179._8_4_ + auVar10._8_4_ + auVar11._8_4_) * 0.25;
  auVar89._12_4_ = (auVar16._12_4_ + auVar179._12_4_ + auVar10._12_4_ + auVar11._12_4_) * 0.25;
  aVar2 = (ray->org).field_0.field_1;
  aVar3 = (ray->dir).field_0.field_1;
  auVar93 = vsubps_avx(auVar89,(undefined1  [16])aVar2);
  auVar93 = vdpps_avx(auVar93,(undefined1  [16])aVar3,0x7f);
  auVar100 = vdpps_avx((undefined1  [16])aVar3,(undefined1  [16])aVar3,0x7f);
  auVar92 = vrcpss_avx(auVar100,auVar100);
  auVar318 = ZEXT464(0x40000000);
  fVar210 = auVar93._0_4_ * auVar92._0_4_ * (2.0 - auVar92._0_4_ * auVar100._0_4_);
  local_830 = ZEXT416((uint)fVar210);
  auVar100 = vshufps_avx(local_830,ZEXT416((uint)fVar210),0);
  fVar210 = aVar3.x;
  fVar173 = aVar3.y;
  fVar227 = aVar3.z;
  aVar148 = aVar3.field_3;
  auVar237._0_4_ = aVar2.x + fVar210 * auVar100._0_4_;
  auVar237._4_4_ = aVar2.y + fVar173 * auVar100._4_4_;
  auVar237._8_4_ = aVar2.z + fVar227 * auVar100._8_4_;
  auVar237._12_4_ = aVar2.field_3.w + aVar148.w * auVar100._12_4_;
  auVar93 = vblendps_avx(auVar237,_DAT_01f45a50,8);
  _local_9c0 = vsubps_avx(auVar16,auVar93);
  auVar264 = ZEXT1664(_local_9c0);
  _local_9d0 = vsubps_avx(auVar10,auVar93);
  _local_9e0 = vsubps_avx(auVar179,auVar93);
  _local_9f0 = vsubps_avx(auVar11,auVar93);
  auVar226 = ZEXT1664(_local_9f0);
  auVar16 = vshufps_avx(_local_9c0,_local_9c0,0);
  auVar179 = vshufps_avx(_local_9c0,_local_9c0,0x55);
  register0x00001290 = auVar179;
  _local_1e0 = auVar179;
  auVar179 = vshufps_avx(_local_9c0,_local_9c0,0xaa);
  register0x00001290 = auVar179;
  _local_200 = auVar179;
  auVar179 = vshufps_avx(_local_9c0,_local_9c0,0xff);
  register0x00001290 = auVar179;
  _local_220 = auVar179;
  auVar179 = vshufps_avx(_local_9e0,_local_9e0,0);
  register0x00001290 = auVar179;
  _local_240 = auVar179;
  auVar179 = vshufps_avx(_local_9e0,_local_9e0,0x55);
  register0x00001290 = auVar179;
  _local_260 = auVar179;
  auVar179 = vshufps_avx(_local_9e0,_local_9e0,0xaa);
  register0x00001290 = auVar179;
  _local_280 = auVar179;
  auVar126._0_4_ = fVar210 * fVar210;
  auVar126._4_4_ = fVar173 * fVar173;
  auVar126._8_4_ = fVar227 * fVar227;
  auVar126._12_4_ = aVar148.w * aVar148.w;
  auVar179 = vshufps_avx(auVar126,auVar126,0xaa);
  auVar10 = vshufps_avx(auVar126,auVar126,0x55);
  auVar11 = vshufps_avx(_local_9e0,_local_9e0,0xff);
  register0x000012d0 = auVar11;
  _local_400 = auVar11;
  auVar11 = vshufps_avx(auVar126,auVar126,0);
  local_2a0._0_4_ = auVar11._0_4_ + auVar10._0_4_ + auVar179._0_4_;
  local_2a0._4_4_ = auVar11._4_4_ + auVar10._4_4_ + auVar179._4_4_;
  local_2a0._8_4_ = auVar11._8_4_ + auVar10._8_4_ + auVar179._8_4_;
  local_2a0._12_4_ = auVar11._12_4_ + auVar10._12_4_ + auVar179._12_4_;
  local_2a0._16_4_ = auVar11._0_4_ + auVar10._0_4_ + auVar179._0_4_;
  local_2a0._20_4_ = auVar11._4_4_ + auVar10._4_4_ + auVar179._4_4_;
  local_2a0._24_4_ = auVar11._8_4_ + auVar10._8_4_ + auVar179._8_4_;
  local_2a0._28_4_ = auVar11._12_4_ + auVar10._12_4_ + auVar179._12_4_;
  auVar240 = ZEXT3264(local_2a0);
  auVar179 = vshufps_avx(_local_9d0,_local_9d0,0);
  register0x00001250 = auVar179;
  _local_420 = auVar179;
  auVar179 = vshufps_avx(_local_9d0,_local_9d0,0x55);
  register0x00001250 = auVar179;
  _local_440 = auVar179;
  auVar179 = vshufps_avx(_local_9d0,_local_9d0,0xaa);
  register0x00001250 = auVar179;
  _local_460 = auVar179;
  auVar179 = vshufps_avx(_local_9d0,_local_9d0,0xff);
  register0x00001250 = auVar179;
  _local_480 = auVar179;
  auVar179 = vshufps_avx(_local_9f0,_local_9f0,0);
  register0x00001250 = auVar179;
  _local_4a0 = auVar179;
  auVar179 = vshufps_avx(_local_9f0,_local_9f0,0x55);
  register0x00001250 = auVar179;
  _local_4c0 = auVar179;
  auVar179 = vshufps_avx(_local_9f0,_local_9f0,0xaa);
  register0x00001250 = auVar179;
  _local_4e0 = auVar179;
  auVar179 = vshufps_avx(_local_9f0,_local_9f0,0xff);
  register0x00001250 = auVar179;
  _local_500 = auVar179;
  register0x00001210 = auVar100;
  _local_6c0 = auVar100;
  uVar82 = 0;
  bVar83 = 0;
  local_b54 = 1;
  local_620 = (ray->dir).field_0.m128[0];
  local_780 = (ray->dir).field_0.m128[1];
  local_7a0 = (ray->dir).field_0.m128[2];
  auVar105._8_4_ = 0x7fffffff;
  auVar105._0_8_ = 0x7fffffff7fffffff;
  auVar105._12_4_ = 0x7fffffff;
  auVar105._16_4_ = 0x7fffffff;
  auVar105._20_4_ = 0x7fffffff;
  auVar105._24_4_ = 0x7fffffff;
  auVar105._28_4_ = 0x7fffffff;
  local_520 = vandps_avx(local_2a0,auVar105);
  local_5f0 = ZEXT816(0x3f80000000000000);
  fStack_79c = local_7a0;
  fStack_798 = local_7a0;
  fStack_794 = local_7a0;
  fStack_790 = local_7a0;
  fStack_78c = local_7a0;
  fStack_788 = local_7a0;
  fStack_784 = local_7a0;
  fStack_77c = local_780;
  fStack_778 = local_780;
  fStack_774 = local_780;
  fStack_770 = local_780;
  fStack_76c = local_780;
  fStack_768 = local_780;
  fStack_764 = local_780;
  fStack_61c = local_620;
  fStack_618 = local_620;
  fStack_614 = local_620;
  fStack_610 = local_620;
  fStack_60c = local_620;
  fStack_608 = local_620;
  fStack_604 = local_620;
  do {
    auVar179 = vmovshdup_avx(local_5f0);
    auVar11 = vsubps_avx(auVar179,local_5f0);
    auVar179 = vshufps_avx(local_5f0,local_5f0,0);
    local_740._16_16_ = auVar179;
    local_740._0_16_ = auVar179;
    auVar10 = vshufps_avx(auVar11,auVar11,0);
    local_760._16_16_ = auVar10;
    local_760._0_16_ = auVar10;
    fVar122 = auVar10._0_4_;
    fVar144 = auVar10._4_4_;
    fVar146 = auVar10._8_4_;
    fVar149 = auVar10._12_4_;
    fVar151 = auVar179._0_4_;
    auVar187._0_4_ = fVar151 + fVar122 * 0.0;
    fVar170 = auVar179._4_4_;
    auVar187._4_4_ = fVar170 + fVar144 * 0.14285715;
    fVar171 = auVar179._8_4_;
    auVar187._8_4_ = fVar171 + fVar146 * 0.2857143;
    fVar172 = auVar179._12_4_;
    auVar187._12_4_ = fVar172 + fVar149 * 0.42857146;
    auVar187._16_4_ = fVar151 + fVar122 * 0.5714286;
    auVar187._20_4_ = fVar170 + fVar144 * 0.71428573;
    auVar187._24_4_ = fVar171 + fVar146 * 0.8571429;
    auVar187._28_4_ = fVar172 + fVar149;
    auVar132._8_4_ = 0x3f800000;
    auVar132._0_8_ = 0x3f8000003f800000;
    auVar132._12_4_ = 0x3f800000;
    auVar132._16_4_ = 0x3f800000;
    auVar132._20_4_ = 0x3f800000;
    auVar132._24_4_ = 0x3f800000;
    auVar132._28_4_ = 0x3f800000;
    auVar104 = vsubps_avx(auVar132,auVar187);
    fVar173 = auVar104._0_4_;
    fVar227 = auVar104._4_4_;
    fVar192 = auVar104._8_4_;
    fVar228 = auVar104._12_4_;
    fVar193 = auVar104._16_4_;
    fVar229 = auVar104._20_4_;
    fVar194 = auVar104._24_4_;
    fVar233 = fVar173 * fVar173 * fVar173;
    fVar241 = fVar227 * fVar227 * fVar227;
    fVar244 = fVar192 * fVar192 * fVar192;
    fVar247 = fVar228 * fVar228 * fVar228;
    fVar250 = fVar193 * fVar193 * fVar193;
    fVar253 = fVar229 * fVar229 * fVar229;
    fVar256 = fVar194 * fVar194 * fVar194;
    fVar259 = auVar187._0_4_ * auVar187._0_4_ * auVar187._0_4_;
    fVar265 = auVar187._4_4_ * auVar187._4_4_ * auVar187._4_4_;
    fVar266 = auVar187._8_4_ * auVar187._8_4_ * auVar187._8_4_;
    fVar267 = auVar187._12_4_ * auVar187._12_4_ * auVar187._12_4_;
    fVar268 = auVar187._16_4_ * auVar187._16_4_ * auVar187._16_4_;
    fVar269 = auVar187._20_4_ * auVar187._20_4_ * auVar187._20_4_;
    fVar270 = auVar187._24_4_ * auVar187._24_4_ * auVar187._24_4_;
    fVar210 = auVar226._28_4_;
    fVar271 = auVar187._0_4_ * fVar173;
    fVar283 = auVar187._4_4_ * fVar227;
    fVar289 = auVar187._8_4_ * fVar192;
    fVar295 = auVar187._12_4_ * fVar228;
    fVar230 = auVar187._16_4_ * fVar193;
    fVar231 = auVar187._20_4_ * fVar229;
    fVar232 = auVar187._24_4_ * fVar194;
    fVar334 = auVar327._28_4_ + auVar356._28_4_;
    fVar313 = auVar264._28_4_ + fVar210 + fVar334;
    fVar319 = fVar334 + auVar240._28_4_ + auVar338._28_4_ + auVar318._28_4_;
    fVar334 = fVar233 * 0.16666667;
    fVar242 = fVar241 * 0.16666667;
    fVar245 = fVar244 * 0.16666667;
    fVar248 = fVar247 * 0.16666667;
    fVar251 = fVar250 * 0.16666667;
    fVar254 = fVar253 * 0.16666667;
    fVar257 = fVar256 * 0.16666667;
    fVar272 = (fVar259 + fVar233 * 4.0 + fVar173 * fVar271 * 12.0 + auVar187._0_4_ * fVar271 * 6.0)
              * 0.16666667;
    fVar284 = (fVar265 + fVar241 * 4.0 + fVar227 * fVar283 * 12.0 + auVar187._4_4_ * fVar283 * 6.0)
              * 0.16666667;
    fVar290 = (fVar266 + fVar244 * 4.0 + fVar192 * fVar289 * 12.0 + auVar187._8_4_ * fVar289 * 6.0)
              * 0.16666667;
    fVar296 = (fVar267 + fVar247 * 4.0 + fVar228 * fVar295 * 12.0 + auVar187._12_4_ * fVar295 * 6.0)
              * 0.16666667;
    fVar301 = (fVar268 + fVar250 * 4.0 + fVar193 * fVar230 * 12.0 + auVar187._16_4_ * fVar230 * 6.0)
              * 0.16666667;
    fVar305 = (fVar269 + fVar253 * 4.0 + fVar229 * fVar231 * 12.0 + auVar187._20_4_ * fVar231 * 6.0)
              * 0.16666667;
    fVar309 = (fVar270 + fVar256 * 4.0 + fVar194 * fVar232 * 12.0 + auVar187._24_4_ * fVar232 * 6.0)
              * 0.16666667;
    fVar233 = (fVar259 * 4.0 + fVar233 + auVar187._0_4_ * fVar271 * 12.0 + fVar173 * fVar271 * 6.0)
              * 0.16666667;
    fVar241 = (fVar265 * 4.0 + fVar241 + auVar187._4_4_ * fVar283 * 12.0 + fVar227 * fVar283 * 6.0)
              * 0.16666667;
    fVar244 = (fVar266 * 4.0 + fVar244 + auVar187._8_4_ * fVar289 * 12.0 + fVar192 * fVar289 * 6.0)
              * 0.16666667;
    fVar247 = (fVar267 * 4.0 + fVar247 + auVar187._12_4_ * fVar295 * 12.0 + fVar228 * fVar295 * 6.0)
              * 0.16666667;
    fVar250 = (fVar268 * 4.0 + fVar250 + auVar187._16_4_ * fVar230 * 12.0 + fVar193 * fVar230 * 6.0)
              * 0.16666667;
    fVar253 = (fVar269 * 4.0 + fVar253 + auVar187._20_4_ * fVar231 * 12.0 + fVar229 * fVar231 * 6.0)
              * 0.16666667;
    fVar256 = (fVar270 * 4.0 + fVar256 + auVar187._24_4_ * fVar232 * 12.0 + fVar194 * fVar232 * 6.0)
              * 0.16666667;
    fVar259 = fVar259 * 0.16666667;
    fVar265 = fVar265 * 0.16666667;
    fVar266 = fVar266 * 0.16666667;
    fVar267 = fVar267 * 0.16666667;
    fVar268 = fVar268 * 0.16666667;
    fVar269 = fVar269 * 0.16666667;
    fVar270 = fVar270 * 0.16666667;
    fVar351 = auVar338._28_4_ + 12.0;
    fVar320 = fVar319 + 12.166667;
    fVar116 = auVar16._0_4_;
    fVar118 = auVar16._4_4_;
    fVar120 = auVar16._8_4_;
    local_880 = fVar116 * fVar334 +
                fVar272 * (float)local_240._0_4_ +
                fVar259 * (float)local_4a0._0_4_ + fVar233 * (float)local_420._0_4_;
    fStack_87c = fVar118 * fVar242 +
                 fVar284 * (float)local_240._4_4_ +
                 fVar265 * (float)local_4a0._4_4_ + fVar241 * (float)local_420._4_4_;
    fStack_878 = fVar120 * fVar245 +
                 fVar290 * fStack_238 + fVar266 * fStack_498 + fVar244 * fStack_418;
    fStack_874 = auVar16._12_4_ * fVar248 +
                 fVar296 * fStack_234 + fVar267 * fStack_494 + fVar247 * fStack_414;
    fStack_870 = fVar116 * fVar251 +
                 fVar301 * fStack_230 + fVar268 * fStack_490 + fVar250 * fStack_410;
    fStack_86c = fVar118 * fVar254 +
                 fVar305 * fStack_22c + fVar269 * fStack_48c + fVar253 * fStack_40c;
    fStack_868 = fVar120 * fVar257 +
                 fVar309 * fStack_228 + fVar270 * fStack_488 + fVar256 * fStack_408;
    fStack_864 = fVar313 + fVar320;
    fVar273 = (float)local_1e0._0_4_ * fVar334 +
              (float)local_260._0_4_ * fVar272 +
              fVar259 * (float)local_4c0._0_4_ + fVar233 * (float)local_440._0_4_;
    fVar285 = (float)local_1e0._4_4_ * fVar242 +
              (float)local_260._4_4_ * fVar284 +
              fVar265 * (float)local_4c0._4_4_ + fVar241 * (float)local_440._4_4_;
    fVar291 = fStack_1d8 * fVar245 +
              fStack_258 * fVar290 + fVar266 * fStack_4b8 + fVar244 * fStack_438;
    fVar297 = fStack_1d4 * fVar248 +
              fStack_254 * fVar296 + fVar267 * fStack_4b4 + fVar247 * fStack_434;
    fVar302 = fStack_1d0 * fVar251 +
              fStack_250 * fVar301 + fVar268 * fStack_4b0 + fVar250 * fStack_430;
    fVar306 = fStack_1cc * fVar254 +
              fStack_24c * fVar305 + fVar269 * fStack_4ac + fVar253 * fStack_42c;
    fVar310 = fStack_1c8 * fVar257 +
              fStack_248 * fVar309 + fVar270 * fStack_4a8 + fVar256 * fStack_428;
    fVar314 = fStack_864 + fVar351 + 12.166667;
    fVar274 = (float)local_200._0_4_ * fVar334 +
              (float)local_280._0_4_ * fVar272 +
              fVar259 * (float)local_4e0._0_4_ + fVar233 * (float)local_460._0_4_;
    fVar286 = (float)local_200._4_4_ * fVar242 +
              (float)local_280._4_4_ * fVar284 +
              fVar265 * (float)local_4e0._4_4_ + fVar241 * (float)local_460._4_4_;
    fVar292 = fStack_1f8 * fVar245 +
              fStack_278 * fVar290 + fVar266 * fStack_4d8 + fVar244 * fStack_458;
    fVar298 = fStack_1f4 * fVar248 +
              fStack_274 * fVar296 + fVar267 * fStack_4d4 + fVar247 * fStack_454;
    fStack_850 = fStack_1f0 * fVar251 +
                 fStack_270 * fVar301 + fVar268 * fStack_4d0 + fVar250 * fStack_450;
    fStack_84c = fStack_1ec * fVar254 +
                 fStack_26c * fVar305 + fVar269 * fStack_4cc + fVar253 * fStack_44c;
    fStack_848 = fStack_1e8 * fVar257 +
                 fStack_268 * fVar309 + fVar270 * fStack_4c8 + fVar256 * fStack_448;
    fStack_844 = fVar314 + fVar351 + auVar356._28_4_ + 12.0;
    local_b00._0_4_ =
         (float)local_220._0_4_ * fVar334 +
         fVar272 * (float)local_400._0_4_ +
         fVar233 * (float)local_480._0_4_ + fVar259 * (float)local_500._0_4_;
    local_b00._4_4_ =
         (float)local_220._4_4_ * fVar242 +
         fVar284 * (float)local_400._4_4_ +
         fVar241 * (float)local_480._4_4_ + fVar265 * (float)local_500._4_4_;
    fStack_af8 = fStack_218 * fVar245 +
                 fVar290 * fStack_3f8 + fVar244 * fStack_478 + fVar266 * fStack_4f8;
    fStack_af4 = fStack_214 * fVar248 +
                 fVar296 * fStack_3f4 + fVar247 * fStack_474 + fVar267 * fStack_4f4;
    fStack_af0 = fStack_210 * fVar251 +
                 fVar301 * fStack_3f0 + fVar250 * fStack_470 + fVar268 * fStack_4f0;
    fStack_aec = fStack_20c * fVar254 +
                 fVar305 * fStack_3ec + fVar253 * fStack_46c + fVar269 * fStack_4ec;
    fStack_ae8 = fStack_208 * fVar257 +
                 fVar309 * fStack_3e8 + fVar256 * fStack_468 + fVar270 * fStack_4e8;
    fStack_ae4 = auVar240._28_4_ + fVar313 + fVar319 + auVar264._28_4_;
    auVar17._4_4_ = auVar187._4_4_ * -auVar187._4_4_;
    auVar17._0_4_ = auVar187._0_4_ * -auVar187._0_4_;
    auVar17._8_4_ = auVar187._8_4_ * -auVar187._8_4_;
    auVar17._12_4_ = auVar187._12_4_ * -auVar187._12_4_;
    auVar17._16_4_ = auVar187._16_4_ * -auVar187._16_4_;
    auVar17._20_4_ = auVar187._20_4_ * -auVar187._20_4_;
    auVar17._24_4_ = auVar187._24_4_ * -auVar187._24_4_;
    auVar17._28_4_ = auVar187._28_4_;
    auVar13._4_4_ = fVar283 * 4.0;
    auVar13._0_4_ = fVar271 * 4.0;
    auVar13._8_4_ = fVar289 * 4.0;
    auVar13._12_4_ = fVar295 * 4.0;
    auVar13._16_4_ = fVar230 * 4.0;
    auVar13._20_4_ = fVar231 * 4.0;
    auVar13._24_4_ = fVar232 * 4.0;
    auVar13._28_4_ = fVar210;
    auVar104 = vsubps_avx(auVar17,auVar13);
    fVar256 = fVar173 * -fVar173 * 0.5;
    fVar257 = fVar227 * -fVar227 * 0.5;
    fVar259 = fVar192 * -fVar192 * 0.5;
    fVar265 = fVar228 * -fVar228 * 0.5;
    fVar266 = fVar193 * -fVar193 * 0.5;
    fVar267 = fVar229 * -fVar229 * 0.5;
    fVar268 = fVar194 * -fVar194 * 0.5;
    fVar244 = auVar104._0_4_ * 0.5;
    fVar245 = auVar104._4_4_ * 0.5;
    fVar247 = auVar104._8_4_ * 0.5;
    fVar250 = auVar104._12_4_ * 0.5;
    fVar251 = auVar104._16_4_ * 0.5;
    fVar253 = auVar104._20_4_ * 0.5;
    fVar254 = auVar104._24_4_ * 0.5;
    fVar233 = (fVar173 * fVar173 + fVar271 * 4.0) * 0.5;
    fVar334 = (fVar227 * fVar227 + fVar283 * 4.0) * 0.5;
    fVar241 = (fVar192 * fVar192 + fVar289 * 4.0) * 0.5;
    fVar242 = (fVar228 * fVar228 + fVar295 * 4.0) * 0.5;
    fVar230 = (fVar193 * fVar193 + fVar230 * 4.0) * 0.5;
    fVar231 = (fVar229 * fVar229 + fVar231 * 4.0) * 0.5;
    fVar232 = (fVar194 * fVar194 + fVar232 * 4.0) * 0.5;
    fVar173 = auVar187._0_4_ * auVar187._0_4_ * 0.5;
    fVar227 = auVar187._4_4_ * auVar187._4_4_ * 0.5;
    fVar192 = auVar187._8_4_ * auVar187._8_4_ * 0.5;
    fVar194 = auVar187._12_4_ * auVar187._12_4_ * 0.5;
    fVar271 = auVar187._16_4_ * auVar187._16_4_ * 0.5;
    fVar283 = auVar187._20_4_ * auVar187._20_4_ * 0.5;
    fVar295 = auVar187._24_4_ * auVar187._24_4_ * 0.5;
    fVar248 = auVar104._28_4_ + fVar172 + fVar210 + fVar320 + fVar210;
    auVar179 = vpermilps_avx(ZEXT416((uint)(auVar11._0_4_ * 0.04761905)),0);
    fVar228 = auVar179._0_4_;
    fVar275 = fVar228 * (fVar116 * fVar256 +
                        (float)local_240._0_4_ * fVar244 +
                        fVar233 * (float)local_420._0_4_ + fVar173 * (float)local_4a0._0_4_);
    fVar193 = auVar179._4_4_;
    fVar287 = fVar193 * (fVar118 * fVar257 +
                        (float)local_240._4_4_ * fVar245 +
                        fVar334 * (float)local_420._4_4_ + fVar227 * (float)local_4a0._4_4_);
    auVar23._4_4_ = fVar287;
    auVar23._0_4_ = fVar275;
    fVar229 = auVar179._8_4_;
    fVar293 = fVar229 * (fVar120 * fVar259 +
                        fStack_238 * fVar247 + fVar241 * fStack_418 + fVar192 * fStack_498);
    auVar23._8_4_ = fVar293;
    fVar289 = auVar179._12_4_;
    fVar299 = fVar289 * (auVar16._12_4_ * fVar265 +
                        fStack_234 * fVar250 + fVar242 * fStack_414 + fVar194 * fStack_494);
    auVar23._12_4_ = fVar299;
    fVar303 = fVar228 * (fVar116 * fVar266 +
                        fStack_230 * fVar251 + fVar230 * fStack_410 + fVar271 * fStack_490);
    auVar23._16_4_ = fVar303;
    fVar307 = fVar193 * (fVar118 * fVar267 +
                        fStack_22c * fVar253 + fVar231 * fStack_40c + fVar283 * fStack_48c);
    auVar23._20_4_ = fVar307;
    fVar311 = fVar229 * (fVar120 * fVar268 +
                        fStack_228 * fVar254 + fVar232 * fStack_408 + fVar295 * fStack_488);
    auVar23._24_4_ = fVar311;
    auVar23._28_4_ = fStack_844 + fVar320;
    fVar321 = fVar228 * ((float)local_1e0._0_4_ * fVar256 +
                        (float)local_260._0_4_ * fVar244 +
                        fVar233 * (float)local_440._0_4_ + fVar173 * (float)local_4c0._0_4_);
    fVar328 = fVar193 * ((float)local_1e0._4_4_ * fVar257 +
                        (float)local_260._4_4_ * fVar245 +
                        fVar334 * (float)local_440._4_4_ + fVar227 * (float)local_4c0._4_4_);
    auVar24._4_4_ = fVar328;
    auVar24._0_4_ = fVar321;
    fVar329 = fVar229 * (fStack_1d8 * fVar259 +
                        fStack_258 * fVar247 + fVar241 * fStack_438 + fVar192 * fStack_4b8);
    auVar24._8_4_ = fVar329;
    fVar330 = fVar289 * (fStack_1d4 * fVar265 +
                        fStack_254 * fVar250 + fVar242 * fStack_434 + fVar194 * fStack_4b4);
    auVar24._12_4_ = fVar330;
    fVar331 = fVar228 * (fStack_1d0 * fVar266 +
                        fStack_250 * fVar251 + fVar230 * fStack_430 + fVar271 * fStack_4b0);
    auVar24._16_4_ = fVar331;
    fVar332 = fVar193 * (fStack_1cc * fVar267 +
                        fStack_24c * fVar253 + fVar231 * fStack_42c + fVar283 * fStack_4ac);
    auVar24._20_4_ = fVar332;
    fVar333 = fVar229 * (fStack_1c8 * fVar268 +
                        fStack_248 * fVar254 + fVar232 * fStack_428 + fVar295 * fStack_4a8);
    auVar24._24_4_ = fVar333;
    auVar24._28_4_ = uStack_1e4;
    fVar335 = fVar228 * ((float)local_200._0_4_ * fVar256 +
                        fVar173 * (float)local_4e0._0_4_ + fVar233 * (float)local_460._0_4_ +
                        (float)local_280._0_4_ * fVar244);
    fVar339 = fVar193 * ((float)local_200._4_4_ * fVar257 +
                        fVar227 * (float)local_4e0._4_4_ + fVar334 * (float)local_460._4_4_ +
                        (float)local_280._4_4_ * fVar245);
    local_a40._4_4_ = fVar339;
    local_a40._0_4_ = fVar335;
    fVar341 = fVar229 * (fStack_1f8 * fVar259 +
                        fVar192 * fStack_4d8 + fVar241 * fStack_458 + fStack_278 * fVar247);
    local_a40._8_4_ = fVar341;
    fVar343 = fVar289 * (fStack_1f4 * fVar265 +
                        fVar194 * fStack_4d4 + fVar242 * fStack_454 + fStack_274 * fVar250);
    local_a40._12_4_ = fVar343;
    fVar345 = fVar228 * (fStack_1f0 * fVar266 +
                        fVar271 * fStack_4d0 + fVar230 * fStack_450 + fStack_270 * fVar251);
    local_a40._16_4_ = fVar345;
    fVar347 = fVar193 * (fStack_1ec * fVar267 +
                        fVar283 * fStack_4cc + fVar231 * fStack_44c + fStack_26c * fVar253);
    local_a40._20_4_ = fVar347;
    fVar349 = fVar229 * (fStack_1e8 * fVar268 +
                        fVar295 * fStack_4c8 + fVar232 * fStack_448 + fStack_268 * fVar254);
    local_a40._24_4_ = fVar349;
    local_a40._28_4_ = fStack_204;
    fVar233 = fVar228 * ((float)local_220._0_4_ * fVar256 +
                        fVar244 * (float)local_400._0_4_ +
                        fVar173 * (float)local_500._0_4_ + fVar233 * (float)local_480._0_4_);
    fVar244 = fVar193 * ((float)local_220._4_4_ * fVar257 +
                        fVar245 * (float)local_400._4_4_ +
                        fVar227 * (float)local_500._4_4_ + fVar334 * (float)local_480._4_4_);
    auVar14._4_4_ = fVar244;
    auVar14._0_4_ = fVar233;
    fVar245 = fVar229 * (fStack_218 * fVar259 +
                        fVar247 * fStack_3f8 + fVar192 * fStack_4f8 + fVar241 * fStack_478);
    auVar14._8_4_ = fVar245;
    fVar289 = fVar289 * (fStack_214 * fVar265 +
                        fVar250 * fStack_3f4 + fVar194 * fStack_4f4 + fVar242 * fStack_474);
    auVar14._12_4_ = fVar289;
    fVar228 = fVar228 * (fStack_210 * fVar266 +
                        fVar251 * fStack_3f0 + fVar271 * fStack_4f0 + fVar230 * fStack_470);
    auVar14._16_4_ = fVar228;
    fVar193 = fVar193 * (fStack_20c * fVar267 +
                        fVar253 * fStack_3ec + fVar283 * fStack_4ec + fVar231 * fStack_46c);
    auVar14._20_4_ = fVar193;
    fVar229 = fVar229 * (fStack_208 * fVar268 +
                        fVar254 * fStack_3e8 + fVar295 * fStack_4e8 + fVar232 * fStack_468);
    auVar14._24_4_ = fVar229;
    auVar14._28_4_ = fVar248;
    auVar67._4_4_ = fVar285;
    auVar67._0_4_ = fVar273;
    auVar67._8_4_ = fVar291;
    auVar67._12_4_ = fVar297;
    auVar67._16_4_ = fVar302;
    auVar67._20_4_ = fVar306;
    auVar67._24_4_ = fVar310;
    auVar67._28_4_ = fVar314;
    auVar104 = vperm2f128_avx(auVar67,auVar67,1);
    auVar104 = vshufps_avx(auVar104,auVar67,0x30);
    auVar13 = vshufps_avx(auVar67,auVar104,0x29);
    auVar72._4_4_ = fVar286;
    auVar72._0_4_ = fVar274;
    auVar72._8_4_ = fVar292;
    auVar72._12_4_ = fVar298;
    auVar72._16_4_ = fStack_850;
    auVar72._20_4_ = fStack_84c;
    auVar72._24_4_ = fStack_848;
    auVar72._28_4_ = fStack_844;
    auVar104 = vperm2f128_avx(auVar72,auVar72,1);
    auVar104 = vshufps_avx(auVar104,auVar72,0x30);
    local_8a0 = vshufps_avx(auVar72,auVar104,0x29);
    auVar105 = vsubps_avx(_local_b00,auVar14);
    auVar104 = vperm2f128_avx(auVar105,auVar105,1);
    auVar104 = vshufps_avx(auVar104,auVar105,0x30);
    auVar14 = vshufps_avx(auVar105,auVar104,0x29);
    local_2e0 = vsubps_avx(auVar13,auVar67);
    local_2c0 = vsubps_avx(local_8a0,auVar72);
    fVar173 = local_2e0._0_4_;
    fVar194 = local_2e0._4_4_;
    auVar18._4_4_ = fVar339 * fVar194;
    auVar18._0_4_ = fVar335 * fVar173;
    fVar334 = local_2e0._8_4_;
    auVar18._8_4_ = fVar341 * fVar334;
    fVar231 = local_2e0._12_4_;
    auVar18._12_4_ = fVar343 * fVar231;
    fVar253 = local_2e0._16_4_;
    auVar18._16_4_ = fVar345 * fVar253;
    fVar266 = local_2e0._20_4_;
    auVar18._20_4_ = fVar347 * fVar266;
    fVar284 = local_2e0._24_4_;
    auVar18._24_4_ = fVar349 * fVar284;
    auVar18._28_4_ = auVar105._28_4_;
    fVar227 = local_2c0._0_4_;
    fVar271 = local_2c0._4_4_;
    auVar365._4_4_ = fVar328 * fVar271;
    auVar365._0_4_ = fVar321 * fVar227;
    fVar241 = local_2c0._8_4_;
    auVar365._8_4_ = fVar329 * fVar241;
    fVar232 = local_2c0._12_4_;
    auVar365._12_4_ = fVar330 * fVar232;
    fVar254 = local_2c0._16_4_;
    auVar365._16_4_ = fVar331 * fVar254;
    fVar267 = local_2c0._20_4_;
    auVar365._20_4_ = fVar332 * fVar267;
    fVar290 = local_2c0._24_4_;
    auVar365._24_4_ = fVar333 * fVar290;
    auVar365._28_4_ = auVar104._28_4_;
    auVar17 = vsubps_avx(auVar365,auVar18);
    auVar69._4_4_ = fStack_87c;
    auVar69._0_4_ = local_880;
    auVar69._8_4_ = fStack_878;
    auVar69._12_4_ = fStack_874;
    auVar69._16_4_ = fStack_870;
    auVar69._20_4_ = fStack_86c;
    auVar69._24_4_ = fStack_868;
    auVar69._28_4_ = fStack_864;
    auVar104 = vperm2f128_avx(auVar69,auVar69,1);
    auVar104 = vshufps_avx(auVar104,auVar69,0x30);
    local_a60 = vshufps_avx(auVar69,auVar104,0x29);
    local_300 = vsubps_avx(local_a60,auVar69);
    auVar19._4_4_ = fVar287 * fVar271;
    auVar19._0_4_ = fVar275 * fVar227;
    auVar19._8_4_ = fVar293 * fVar241;
    auVar19._12_4_ = fVar299 * fVar232;
    auVar19._16_4_ = fVar303 * fVar254;
    auVar19._20_4_ = fVar307 * fVar267;
    auVar19._24_4_ = fVar311 * fVar290;
    auVar19._28_4_ = auVar104._28_4_;
    fVar192 = local_300._0_4_;
    fVar283 = local_300._4_4_;
    auVar20._4_4_ = fVar339 * fVar283;
    auVar20._0_4_ = fVar335 * fVar192;
    fVar242 = local_300._8_4_;
    auVar20._8_4_ = fVar341 * fVar242;
    fVar247 = local_300._12_4_;
    auVar20._12_4_ = fVar343 * fVar247;
    fVar256 = local_300._16_4_;
    auVar20._16_4_ = fVar345 * fVar256;
    fVar268 = local_300._20_4_;
    auVar20._20_4_ = fVar347 * fVar268;
    fVar296 = local_300._24_4_;
    auVar20._24_4_ = fVar349 * fVar296;
    auVar20._28_4_ = local_8a0._28_4_;
    auVar18 = vsubps_avx(auVar20,auVar19);
    auVar21._4_4_ = fVar328 * fVar283;
    auVar21._0_4_ = fVar321 * fVar192;
    auVar21._8_4_ = fVar329 * fVar242;
    auVar21._12_4_ = fVar330 * fVar247;
    auVar21._16_4_ = fVar331 * fVar256;
    auVar21._20_4_ = fVar332 * fVar268;
    auVar21._24_4_ = fVar333 * fVar296;
    auVar21._28_4_ = local_8a0._28_4_;
    auVar22._4_4_ = fVar287 * fVar194;
    auVar22._0_4_ = fVar275 * fVar173;
    auVar22._8_4_ = fVar293 * fVar334;
    auVar22._12_4_ = fVar299 * fVar231;
    auVar22._16_4_ = fVar303 * fVar253;
    auVar22._20_4_ = fVar307 * fVar266;
    auVar22._24_4_ = fVar311 * fVar284;
    auVar22._28_4_ = fVar320;
    auVar365 = vsubps_avx(auVar22,auVar21);
    fVar210 = auVar365._28_4_;
    fVar295 = auVar18._28_4_ + fVar210;
    auVar188._0_4_ = fVar192 * fVar192 + fVar173 * fVar173 + fVar227 * fVar227;
    auVar188._4_4_ = fVar283 * fVar283 + fVar194 * fVar194 + fVar271 * fVar271;
    auVar188._8_4_ = fVar242 * fVar242 + fVar334 * fVar334 + fVar241 * fVar241;
    auVar188._12_4_ = fVar247 * fVar247 + fVar231 * fVar231 + fVar232 * fVar232;
    auVar188._16_4_ = fVar256 * fVar256 + fVar253 * fVar253 + fVar254 * fVar254;
    auVar188._20_4_ = fVar268 * fVar268 + fVar266 * fVar266 + fVar267 * fVar267;
    auVar188._24_4_ = fVar296 * fVar296 + fVar284 * fVar284 + fVar290 * fVar290;
    auVar188._28_4_ = fVar210 + fVar210 + fVar295;
    auVar104 = vrcpps_avx(auVar188);
    fVar230 = auVar104._0_4_;
    fVar250 = auVar104._4_4_;
    auVar279._4_4_ = fVar250 * auVar188._4_4_;
    auVar279._0_4_ = fVar230 * auVar188._0_4_;
    fVar251 = auVar104._8_4_;
    auVar279._8_4_ = fVar251 * auVar188._8_4_;
    fVar257 = auVar104._12_4_;
    auVar279._12_4_ = fVar257 * auVar188._12_4_;
    fVar259 = auVar104._16_4_;
    auVar279._16_4_ = fVar259 * auVar188._16_4_;
    fVar265 = auVar104._20_4_;
    auVar279._20_4_ = fVar265 * auVar188._20_4_;
    fVar269 = auVar104._24_4_;
    auVar279._24_4_ = fVar269 * auVar188._24_4_;
    auVar279._28_4_ = fVar320;
    auVar354._8_4_ = 0x3f800000;
    auVar354._0_8_ = 0x3f8000003f800000;
    auVar354._12_4_ = 0x3f800000;
    auVar354._16_4_ = 0x3f800000;
    auVar354._20_4_ = 0x3f800000;
    auVar354._24_4_ = 0x3f800000;
    auVar354._28_4_ = 0x3f800000;
    auVar19 = vsubps_avx(auVar354,auVar279);
    fVar230 = auVar19._0_4_ * fVar230 + fVar230;
    fVar250 = auVar19._4_4_ * fVar250 + fVar250;
    fVar251 = auVar19._8_4_ * fVar251 + fVar251;
    fVar257 = auVar19._12_4_ * fVar257 + fVar257;
    fVar259 = auVar19._16_4_ * fVar259 + fVar259;
    fVar265 = auVar19._20_4_ * fVar265 + fVar265;
    fVar269 = auVar19._24_4_ * fVar269 + fVar269;
    auVar105 = vperm2f128_avx(auVar24,auVar24,1);
    auVar105 = vshufps_avx(auVar105,auVar24,0x30);
    local_8e0 = vshufps_avx(auVar24,auVar105,0x29);
    auVar105 = vperm2f128_avx(local_a40,local_a40,1);
    auVar105 = vshufps_avx(auVar105,local_a40,0x30);
    local_720 = vshufps_avx(local_a40,auVar105,0x29);
    fVar336 = local_720._0_4_;
    fVar340 = local_720._4_4_;
    auVar12._4_4_ = fVar340 * fVar194;
    auVar12._0_4_ = fVar336 * fVar173;
    fVar342 = local_720._8_4_;
    auVar12._8_4_ = fVar342 * fVar334;
    fVar344 = local_720._12_4_;
    auVar12._12_4_ = fVar344 * fVar231;
    fVar346 = local_720._16_4_;
    auVar12._16_4_ = fVar346 * fVar253;
    fVar348 = local_720._20_4_;
    auVar12._20_4_ = fVar348 * fVar266;
    fVar350 = local_720._24_4_;
    auVar12._24_4_ = fVar350 * fVar284;
    auVar12._28_4_ = auVar105._28_4_;
    fVar352 = local_8e0._0_4_;
    fVar357 = local_8e0._4_4_;
    auVar15._4_4_ = fVar357 * fVar271;
    auVar15._0_4_ = fVar352 * fVar227;
    fVar358 = local_8e0._8_4_;
    auVar15._8_4_ = fVar358 * fVar241;
    fVar359 = local_8e0._12_4_;
    auVar15._12_4_ = fVar359 * fVar232;
    fVar360 = local_8e0._16_4_;
    auVar15._16_4_ = fVar360 * fVar254;
    fVar361 = local_8e0._20_4_;
    auVar15._20_4_ = fVar361 * fVar267;
    fVar362 = local_8e0._24_4_;
    auVar15._24_4_ = fVar362 * fVar290;
    auVar15._28_4_ = uStack_1e4;
    auVar20 = vsubps_avx(auVar15,auVar12);
    auVar105 = vperm2f128_avx(auVar23,auVar23,1);
    auVar105 = vshufps_avx(auVar105,auVar23,0x30);
    local_900 = vshufps_avx(auVar23,auVar105,0x29);
    fVar276 = local_900._0_4_;
    fVar288 = local_900._4_4_;
    auVar25._4_4_ = fVar288 * fVar271;
    auVar25._0_4_ = fVar276 * fVar227;
    fVar294 = local_900._8_4_;
    auVar25._8_4_ = fVar294 * fVar241;
    fVar300 = local_900._12_4_;
    auVar25._12_4_ = fVar300 * fVar232;
    fVar304 = local_900._16_4_;
    auVar25._16_4_ = fVar304 * fVar254;
    fVar308 = local_900._20_4_;
    auVar25._20_4_ = fVar308 * fVar267;
    fVar312 = local_900._24_4_;
    auVar25._24_4_ = fVar312 * fVar290;
    auVar25._28_4_ = auVar105._28_4_;
    auVar26._4_4_ = fVar340 * fVar283;
    auVar26._0_4_ = fVar336 * fVar192;
    auVar26._8_4_ = fVar342 * fVar242;
    auVar26._12_4_ = fVar344 * fVar247;
    auVar26._16_4_ = fVar346 * fVar256;
    auVar26._20_4_ = fVar348 * fVar268;
    uVar85 = local_720._28_4_;
    auVar26._24_4_ = fVar350 * fVar296;
    auVar26._28_4_ = uVar85;
    auVar105 = vsubps_avx(auVar26,auVar25);
    auVar27._4_4_ = fVar357 * fVar283;
    auVar27._0_4_ = fVar352 * fVar192;
    auVar27._8_4_ = fVar358 * fVar242;
    auVar27._12_4_ = fVar359 * fVar247;
    auVar27._16_4_ = fVar360 * fVar256;
    auVar27._20_4_ = fVar361 * fVar268;
    auVar27._24_4_ = fVar362 * fVar296;
    auVar27._28_4_ = uVar85;
    auVar28._4_4_ = fVar288 * fVar194;
    auVar28._0_4_ = fVar276 * fVar173;
    auVar28._8_4_ = fVar294 * fVar334;
    auVar28._12_4_ = fVar300 * fVar231;
    auVar28._16_4_ = fVar304 * fVar253;
    auVar28._20_4_ = fVar308 * fVar266;
    auVar28._24_4_ = fVar312 * fVar284;
    auVar28._28_4_ = local_8e0._28_4_;
    auVar21 = vsubps_avx(auVar28,auVar27);
    fVar210 = auVar21._28_4_;
    fVar272 = auVar105._28_4_ + fVar210;
    auVar29._4_4_ =
         (auVar17._4_4_ * auVar17._4_4_ +
         auVar18._4_4_ * auVar18._4_4_ + auVar365._4_4_ * auVar365._4_4_) * fVar250;
    auVar29._0_4_ =
         (auVar17._0_4_ * auVar17._0_4_ +
         auVar18._0_4_ * auVar18._0_4_ + auVar365._0_4_ * auVar365._0_4_) * fVar230;
    auVar29._8_4_ =
         (auVar17._8_4_ * auVar17._8_4_ +
         auVar18._8_4_ * auVar18._8_4_ + auVar365._8_4_ * auVar365._8_4_) * fVar251;
    auVar29._12_4_ =
         (auVar17._12_4_ * auVar17._12_4_ +
         auVar18._12_4_ * auVar18._12_4_ + auVar365._12_4_ * auVar365._12_4_) * fVar257;
    auVar29._16_4_ =
         (auVar17._16_4_ * auVar17._16_4_ +
         auVar18._16_4_ * auVar18._16_4_ + auVar365._16_4_ * auVar365._16_4_) * fVar259;
    auVar29._20_4_ =
         (auVar17._20_4_ * auVar17._20_4_ +
         auVar18._20_4_ * auVar18._20_4_ + auVar365._20_4_ * auVar365._20_4_) * fVar265;
    auVar29._24_4_ =
         (auVar17._24_4_ * auVar17._24_4_ +
         auVar18._24_4_ * auVar18._24_4_ + auVar365._24_4_ * auVar365._24_4_) * fVar269;
    auVar29._28_4_ = auVar17._28_4_ + fVar295;
    auVar30._4_4_ =
         (auVar20._4_4_ * auVar20._4_4_ +
         auVar105._4_4_ * auVar105._4_4_ + auVar21._4_4_ * auVar21._4_4_) * fVar250;
    auVar30._0_4_ =
         (auVar20._0_4_ * auVar20._0_4_ +
         auVar105._0_4_ * auVar105._0_4_ + auVar21._0_4_ * auVar21._0_4_) * fVar230;
    auVar30._8_4_ =
         (auVar20._8_4_ * auVar20._8_4_ +
         auVar105._8_4_ * auVar105._8_4_ + auVar21._8_4_ * auVar21._8_4_) * fVar251;
    auVar30._12_4_ =
         (auVar20._12_4_ * auVar20._12_4_ +
         auVar105._12_4_ * auVar105._12_4_ + auVar21._12_4_ * auVar21._12_4_) * fVar257;
    auVar30._16_4_ =
         (auVar20._16_4_ * auVar20._16_4_ +
         auVar105._16_4_ * auVar105._16_4_ + auVar21._16_4_ * auVar21._16_4_) * fVar259;
    auVar30._20_4_ =
         (auVar20._20_4_ * auVar20._20_4_ +
         auVar105._20_4_ * auVar105._20_4_ + auVar21._20_4_ * auVar21._20_4_) * fVar265;
    auVar30._24_4_ =
         (auVar20._24_4_ * auVar20._24_4_ +
         auVar105._24_4_ * auVar105._24_4_ + auVar21._24_4_ * auVar21._24_4_) * fVar269;
    auVar30._28_4_ = auVar19._28_4_ + auVar104._28_4_;
    auVar104 = vmaxps_avx(auVar29,auVar30);
    auVar105 = vperm2f128_avx(_local_b00,_local_b00,1);
    auVar105 = vshufps_avx(auVar105,_local_b00,0x30);
    auVar18 = vshufps_avx(_local_b00,auVar105,0x29);
    auVar161._0_4_ = (float)local_b00._0_4_ + fVar233;
    auVar161._4_4_ = (float)local_b00._4_4_ + fVar244;
    auVar161._8_4_ = fStack_af8 + fVar245;
    auVar161._12_4_ = fStack_af4 + fVar289;
    auVar161._16_4_ = fStack_af0 + fVar228;
    auVar161._20_4_ = fStack_aec + fVar193;
    auVar161._24_4_ = fStack_ae8 + fVar229;
    auVar161._28_4_ = fStack_ae4 + fVar248;
    auVar105 = vmaxps_avx(_local_b00,auVar161);
    auVar17 = vmaxps_avx(auVar14,auVar18);
    auVar105 = vmaxps_avx(auVar105,auVar17);
    auVar17 = vrsqrtps_avx(auVar188);
    fVar228 = auVar17._0_4_;
    fVar193 = auVar17._4_4_;
    fVar229 = auVar17._8_4_;
    fVar289 = auVar17._12_4_;
    fVar295 = auVar17._16_4_;
    fVar233 = auVar17._20_4_;
    fVar244 = auVar17._24_4_;
    auVar31._4_4_ = fVar193 * fVar193 * fVar193 * auVar188._4_4_ * 0.5;
    auVar31._0_4_ = fVar228 * fVar228 * fVar228 * auVar188._0_4_ * 0.5;
    auVar31._8_4_ = fVar229 * fVar229 * fVar229 * auVar188._8_4_ * 0.5;
    auVar31._12_4_ = fVar289 * fVar289 * fVar289 * auVar188._12_4_ * 0.5;
    auVar31._16_4_ = fVar295 * fVar295 * fVar295 * auVar188._16_4_ * 0.5;
    auVar31._20_4_ = fVar233 * fVar233 * fVar233 * auVar188._20_4_ * 0.5;
    auVar31._24_4_ = fVar244 * fVar244 * fVar244 * auVar188._24_4_ * 0.5;
    auVar31._28_4_ = auVar188._28_4_;
    auVar32._4_4_ = fVar193 * 1.5;
    auVar32._0_4_ = fVar228 * 1.5;
    auVar32._8_4_ = fVar229 * 1.5;
    auVar32._12_4_ = fVar289 * 1.5;
    auVar32._16_4_ = fVar295 * 1.5;
    auVar32._20_4_ = fVar233 * 1.5;
    auVar32._24_4_ = fVar244 * 1.5;
    auVar32._28_4_ = auVar17._28_4_;
    local_540 = vsubps_avx(auVar32,auVar31);
    auVar68._4_4_ = fVar285;
    auVar68._0_4_ = fVar273;
    auVar68._8_4_ = fVar291;
    auVar68._12_4_ = fVar297;
    auVar68._16_4_ = fVar302;
    auVar68._20_4_ = fVar306;
    auVar68._24_4_ = fVar310;
    auVar68._28_4_ = fVar314;
    auVar365 = vsubps_avx(ZEXT832(0) << 0x20,auVar68);
    auVar19 = vsubps_avx(ZEXT832(0) << 0x20,auVar72);
    fVar368 = auVar19._0_4_;
    fVar370 = auVar19._4_4_;
    fVar371 = auVar19._8_4_;
    fVar372 = auVar19._12_4_;
    fVar373 = auVar19._16_4_;
    fVar374 = auVar19._20_4_;
    fVar375 = auVar19._24_4_;
    fVar228 = auVar365._0_4_;
    fVar289 = auVar365._4_4_;
    fVar244 = auVar365._8_4_;
    fVar248 = auVar365._12_4_;
    fVar257 = auVar365._16_4_;
    fVar269 = auVar365._20_4_;
    fVar301 = auVar365._24_4_;
    auVar279 = ZEXT832(0) << 0x20;
    auVar19 = vsubps_avx(auVar279,auVar69);
    fVar193 = auVar19._0_4_;
    fVar295 = auVar19._4_4_;
    fVar245 = auVar19._8_4_;
    fVar250 = auVar19._12_4_;
    fVar259 = auVar19._16_4_;
    fVar270 = auVar19._20_4_;
    fVar305 = auVar19._24_4_;
    auVar316._0_4_ = local_620 * fVar193 + local_780 * fVar228 + fVar368 * local_7a0;
    auVar316._4_4_ = fStack_61c * fVar295 + fStack_77c * fVar289 + fVar370 * fStack_79c;
    auVar316._8_4_ = fStack_618 * fVar245 + fStack_778 * fVar244 + fVar371 * fStack_798;
    auVar316._12_4_ = fStack_614 * fVar250 + fStack_774 * fVar248 + fVar372 * fStack_794;
    auVar316._16_4_ = fStack_610 * fVar259 + fStack_770 * fVar257 + fVar373 * fStack_790;
    auVar316._20_4_ = fStack_60c * fVar270 + fStack_76c * fVar269 + fVar374 * fStack_78c;
    auVar316._24_4_ = fStack_608 * fVar305 + fStack_768 * fVar301 + fVar375 * fStack_788;
    auVar316._28_4_ = fVar272 + auVar20._28_4_ + fVar272 + auVar17._28_4_;
    auVar323._0_4_ = fVar193 * fVar193 + fVar228 * fVar228 + fVar368 * fVar368;
    auVar323._4_4_ = fVar295 * fVar295 + fVar289 * fVar289 + fVar370 * fVar370;
    auVar323._8_4_ = fVar245 * fVar245 + fVar244 * fVar244 + fVar371 * fVar371;
    auVar323._12_4_ = fVar250 * fVar250 + fVar248 * fVar248 + fVar372 * fVar372;
    auVar323._16_4_ = fVar259 * fVar259 + fVar257 * fVar257 + fVar373 * fVar373;
    auVar323._20_4_ = fVar270 * fVar270 + fVar269 * fVar269 + fVar374 * fVar374;
    auVar323._24_4_ = fVar305 * fVar305 + fVar301 * fVar301 + fVar375 * fVar375;
    auVar323._28_4_ = fVar210 + fVar210 + fVar272;
    fVar229 = local_540._0_4_;
    fVar233 = local_540._4_4_;
    fVar230 = local_540._8_4_;
    fVar251 = local_540._12_4_;
    fVar265 = local_540._16_4_;
    fVar272 = local_540._20_4_;
    fVar309 = local_540._24_4_;
    fVar313 = local_2c0._28_4_;
    local_560 = local_620 * fVar229 * fVar192 +
                fVar173 * fVar229 * local_780 + fVar229 * fVar227 * local_7a0;
    fStack_55c = fStack_61c * fVar233 * fVar283 +
                 fVar194 * fVar233 * fStack_77c + fVar233 * fVar271 * fStack_79c;
    fStack_558 = fStack_618 * fVar230 * fVar242 +
                 fVar334 * fVar230 * fStack_778 + fVar230 * fVar241 * fStack_798;
    fStack_554 = fStack_614 * fVar251 * fVar247 +
                 fVar231 * fVar251 * fStack_774 + fVar251 * fVar232 * fStack_794;
    fStack_550 = fStack_610 * fVar265 * fVar256 +
                 fVar253 * fVar265 * fStack_770 + fVar265 * fVar254 * fStack_790;
    fStack_54c = fStack_60c * fVar272 * fVar268 +
                 fVar266 * fVar272 * fStack_76c + fVar272 * fVar267 * fStack_78c;
    fStack_548 = fStack_608 * fVar309 * fVar296 +
                 fVar284 * fVar309 * fStack_768 + fVar309 * fVar290 * fStack_788;
    fVar210 = fStack_604 + fVar313 + fStack_784;
    fVar123 = fVar193 * fVar229 * fVar192 +
              fVar173 * fVar229 * fVar228 + fVar368 * fVar229 * fVar227;
    fVar145 = fVar295 * fVar233 * fVar283 +
              fVar194 * fVar233 * fVar289 + fVar370 * fVar233 * fVar271;
    fVar147 = fVar245 * fVar230 * fVar242 +
              fVar334 * fVar230 * fVar244 + fVar371 * fVar230 * fVar241;
    fVar150 = fVar250 * fVar251 * fVar247 +
              fVar231 * fVar251 * fVar248 + fVar372 * fVar251 * fVar232;
    fStack_6f0 = fVar259 * fVar265 * fVar256 +
                 fVar253 * fVar265 * fVar257 + fVar373 * fVar265 * fVar254;
    fStack_6ec = fVar270 * fVar272 * fVar268 +
                 fVar266 * fVar272 * fVar269 + fVar374 * fVar272 * fVar267;
    fStack_6e8 = fVar305 * fVar309 * fVar296 +
                 fVar284 * fVar309 * fVar301 + fVar375 * fVar309 * fVar290;
    fStack_6e4 = fVar313 + fVar210;
    auVar33._4_4_ = fStack_55c * fVar145;
    auVar33._0_4_ = local_560 * fVar123;
    auVar33._8_4_ = fStack_558 * fVar147;
    auVar33._12_4_ = fStack_554 * fVar150;
    auVar33._16_4_ = fStack_550 * fStack_6f0;
    auVar33._20_4_ = fStack_54c * fStack_6ec;
    auVar33._24_4_ = fStack_548 * fStack_6e8;
    auVar33._28_4_ = fVar210;
    auVar20 = vsubps_avx(auVar316,auVar33);
    auVar34._4_4_ = fVar145 * fVar145;
    auVar34._0_4_ = fVar123 * fVar123;
    auVar34._8_4_ = fVar147 * fVar147;
    auVar34._12_4_ = fVar150 * fVar150;
    auVar34._16_4_ = fStack_6f0 * fStack_6f0;
    auVar34._20_4_ = fStack_6ec * fStack_6ec;
    auVar34._24_4_ = fStack_6e8 * fStack_6e8;
    auVar34._28_4_ = fVar313;
    auVar21 = vsubps_avx(auVar323,auVar34);
    auVar17 = vsqrtps_avx(auVar104);
    fVar210 = (auVar17._0_4_ + auVar105._0_4_) * 1.0000002;
    fVar319 = (auVar17._4_4_ + auVar105._4_4_) * 1.0000002;
    fVar320 = (auVar17._8_4_ + auVar105._8_4_) * 1.0000002;
    fVar351 = (auVar17._12_4_ + auVar105._12_4_) * 1.0000002;
    fVar116 = (auVar17._16_4_ + auVar105._16_4_) * 1.0000002;
    fVar118 = (auVar17._20_4_ + auVar105._20_4_) * 1.0000002;
    fVar120 = (auVar17._24_4_ + auVar105._24_4_) * 1.0000002;
    auVar35._4_4_ = fVar319 * fVar319;
    auVar35._0_4_ = fVar210 * fVar210;
    auVar35._8_4_ = fVar320 * fVar320;
    auVar35._12_4_ = fVar351 * fVar351;
    auVar35._16_4_ = fVar116 * fVar116;
    auVar35._20_4_ = fVar118 * fVar118;
    auVar35._24_4_ = fVar120 * fVar120;
    auVar35._28_4_ = auVar17._28_4_ + auVar105._28_4_;
    local_3c0._0_4_ = auVar20._0_4_ + auVar20._0_4_;
    local_3c0._4_4_ = auVar20._4_4_ + auVar20._4_4_;
    local_3c0._8_4_ = auVar20._8_4_ + auVar20._8_4_;
    local_3c0._12_4_ = auVar20._12_4_ + auVar20._12_4_;
    local_3c0._16_4_ = auVar20._16_4_ + auVar20._16_4_;
    local_3c0._20_4_ = auVar20._20_4_ + auVar20._20_4_;
    local_3c0._24_4_ = auVar20._24_4_ + auVar20._24_4_;
    fVar210 = auVar20._28_4_;
    local_3c0._28_4_ = fVar210 + fVar210;
    auVar105 = vsubps_avx(auVar21,auVar35);
    auVar36._4_4_ = fStack_55c * fStack_55c;
    auVar36._0_4_ = local_560 * local_560;
    auVar36._8_4_ = fStack_558 * fStack_558;
    auVar36._12_4_ = fStack_554 * fStack_554;
    auVar36._16_4_ = fStack_550 * fStack_550;
    auVar36._20_4_ = fStack_54c * fStack_54c;
    auVar36._24_4_ = fStack_548 * fStack_548;
    auVar36._28_4_ = fVar210;
    auVar327 = ZEXT3264(local_2a0);
    auVar20 = vsubps_avx(local_2a0,auVar36);
    auVar37._4_4_ = local_3c0._4_4_ * local_3c0._4_4_;
    auVar37._0_4_ = local_3c0._0_4_ * local_3c0._0_4_;
    auVar37._8_4_ = local_3c0._8_4_ * local_3c0._8_4_;
    auVar37._12_4_ = local_3c0._12_4_ * local_3c0._12_4_;
    auVar37._16_4_ = local_3c0._16_4_ * local_3c0._16_4_;
    auVar37._20_4_ = local_3c0._20_4_ * local_3c0._20_4_;
    auVar37._24_4_ = local_3c0._24_4_ * local_3c0._24_4_;
    auVar37._28_4_ = auVar21._28_4_;
    fVar210 = auVar20._0_4_;
    fVar319 = auVar20._4_4_;
    fVar320 = auVar20._8_4_;
    fVar351 = auVar20._12_4_;
    fVar116 = auVar20._16_4_;
    fVar118 = auVar20._20_4_;
    fVar120 = auVar20._24_4_;
    auVar38._4_4_ = auVar105._4_4_ * fVar319 * 4.0;
    auVar38._0_4_ = auVar105._0_4_ * fVar210 * 4.0;
    auVar38._8_4_ = auVar105._8_4_ * fVar320 * 4.0;
    auVar38._12_4_ = auVar105._12_4_ * fVar351 * 4.0;
    auVar38._16_4_ = auVar105._16_4_ * fVar116 * 4.0;
    auVar38._20_4_ = auVar105._20_4_ * fVar118 * 4.0;
    auVar38._24_4_ = auVar105._24_4_ * fVar120 * 4.0;
    auVar38._28_4_ = 0x40800000;
    auVar22 = vsubps_avx(auVar37,auVar38);
    auVar104 = vcmpps_avx(auVar22,auVar279,5);
    auVar133._8_4_ = 0x7fffffff;
    auVar133._0_8_ = 0x7fffffff7fffffff;
    auVar133._12_4_ = 0x7fffffff;
    auVar133._16_4_ = 0x7fffffff;
    auVar133._20_4_ = 0x7fffffff;
    auVar133._24_4_ = 0x7fffffff;
    auVar133._28_4_ = 0x7fffffff;
    local_3a0 = vandps_avx(auVar36,auVar133);
    local_320._0_4_ = fVar210 + fVar210;
    local_320._4_4_ = fVar319 + fVar319;
    local_320._8_4_ = fVar320 + fVar320;
    local_320._12_4_ = fVar351 + fVar351;
    local_320._16_4_ = fVar116 + fVar116;
    local_320._20_4_ = fVar118 + fVar118;
    local_320._24_4_ = fVar120 + fVar120;
    local_320._28_4_ = auVar20._28_4_ + auVar20._28_4_;
    _local_a80 = vandps_avx(auVar20,auVar133);
    uVar79 = CONCAT44(local_3c0._4_4_,local_3c0._0_4_);
    local_8c0._0_8_ = uVar79 ^ 0x8000000080000000;
    local_8c0._8_4_ = -local_3c0._8_4_;
    local_8c0._12_4_ = -local_3c0._12_4_;
    local_8c0._16_4_ = -local_3c0._16_4_;
    local_8c0._20_4_ = -local_3c0._20_4_;
    local_8c0._24_4_ = -local_3c0._24_4_;
    local_8c0._28_4_ = -local_3c0._28_4_;
    if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar104 >> 0x7f,0) == '\0') &&
          (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar104 >> 0xbf,0) == '\0') &&
        (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar104[0x1f])
    {
      auVar317._8_4_ = 0x7f800000;
      auVar317._0_8_ = 0x7f8000007f800000;
      auVar317._12_4_ = 0x7f800000;
      auVar317._16_4_ = 0x7f800000;
      auVar317._20_4_ = 0x7f800000;
      auVar317._24_4_ = 0x7f800000;
      auVar317._28_4_ = 0x7f800000;
      auVar106._8_4_ = 0xff800000;
      auVar106._0_8_ = 0xff800000ff800000;
      auVar106._12_4_ = 0xff800000;
      auVar106._16_4_ = 0xff800000;
      auVar106._20_4_ = 0xff800000;
      auVar106._24_4_ = 0xff800000;
      auVar106._28_4_ = 0xff800000;
    }
    else {
      auVar15 = vsqrtps_avx(auVar22);
      auVar12 = vrcpps_avx(local_320);
      auVar20 = vcmpps_avx(auVar22,auVar279,5);
      fVar87 = auVar12._0_4_;
      fVar113 = auVar12._4_4_;
      auVar39._4_4_ = local_320._4_4_ * fVar113;
      auVar39._0_4_ = local_320._0_4_ * fVar87;
      fVar114 = auVar12._8_4_;
      auVar39._8_4_ = local_320._8_4_ * fVar114;
      fVar115 = auVar12._12_4_;
      auVar39._12_4_ = local_320._12_4_ * fVar115;
      fVar117 = auVar12._16_4_;
      auVar39._16_4_ = local_320._16_4_ * fVar117;
      fVar119 = auVar12._20_4_;
      auVar39._20_4_ = local_320._20_4_ * fVar119;
      fVar121 = auVar12._24_4_;
      auVar39._24_4_ = local_320._24_4_ * fVar121;
      auVar39._28_4_ = auVar22._28_4_;
      auVar134._8_4_ = 0x3f800000;
      auVar134._0_8_ = 0x3f8000003f800000;
      auVar134._12_4_ = 0x3f800000;
      auVar134._16_4_ = 0x3f800000;
      auVar134._20_4_ = 0x3f800000;
      auVar134._24_4_ = 0x3f800000;
      auVar134._28_4_ = 0x3f800000;
      auVar22 = vsubps_avx(auVar134,auVar39);
      fVar87 = fVar87 + fVar87 * auVar22._0_4_;
      fVar113 = fVar113 + fVar113 * auVar22._4_4_;
      fVar114 = fVar114 + fVar114 * auVar22._8_4_;
      fVar115 = fVar115 + fVar115 * auVar22._12_4_;
      fVar117 = fVar117 + fVar117 * auVar22._16_4_;
      fVar119 = fVar119 + fVar119 * auVar22._20_4_;
      fVar121 = fVar121 + fVar121 * auVar22._24_4_;
      auVar279 = vsubps_avx(local_8c0,auVar15);
      fVar234 = auVar279._0_4_ * fVar87;
      fVar243 = auVar279._4_4_ * fVar113;
      auVar40._4_4_ = fVar243;
      auVar40._0_4_ = fVar234;
      fVar246 = auVar279._8_4_ * fVar114;
      auVar40._8_4_ = fVar246;
      fVar249 = auVar279._12_4_ * fVar115;
      auVar40._12_4_ = fVar249;
      fVar252 = auVar279._16_4_ * fVar117;
      auVar40._16_4_ = fVar252;
      fVar255 = auVar279._20_4_ * fVar119;
      auVar40._20_4_ = fVar255;
      fVar258 = auVar279._24_4_ * fVar121;
      auVar40._24_4_ = fVar258;
      auVar40._28_4_ = auVar279._28_4_;
      auVar279 = vsubps_avx(auVar15,local_3c0);
      fVar87 = auVar279._0_4_ * fVar87;
      fVar113 = auVar279._4_4_ * fVar113;
      auVar41._4_4_ = fVar113;
      auVar41._0_4_ = fVar87;
      fVar114 = auVar279._8_4_ * fVar114;
      auVar41._8_4_ = fVar114;
      fVar115 = auVar279._12_4_ * fVar115;
      auVar41._12_4_ = fVar115;
      fVar117 = auVar279._16_4_ * fVar117;
      auVar41._16_4_ = fVar117;
      fVar119 = auVar279._20_4_ * fVar119;
      auVar41._20_4_ = fVar119;
      fVar121 = auVar279._24_4_ * fVar121;
      auVar41._24_4_ = fVar121;
      auVar41._28_4_ = auVar12._28_4_ + auVar22._28_4_;
      local_380 = fVar229 * (fVar123 + local_560 * fVar234);
      fStack_37c = fVar233 * (fVar145 + fStack_55c * fVar243);
      fStack_378 = fVar230 * (fVar147 + fStack_558 * fVar246);
      fStack_374 = fVar251 * (fVar150 + fStack_554 * fVar249);
      fStack_370 = fVar265 * (fStack_6f0 + fStack_550 * fVar252);
      fStack_36c = fVar272 * (fStack_6ec + fStack_54c * fVar255);
      fStack_368 = fVar309 * (fStack_6e8 + fStack_548 * fVar258);
      uStack_364 = 0x3f800000;
      local_360 = fVar229 * (fVar123 + local_560 * fVar87);
      fStack_35c = fVar233 * (fVar145 + fStack_55c * fVar113);
      fStack_358 = fVar230 * (fVar147 + fStack_558 * fVar114);
      fStack_354 = fVar251 * (fVar150 + fStack_554 * fVar115);
      fStack_350 = fVar265 * (fStack_6f0 + fStack_550 * fVar117);
      fStack_34c = fVar272 * (fStack_6ec + fStack_54c * fVar119);
      fStack_348 = fVar309 * (fStack_6e8 + fStack_548 * fVar121);
      uStack_344 = 0x3f800000;
      auVar217._8_4_ = 0x7f800000;
      auVar217._0_8_ = 0x7f8000007f800000;
      auVar217._12_4_ = 0x7f800000;
      auVar217._16_4_ = 0x7f800000;
      auVar217._20_4_ = 0x7f800000;
      auVar217._24_4_ = 0x7f800000;
      auVar217._28_4_ = 0x7f800000;
      auVar317 = vblendvps_avx(auVar217,auVar40,auVar20);
      auVar218._8_4_ = 0xff800000;
      auVar218._0_8_ = 0xff800000ff800000;
      auVar218._12_4_ = 0xff800000;
      auVar218._16_4_ = 0xff800000;
      auVar218._20_4_ = 0xff800000;
      auVar218._24_4_ = 0xff800000;
      auVar218._28_4_ = 0xff800000;
      auVar106 = vblendvps_avx(auVar218,auVar41,auVar20);
      auVar22 = vmaxps_avx(local_520,local_3a0);
      auVar42._4_4_ = auVar22._4_4_ * 1.9073486e-06;
      auVar42._0_4_ = auVar22._0_4_ * 1.9073486e-06;
      auVar42._8_4_ = auVar22._8_4_ * 1.9073486e-06;
      auVar42._12_4_ = auVar22._12_4_ * 1.9073486e-06;
      auVar42._16_4_ = auVar22._16_4_ * 1.9073486e-06;
      auVar42._20_4_ = auVar22._20_4_ * 1.9073486e-06;
      auVar42._24_4_ = auVar22._24_4_ * 1.9073486e-06;
      auVar42._28_4_ = auVar22._28_4_;
      auVar22 = vcmpps_avx(_local_a80,auVar42,1);
      auVar327 = ZEXT3264(auVar22);
      auVar279 = auVar20 & auVar22;
      if ((((((((auVar279 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar279 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar279 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar279 >> 0x7f,0) != '\0') ||
            (auVar279 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar279 >> 0xbf,0) != '\0') ||
          (auVar279 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar279[0x1f] < '\0') {
        auVar104 = vandps_avx(auVar22,auVar20);
        auVar179 = vpackssdw_avx(auVar104._0_16_,auVar104._16_16_);
        auVar22 = vcmpps_avx(auVar105,_DAT_01f7b000,2);
        auVar326._8_4_ = 0xff800000;
        auVar326._0_8_ = 0xff800000ff800000;
        auVar326._12_4_ = 0xff800000;
        auVar326._16_4_ = 0xff800000;
        auVar326._20_4_ = 0xff800000;
        auVar326._24_4_ = 0xff800000;
        auVar326._28_4_ = 0xff800000;
        auVar337._8_4_ = 0x7f800000;
        auVar337._0_8_ = 0x7f8000007f800000;
        auVar337._12_4_ = 0x7f800000;
        auVar337._16_4_ = 0x7f800000;
        auVar337._20_4_ = 0x7f800000;
        auVar337._24_4_ = 0x7f800000;
        auVar337._28_4_ = 0x7f800000;
        auVar105 = vblendvps_avx(auVar337,auVar326,auVar22);
        auVar10 = vpmovsxwd_avx(auVar179);
        auVar327 = ZEXT1664(auVar10);
        auVar179 = vpunpckhwd_avx(auVar179,auVar179);
        auVar225._16_16_ = auVar179;
        auVar225._0_16_ = auVar10;
        auVar317 = vblendvps_avx(auVar317,auVar105,auVar225);
        auVar263._8_4_ = 0xff800000;
        auVar263._0_8_ = 0xff800000ff800000;
        auVar263._12_4_ = 0xff800000;
        auVar263._16_4_ = 0xff800000;
        auVar263._20_4_ = 0xff800000;
        auVar263._24_4_ = 0xff800000;
        auVar263._28_4_ = 0xff800000;
        auVar105 = vblendvps_avx(auVar263,auVar337,auVar22);
        auVar106 = vblendvps_avx(auVar106,auVar105,auVar225);
        auVar168._0_8_ = auVar104._0_8_ ^ 0xffffffffffffffff;
        auVar168._8_4_ = auVar104._8_4_ ^ 0xffffffff;
        auVar168._12_4_ = auVar104._12_4_ ^ 0xffffffff;
        auVar168._16_4_ = auVar104._16_4_ ^ 0xffffffff;
        auVar168._20_4_ = auVar104._20_4_ ^ 0xffffffff;
        auVar168._24_4_ = auVar104._24_4_ ^ 0xffffffff;
        auVar168._28_4_ = auVar104._28_4_ ^ 0xffffffff;
        auVar104 = vorps_avx(auVar22,auVar168);
        auVar104 = vandps_avx(auVar20,auVar104);
      }
    }
    auVar355._4_4_ = fStack_79c;
    auVar355._0_4_ = local_7a0;
    auVar9._4_4_ = fStack_77c;
    auVar9._0_4_ = local_780;
    auVar355._8_4_ = fStack_798;
    auVar9._8_4_ = fStack_778;
    auVar355._12_4_ = fStack_794;
    auVar9._12_4_ = fStack_774;
    auVar355._16_4_ = fStack_790;
    auVar9._16_4_ = fStack_770;
    auVar355._20_4_ = fStack_78c;
    auVar9._20_4_ = fStack_76c;
    auVar355._24_4_ = fStack_788;
    auVar9._24_4_ = fStack_768;
    auVar355._28_4_ = fStack_784;
    auVar9._28_4_ = fStack_764;
    auVar264 = ZEXT3264(local_340);
    auVar20 = local_340 & auVar104;
    auVar105 = _local_a80;
    if ((((((((auVar20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar20 >> 0x7f,0) == '\0') &&
          (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar20 >> 0xbf,0) == '\0') &&
        (auVar20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar20[0x1f]) {
LAB_007abda0:
      auVar338 = ZEXT3264(auVar9);
      auVar318 = ZEXT3264(auVar317);
      auVar356 = ZEXT3264(auVar355);
      auVar240 = ZEXT3264(auVar105);
    }
    else {
      fStack_544 = fStack_604 + fVar313 + fStack_784;
      auVar179 = ZEXT416((uint)((ray->org).field_0.m128[3] - (float)local_830._0_4_));
      auVar179 = vshufps_avx(auVar179,auVar179,0);
      auVar219._16_16_ = auVar179;
      auVar219._0_16_ = auVar179;
      auVar20 = vmaxps_avx(auVar219,auVar317);
      auVar179 = ZEXT416((uint)(ray->tfar - (float)local_830._0_4_));
      auVar179 = vshufps_avx(auVar179,auVar179,0);
      auVar220._16_16_ = auVar179;
      auVar220._0_16_ = auVar179;
      auVar22 = vminps_avx(auVar220,auVar106);
      fVar121 = auVar19._28_4_;
      auVar317._4_4_ = fStack_61c;
      auVar317._0_4_ = local_620;
      auVar317._8_4_ = fStack_618;
      auVar317._12_4_ = fStack_614;
      auVar317._16_4_ = fStack_610;
      auVar317._20_4_ = fStack_60c;
      auVar317._24_4_ = fStack_608;
      auVar317._28_4_ = fStack_604;
      auVar135._0_4_ = local_620 * fVar275 + local_780 * fVar321 + local_7a0 * fVar335;
      auVar135._4_4_ = fStack_61c * fVar287 + fStack_77c * fVar328 + fStack_79c * fVar339;
      auVar135._8_4_ = fStack_618 * fVar293 + fStack_778 * fVar329 + fStack_798 * fVar341;
      auVar135._12_4_ = fStack_614 * fVar299 + fStack_774 * fVar330 + fStack_794 * fVar343;
      auVar135._16_4_ = fStack_610 * fVar303 + fStack_770 * fVar331 + fStack_790 * fVar345;
      auVar135._20_4_ = fStack_60c * fVar307 + fStack_76c * fVar332 + fStack_78c * fVar347;
      auVar135._24_4_ = fStack_608 * fVar311 + fStack_768 * fVar333 + fStack_788 * fVar349;
      auVar135._28_4_ = fVar121 + fVar121 + fStack_204;
      auVar105 = vrcpps_avx(auVar135);
      fVar313 = auVar105._0_4_;
      fVar87 = auVar105._4_4_;
      auVar43._4_4_ = auVar135._4_4_ * fVar87;
      auVar43._0_4_ = auVar135._0_4_ * fVar313;
      fVar113 = auVar105._8_4_;
      auVar43._8_4_ = auVar135._8_4_ * fVar113;
      fVar114 = auVar105._12_4_;
      auVar43._12_4_ = auVar135._12_4_ * fVar114;
      fVar115 = auVar105._16_4_;
      auVar43._16_4_ = auVar135._16_4_ * fVar115;
      fVar117 = auVar105._20_4_;
      auVar43._20_4_ = auVar135._20_4_ * fVar117;
      fVar119 = auVar105._24_4_;
      auVar43._24_4_ = auVar135._24_4_ * fVar119;
      auVar43._28_4_ = auVar179._12_4_;
      auVar364._8_4_ = 0x3f800000;
      auVar364._0_8_ = 0x3f8000003f800000;
      auVar364._12_4_ = 0x3f800000;
      auVar364._16_4_ = 0x3f800000;
      auVar364._20_4_ = 0x3f800000;
      auVar364._24_4_ = 0x3f800000;
      auVar364._28_4_ = 0x3f800000;
      auVar19 = vsubps_avx(auVar364,auVar43);
      auVar280._8_4_ = 0x7fffffff;
      auVar280._0_8_ = 0x7fffffff7fffffff;
      auVar280._12_4_ = 0x7fffffff;
      auVar280._16_4_ = 0x7fffffff;
      auVar280._20_4_ = 0x7fffffff;
      auVar280._24_4_ = 0x7fffffff;
      auVar280._28_4_ = 0x7fffffff;
      auVar105 = vandps_avx(auVar280,auVar135);
      auVar376._8_4_ = 0x219392ef;
      auVar376._0_8_ = 0x219392ef219392ef;
      auVar376._12_4_ = 0x219392ef;
      auVar376._16_4_ = 0x219392ef;
      auVar376._20_4_ = 0x219392ef;
      auVar376._24_4_ = 0x219392ef;
      auVar376._28_4_ = 0x219392ef;
      auVar105 = vcmpps_avx(auVar105,auVar376,1);
      auVar44._4_4_ =
           (fVar87 + fVar87 * auVar19._4_4_) *
           -(fVar287 * fVar295 + fVar328 * fVar289 + fVar370 * fVar339);
      auVar44._0_4_ =
           (fVar313 + fVar313 * auVar19._0_4_) *
           -(fVar275 * fVar193 + fVar321 * fVar228 + fVar368 * fVar335);
      auVar44._8_4_ =
           (fVar113 + fVar113 * auVar19._8_4_) *
           -(fVar293 * fVar245 + fVar329 * fVar244 + fVar371 * fVar341);
      auVar44._12_4_ =
           (fVar114 + fVar114 * auVar19._12_4_) *
           -(fVar299 * fVar250 + fVar330 * fVar248 + fVar372 * fVar343);
      auVar44._16_4_ =
           (fVar115 + fVar115 * auVar19._16_4_) *
           -(fVar303 * fVar259 + fVar331 * fVar257 + fVar373 * fVar345);
      auVar44._20_4_ =
           (fVar117 + fVar117 * auVar19._20_4_) *
           -(fVar307 * fVar270 + fVar332 * fVar269 + fVar374 * fVar347);
      auVar44._24_4_ =
           (fVar119 + fVar119 * auVar19._24_4_) *
           -(fVar311 * fVar305 + fVar333 * fVar301 + fVar375 * fVar349);
      auVar44._28_4_ = -(fVar121 + auVar365._28_4_ + auVar179._12_4_);
      auVar279 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar365 = vcmpps_avx(auVar135,auVar279,1);
      auVar19 = vorps_avx(auVar105,auVar365);
      auVar365 = vcmpps_avx(auVar135,auVar279,6);
      auVar365 = vorps_avx(auVar105,auVar365);
      auVar355._8_4_ = 0xff800000;
      auVar355._0_8_ = 0xff800000ff800000;
      auVar355._12_4_ = 0xff800000;
      auVar355._16_4_ = 0xff800000;
      auVar355._20_4_ = 0xff800000;
      auVar355._24_4_ = 0xff800000;
      auVar355._28_4_ = 0xff800000;
      auVar105 = vblendvps_avx(auVar44,auVar355,auVar19);
      auVar369._8_4_ = 0x7f800000;
      auVar369._0_8_ = 0x7f8000007f800000;
      auVar369._12_4_ = 0x7f800000;
      auVar369._16_4_ = 0x7f800000;
      auVar369._20_4_ = 0x7f800000;
      auVar369._24_4_ = 0x7f800000;
      auVar369._28_4_ = 0x7f800000;
      auVar365 = vblendvps_avx(auVar44,auVar369,auVar365);
      auVar19 = vmaxps_avx(auVar20,auVar105);
      auVar9 = vminps_avx(auVar22,auVar365);
      auVar365 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar105 = vsubps_avx(auVar365,auVar13);
      auVar13 = vsubps_avx(auVar365,local_8a0);
      auVar45._4_4_ = auVar13._4_4_ * -fVar340;
      auVar45._0_4_ = auVar13._0_4_ * -fVar336;
      auVar45._8_4_ = auVar13._8_4_ * -fVar342;
      auVar45._12_4_ = auVar13._12_4_ * -fVar344;
      auVar45._16_4_ = auVar13._16_4_ * -fVar346;
      auVar45._20_4_ = auVar13._20_4_ * -fVar348;
      auVar45._24_4_ = auVar13._24_4_ * -fVar350;
      auVar45._28_4_ = auVar13._28_4_;
      auVar46._4_4_ = fVar357 * auVar105._4_4_;
      auVar46._0_4_ = fVar352 * auVar105._0_4_;
      auVar46._8_4_ = fVar358 * auVar105._8_4_;
      auVar46._12_4_ = fVar359 * auVar105._12_4_;
      auVar46._16_4_ = fVar360 * auVar105._16_4_;
      auVar46._20_4_ = fVar361 * auVar105._20_4_;
      auVar46._24_4_ = fVar362 * auVar105._24_4_;
      auVar46._28_4_ = auVar105._28_4_;
      auVar105 = vsubps_avx(auVar45,auVar46);
      auVar13 = vsubps_avx(auVar365,local_a60);
      auVar48._4_4_ = fVar288 * auVar13._4_4_;
      auVar48._0_4_ = fVar276 * auVar13._0_4_;
      auVar48._8_4_ = fVar294 * auVar13._8_4_;
      auVar48._12_4_ = fVar300 * auVar13._12_4_;
      auVar48._16_4_ = fVar304 * auVar13._16_4_;
      auVar48._20_4_ = fVar308 * auVar13._20_4_;
      uVar47 = auVar13._28_4_;
      auVar48._24_4_ = fVar312 * auVar13._24_4_;
      auVar48._28_4_ = uVar47;
      auVar13 = vsubps_avx(auVar105,auVar48);
      auVar49._4_4_ = fStack_79c * -fVar340;
      auVar49._0_4_ = local_7a0 * -fVar336;
      auVar49._8_4_ = fStack_798 * -fVar342;
      auVar49._12_4_ = fStack_794 * -fVar344;
      auVar49._16_4_ = fStack_790 * -fVar346;
      auVar49._20_4_ = fStack_78c * -fVar348;
      auVar49._24_4_ = fStack_788 * -fVar350;
      auVar49._28_4_ = uVar85 ^ 0x80000000;
      auVar50._4_4_ = fStack_77c * fVar357;
      auVar50._0_4_ = local_780 * fVar352;
      auVar50._8_4_ = fStack_778 * fVar358;
      auVar50._12_4_ = fStack_774 * fVar359;
      auVar50._16_4_ = fStack_770 * fVar360;
      auVar50._20_4_ = fStack_76c * fVar361;
      auVar50._24_4_ = fStack_768 * fVar362;
      auVar50._28_4_ = uVar47;
      auVar327 = ZEXT864(0) << 0x20;
      auVar105 = vsubps_avx(auVar49,auVar50);
      auVar51._4_4_ = fStack_61c * fVar288;
      auVar51._0_4_ = local_620 * fVar276;
      auVar51._8_4_ = fStack_618 * fVar294;
      auVar51._12_4_ = fStack_614 * fVar300;
      auVar51._16_4_ = fStack_610 * fVar304;
      auVar51._20_4_ = fStack_60c * fVar308;
      auVar51._24_4_ = fStack_608 * fVar312;
      auVar51._28_4_ = uVar47;
      auVar366._8_4_ = 0x3f800000;
      auVar366._0_8_ = 0x3f8000003f800000;
      auVar366._12_4_ = 0x3f800000;
      auVar366._16_4_ = 0x3f800000;
      auVar366._20_4_ = 0x3f800000;
      auVar366._24_4_ = 0x3f800000;
      auVar366._28_4_ = 0x3f800000;
      auVar365 = vsubps_avx(auVar105,auVar51);
      auVar105 = vrcpps_avx(auVar365);
      fVar228 = auVar105._0_4_;
      fVar193 = auVar105._4_4_;
      auVar52._4_4_ = auVar365._4_4_ * fVar193;
      auVar52._0_4_ = auVar365._0_4_ * fVar228;
      fVar289 = auVar105._8_4_;
      auVar52._8_4_ = auVar365._8_4_ * fVar289;
      fVar295 = auVar105._12_4_;
      auVar52._12_4_ = auVar365._12_4_ * fVar295;
      fVar244 = auVar105._16_4_;
      auVar52._16_4_ = auVar365._16_4_ * fVar244;
      fVar245 = auVar105._20_4_;
      auVar52._20_4_ = auVar365._20_4_ * fVar245;
      fVar248 = auVar105._24_4_;
      auVar52._24_4_ = auVar365._24_4_ * fVar248;
      auVar52._28_4_ = local_8e0._28_4_;
      auVar20 = vsubps_avx(auVar366,auVar52);
      auVar105 = vandps_avx(auVar280,auVar365);
      auVar107._8_4_ = 0x219392ef;
      auVar107._0_8_ = 0x219392ef219392ef;
      auVar107._12_4_ = 0x219392ef;
      auVar107._16_4_ = 0x219392ef;
      auVar107._20_4_ = 0x219392ef;
      auVar107._24_4_ = 0x219392ef;
      auVar107._28_4_ = 0x219392ef;
      auVar105 = vcmpps_avx(auVar105,auVar107,1);
      auVar53._4_4_ = (fVar193 + fVar193 * auVar20._4_4_) * -auVar13._4_4_;
      auVar53._0_4_ = (fVar228 + fVar228 * auVar20._0_4_) * -auVar13._0_4_;
      auVar53._8_4_ = (fVar289 + fVar289 * auVar20._8_4_) * -auVar13._8_4_;
      auVar53._12_4_ = (fVar295 + fVar295 * auVar20._12_4_) * -auVar13._12_4_;
      auVar53._16_4_ = (fVar244 + fVar244 * auVar20._16_4_) * -auVar13._16_4_;
      auVar53._20_4_ = (fVar245 + fVar245 * auVar20._20_4_) * -auVar13._20_4_;
      auVar53._24_4_ = (fVar248 + fVar248 * auVar20._24_4_) * -auVar13._24_4_;
      auVar53._28_4_ = auVar13._28_4_ ^ 0x80000000;
      auVar13 = vcmpps_avx(auVar365,ZEXT832(0) << 0x20,1);
      auVar13 = vorps_avx(auVar105,auVar13);
      auVar13 = vblendvps_avx(auVar53,auVar355,auVar13);
      local_800 = vmaxps_avx(auVar19,auVar13);
      auVar13 = vcmpps_avx(auVar365,ZEXT832(0) << 0x20,6);
      auVar13 = vorps_avx(auVar105,auVar13);
      auVar13 = vblendvps_avx(auVar53,auVar369,auVar13);
      auVar104 = vandps_avx(auVar104,local_340);
      local_5c0 = vminps_avx(auVar9,auVar13);
      auVar13 = vcmpps_avx(local_800,local_5c0,2);
      auVar365 = auVar104 & auVar13;
      if ((((((((auVar365 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar365 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar365 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar365 >> 0x7f,0) == '\0') &&
            (auVar365 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar365 >> 0xbf,0) == '\0') &&
          (auVar365 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar365[0x1f]) goto LAB_007abda0;
      auVar105 = vminps_avx(_local_b00,auVar161);
      auVar14 = vminps_avx(auVar14,auVar18);
      auVar105 = vminps_avx(auVar105,auVar14);
      auVar17 = vsubps_avx(auVar105,auVar17);
      auVar104 = vandps_avx(auVar13,auVar104);
      auVar73._4_4_ = fStack_37c;
      auVar73._0_4_ = local_380;
      auVar73._8_4_ = fStack_378;
      auVar73._12_4_ = fStack_374;
      auVar73._16_4_ = fStack_370;
      auVar73._20_4_ = fStack_36c;
      auVar73._24_4_ = fStack_368;
      auVar73._28_4_ = uStack_364;
      auVar105 = vminps_avx(auVar73,auVar366);
      auVar264 = ZEXT864(0) << 0x20;
      auVar105 = vmaxps_avx(auVar105,ZEXT832(0) << 0x20);
      fVar228 = DAT_01f7b060._28_4_;
      local_1a0[0] = fVar151 + fVar122 * (auVar105._0_4_ + (float)DAT_01f7b060) * 0.125;
      local_1a0[1] = fVar170 + fVar144 * (auVar105._4_4_ + DAT_01f7b060._4_4_) * 0.125;
      local_1a0[2] = fVar171 + fVar146 * (auVar105._8_4_ + DAT_01f7b060._8_4_) * 0.125;
      local_1a0[3] = fVar172 + fVar149 * (auVar105._12_4_ + DAT_01f7b060._12_4_) * 0.125;
      fStack_190 = fVar151 + fVar122 * (auVar105._16_4_ + DAT_01f7b060._16_4_) * 0.125;
      fStack_18c = fVar170 + fVar144 * (auVar105._20_4_ + DAT_01f7b060._20_4_) * 0.125;
      fStack_188 = fVar171 + fVar146 * (auVar105._24_4_ + DAT_01f7b060._24_4_) * 0.125;
      fStack_184 = fVar172 + auVar105._28_4_ + fVar228;
      auVar74._4_4_ = fStack_35c;
      auVar74._0_4_ = local_360;
      auVar74._8_4_ = fStack_358;
      auVar74._12_4_ = fStack_354;
      auVar74._16_4_ = fStack_350;
      auVar74._20_4_ = fStack_34c;
      auVar74._24_4_ = fStack_348;
      auVar74._28_4_ = uStack_344;
      auVar105 = vminps_avx(auVar74,auVar366);
      auVar105 = vmaxps_avx(auVar105,ZEXT832(0) << 0x20);
      local_1c0[0] = fVar151 + fVar122 * (auVar105._0_4_ + (float)DAT_01f7b060) * 0.125;
      local_1c0[1] = fVar170 + fVar144 * (auVar105._4_4_ + DAT_01f7b060._4_4_) * 0.125;
      local_1c0[2] = fVar171 + fVar146 * (auVar105._8_4_ + DAT_01f7b060._8_4_) * 0.125;
      local_1c0[3] = fVar172 + fVar149 * (auVar105._12_4_ + DAT_01f7b060._12_4_) * 0.125;
      fStack_1b0 = fVar151 + fVar122 * (auVar105._16_4_ + DAT_01f7b060._16_4_) * 0.125;
      fStack_1ac = fVar170 + fVar144 * (auVar105._20_4_ + DAT_01f7b060._20_4_) * 0.125;
      fStack_1a8 = fVar171 + fVar146 * (auVar105._24_4_ + DAT_01f7b060._24_4_) * 0.125;
      fStack_1a4 = fVar172 + auVar105._28_4_ + fVar228;
      auVar54._4_4_ = auVar17._4_4_ * 0.99999976;
      auVar54._0_4_ = auVar17._0_4_ * 0.99999976;
      auVar54._8_4_ = auVar17._8_4_ * 0.99999976;
      auVar54._12_4_ = auVar17._12_4_ * 0.99999976;
      auVar54._16_4_ = auVar17._16_4_ * 0.99999976;
      auVar54._20_4_ = auVar17._20_4_ * 0.99999976;
      auVar54._24_4_ = auVar17._24_4_ * 0.99999976;
      auVar54._28_4_ = 0x3f7ffffc;
      auVar105 = vmaxps_avx(ZEXT832(0) << 0x20,auVar54);
      auVar55._4_4_ = auVar105._4_4_ * auVar105._4_4_;
      auVar55._0_4_ = auVar105._0_4_ * auVar105._0_4_;
      auVar55._8_4_ = auVar105._8_4_ * auVar105._8_4_;
      auVar55._12_4_ = auVar105._12_4_ * auVar105._12_4_;
      auVar55._16_4_ = auVar105._16_4_ * auVar105._16_4_;
      auVar55._20_4_ = auVar105._20_4_ * auVar105._20_4_;
      auVar55._24_4_ = auVar105._24_4_ * auVar105._24_4_;
      auVar55._28_4_ = auVar105._28_4_;
      local_960 = vsubps_avx(auVar21,auVar55);
      auVar56._4_4_ = local_960._4_4_ * fVar319 * 4.0;
      auVar56._0_4_ = local_960._0_4_ * fVar210 * 4.0;
      auVar56._8_4_ = local_960._8_4_ * fVar320 * 4.0;
      auVar56._12_4_ = local_960._12_4_ * fVar351 * 4.0;
      auVar56._16_4_ = local_960._16_4_ * fVar116 * 4.0;
      auVar56._20_4_ = local_960._20_4_ * fVar118 * 4.0;
      auVar56._24_4_ = local_960._24_4_ * fVar120 * 4.0;
      auVar56._28_4_ = auVar105._28_4_;
      auVar13 = vsubps_avx(auVar37,auVar56);
      local_a20 = vcmpps_avx(auVar13,ZEXT832(0) << 0x20,5);
      auVar105 = local_a20;
      if ((((((((local_a20 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (local_a20 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (local_a20 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(local_a20 >> 0x7f,0) == '\0') &&
            (local_a20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(local_a20 >> 0xbf,0) == '\0') &&
          (local_a20 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < local_a20[0x1f]) {
        auVar240 = ZEXT1664(ZEXT816(0) << 0x40);
        auVar216 = ZEXT828(0) << 0x20;
        auVar205 = SUB6428(ZEXT864(0),0) << 0x20;
        _local_ae0 = SUB3228(ZEXT832(0),0) << 0x20;
        auVar318 = ZEXT864(0) << 0x20;
        auVar281._8_4_ = 0x7f800000;
        auVar281._0_8_ = 0x7f8000007f800000;
        auVar281._12_4_ = 0x7f800000;
        auVar281._16_4_ = 0x7f800000;
        auVar281._20_4_ = 0x7f800000;
        auVar281._24_4_ = 0x7f800000;
        auVar281._28_4_ = 0x7f800000;
        auVar324._8_4_ = 0xff800000;
        auVar324._0_8_ = 0xff800000ff800000;
        auVar324._12_4_ = 0xff800000;
        auVar324._16_4_ = 0xff800000;
        auVar324._20_4_ = 0xff800000;
        auVar324._24_4_ = 0xff800000;
        auVar324._28_4_ = 0xff800000;
        local_a20 = auVar23;
        local_960 = auVar24;
      }
      else {
        auVar14 = vrcpps_avx(local_320);
        fVar210 = auVar14._0_4_;
        fVar193 = auVar14._4_4_;
        auVar57._4_4_ = local_320._4_4_ * fVar193;
        auVar57._0_4_ = local_320._0_4_ * fVar210;
        fVar289 = auVar14._8_4_;
        auVar57._8_4_ = local_320._8_4_ * fVar289;
        fVar295 = auVar14._12_4_;
        auVar57._12_4_ = local_320._12_4_ * fVar295;
        fVar244 = auVar14._16_4_;
        auVar57._16_4_ = local_320._16_4_ * fVar244;
        fVar245 = auVar14._20_4_;
        auVar57._20_4_ = local_320._20_4_ * fVar245;
        fVar248 = auVar14._24_4_;
        auVar57._24_4_ = local_320._24_4_ * fVar248;
        auVar57._28_4_ = auVar17._28_4_;
        auVar18 = vsubps_avx(auVar366,auVar57);
        auVar17 = vsqrtps_avx(auVar13);
        fVar210 = fVar210 + fVar210 * auVar18._0_4_;
        fVar193 = fVar193 + fVar193 * auVar18._4_4_;
        fVar289 = fVar289 + fVar289 * auVar18._8_4_;
        fVar295 = fVar295 + fVar295 * auVar18._12_4_;
        fVar244 = fVar244 + fVar244 * auVar18._16_4_;
        fVar245 = fVar245 + fVar245 * auVar18._20_4_;
        fVar248 = fVar248 + fVar248 * auVar18._24_4_;
        auVar365 = vsubps_avx(local_8c0,auVar17);
        fVar313 = auVar365._0_4_ * fVar210;
        fVar319 = auVar365._4_4_ * fVar193;
        auVar58._4_4_ = fVar319;
        auVar58._0_4_ = fVar313;
        fVar320 = auVar365._8_4_ * fVar289;
        auVar58._8_4_ = fVar320;
        fVar351 = auVar365._12_4_ * fVar295;
        auVar58._12_4_ = fVar351;
        fVar116 = auVar365._16_4_ * fVar244;
        auVar58._16_4_ = fVar116;
        fVar118 = auVar365._20_4_ * fVar245;
        auVar58._20_4_ = fVar118;
        fVar120 = auVar365._24_4_ * fVar248;
        auVar58._24_4_ = fVar120;
        auVar58._28_4_ = 0x7f800000;
        auVar365 = vsubps_avx(auVar17,local_3c0);
        fVar210 = auVar365._0_4_ * fVar210;
        fVar193 = auVar365._4_4_ * fVar193;
        auVar59._4_4_ = fVar193;
        auVar59._0_4_ = fVar210;
        fVar289 = auVar365._8_4_ * fVar289;
        auVar59._8_4_ = fVar289;
        fVar295 = auVar365._12_4_ * fVar295;
        auVar59._12_4_ = fVar295;
        fVar244 = auVar365._16_4_ * fVar244;
        auVar59._16_4_ = fVar244;
        fVar245 = auVar365._20_4_ * fVar245;
        auVar59._20_4_ = fVar245;
        fVar248 = auVar365._24_4_ * fVar248;
        auVar59._24_4_ = fVar248;
        auVar59._28_4_ = 0x3f800000;
        fVar250 = (fVar313 * local_560 + fVar123) * fVar229;
        fVar257 = (fVar319 * fStack_55c + fVar145) * fVar233;
        fVar259 = (fVar320 * fStack_558 + fVar147) * fVar230;
        fVar269 = (fVar351 * fStack_554 + fVar150) * fVar251;
        fVar270 = (fVar116 * fStack_550 + fStack_6f0) * fVar265;
        fVar301 = (fVar118 * fStack_54c + fStack_6ec) * fVar272;
        fVar305 = (fVar120 * fStack_548 + fStack_6e8) * fVar309;
        auVar206._0_4_ = local_880 + fVar192 * fVar250;
        auVar206._4_4_ = fStack_87c + fVar283 * fVar257;
        auVar206._8_4_ = fStack_878 + fVar242 * fVar259;
        auVar206._12_4_ = fStack_874 + fVar247 * fVar269;
        auVar206._16_4_ = fStack_870 + fVar256 * fVar270;
        auVar206._20_4_ = fStack_86c + fVar268 * fVar301;
        auVar206._24_4_ = fStack_868 + fVar296 * fVar305;
        auVar206._28_4_ = fStack_864 + auVar365._28_4_;
        auVar60._4_4_ = fStack_61c * fVar319;
        auVar60._0_4_ = local_620 * fVar313;
        auVar60._8_4_ = fStack_618 * fVar320;
        auVar60._12_4_ = fStack_614 * fVar351;
        auVar60._16_4_ = fStack_610 * fVar116;
        auVar60._20_4_ = fStack_60c * fVar118;
        auVar60._24_4_ = fStack_608 * fVar120;
        auVar60._28_4_ = auVar17._28_4_;
        local_8a0 = vsubps_avx(auVar60,auVar206);
        auVar221._0_4_ = fVar273 + fVar173 * fVar250;
        auVar221._4_4_ = fVar285 + fVar194 * fVar257;
        auVar221._8_4_ = fVar291 + fVar334 * fVar259;
        auVar221._12_4_ = fVar297 + fVar231 * fVar269;
        auVar221._16_4_ = fVar302 + fVar253 * fVar270;
        auVar221._20_4_ = fVar306 + fVar266 * fVar301;
        auVar221._24_4_ = fVar310 + fVar284 * fVar305;
        auVar221._28_4_ = fVar314 + auVar17._28_4_;
        auVar75._4_4_ = fStack_77c * fVar319;
        auVar75._0_4_ = local_780 * fVar313;
        auVar75._8_4_ = fStack_778 * fVar320;
        auVar75._12_4_ = fStack_774 * fVar351;
        auVar75._16_4_ = fStack_770 * fVar116;
        auVar75._20_4_ = fStack_76c * fVar118;
        auVar75._24_4_ = fStack_768 * fVar120;
        auVar75._28_4_ = fVar228;
        auVar17 = vsubps_avx(auVar75,auVar221);
        _local_ae0 = auVar17._0_28_;
        auVar189._0_4_ = fVar274 + fVar227 * fVar250;
        auVar189._4_4_ = fVar286 + fVar271 * fVar257;
        auVar189._8_4_ = fVar292 + fVar241 * fVar259;
        auVar189._12_4_ = fVar298 + fVar232 * fVar269;
        auVar189._16_4_ = fStack_850 + fVar254 * fVar270;
        auVar189._20_4_ = fStack_84c + fVar267 * fVar301;
        auVar189._24_4_ = fStack_848 + fVar290 * fVar305;
        auVar189._28_4_ = fStack_844 + auVar14._28_4_ + auVar18._28_4_ + fStack_6e4;
        auVar61._4_4_ = fStack_79c * fVar319;
        auVar61._0_4_ = local_7a0 * fVar313;
        auVar61._8_4_ = fStack_798 * fVar320;
        auVar61._12_4_ = fStack_794 * fVar351;
        auVar61._16_4_ = fStack_790 * fVar116;
        auVar61._20_4_ = fStack_78c * fVar118;
        auVar61._24_4_ = fStack_788 * fVar120;
        auVar61._28_4_ = auVar221._28_4_;
        auVar17 = vsubps_avx(auVar61,auVar189);
        auVar318 = ZEXT3264(auVar17);
        fVar229 = (fVar210 * local_560 + fVar123) * fVar229;
        fVar233 = (fVar193 * fStack_55c + fVar145) * fVar233;
        fVar230 = (fVar289 * fStack_558 + fVar147) * fVar230;
        fVar251 = (fVar295 * fStack_554 + fVar150) * fVar251;
        fVar265 = (fVar244 * fStack_550 + fStack_6f0) * fVar265;
        fVar272 = (fVar245 * fStack_54c + fStack_6ec) * fVar272;
        fVar309 = (fVar248 * fStack_548 + fStack_6e8) * fVar309;
        auVar190._0_4_ = local_880 + fVar192 * fVar229;
        auVar190._4_4_ = fStack_87c + fVar283 * fVar233;
        auVar190._8_4_ = fStack_878 + fVar242 * fVar230;
        auVar190._12_4_ = fStack_874 + fVar247 * fVar251;
        auVar190._16_4_ = fStack_870 + fVar256 * fVar265;
        auVar190._20_4_ = fStack_86c + fVar268 * fVar272;
        auVar190._24_4_ = fStack_868 + fVar296 * fVar309;
        auVar190._28_4_ = fStack_864 + auVar189._28_4_ + fStack_6e4;
        auVar62._4_4_ = fVar193 * fStack_61c;
        auVar62._0_4_ = fVar210 * local_620;
        auVar62._8_4_ = fVar289 * fStack_618;
        auVar62._12_4_ = fVar295 * fStack_614;
        auVar62._16_4_ = fVar244 * fStack_610;
        auVar62._20_4_ = fVar245 * fStack_60c;
        auVar62._24_4_ = fVar248 * fStack_608;
        auVar62._28_4_ = fStack_604;
        auVar17 = vsubps_avx(auVar62,auVar190);
        auVar264 = ZEXT3264(auVar17);
        auVar239._0_4_ = fVar273 + fVar173 * fVar229;
        auVar239._4_4_ = fVar285 + fVar194 * fVar233;
        auVar239._8_4_ = fVar291 + fVar334 * fVar230;
        auVar239._12_4_ = fVar297 + fVar231 * fVar251;
        auVar239._16_4_ = fVar302 + fVar253 * fVar265;
        auVar239._20_4_ = fVar306 + fVar266 * fVar272;
        auVar239._24_4_ = fVar310 + fVar284 * fVar309;
        auVar239._28_4_ = fVar314 + fStack_604;
        auVar63._4_4_ = fStack_77c * fVar193;
        auVar63._0_4_ = local_780 * fVar210;
        auVar63._8_4_ = fStack_778 * fVar289;
        auVar63._12_4_ = fStack_774 * fVar295;
        auVar63._16_4_ = fStack_770 * fVar244;
        auVar63._20_4_ = fStack_76c * fVar245;
        auVar63._24_4_ = fStack_768 * fVar248;
        auVar63._28_4_ = fStack_764;
        auVar17 = vsubps_avx(auVar63,auVar239);
        auVar240 = ZEXT3264(auVar17);
        auVar222._0_4_ = fVar274 + fVar227 * fVar229;
        auVar222._4_4_ = fVar286 + fVar271 * fVar233;
        auVar222._8_4_ = fVar292 + fVar241 * fVar230;
        auVar222._12_4_ = fVar298 + fVar232 * fVar251;
        auVar222._16_4_ = fStack_850 + fVar254 * fVar265;
        auVar222._20_4_ = fStack_84c + fVar267 * fVar272;
        auVar222._24_4_ = fStack_848 + fVar290 * fVar309;
        auVar222._28_4_ = fStack_844 + auVar221._28_4_;
        auVar64._4_4_ = fStack_79c * fVar193;
        auVar64._0_4_ = local_7a0 * fVar210;
        auVar64._8_4_ = fStack_798 * fVar289;
        auVar64._12_4_ = fStack_794 * fVar295;
        auVar64._16_4_ = fStack_790 * fVar244;
        auVar64._20_4_ = fStack_78c * fVar245;
        auVar64._24_4_ = fStack_788 * fVar248;
        auVar64._28_4_ = fStack_764;
        auVar17 = vsubps_avx(auVar64,auVar222);
        auVar216 = auVar17._0_28_;
        auVar17 = vcmpps_avx(auVar13,_DAT_01f7b000,5);
        auVar282._8_4_ = 0x7f800000;
        auVar282._0_8_ = 0x7f8000007f800000;
        auVar282._12_4_ = 0x7f800000;
        auVar282._16_4_ = 0x7f800000;
        auVar282._20_4_ = 0x7f800000;
        auVar282._24_4_ = 0x7f800000;
        auVar282._28_4_ = 0x7f800000;
        auVar281 = vblendvps_avx(auVar282,auVar58,auVar17);
        auVar13 = vmaxps_avx(local_520,local_3a0);
        auVar65._4_4_ = auVar13._4_4_ * 1.9073486e-06;
        auVar65._0_4_ = auVar13._0_4_ * 1.9073486e-06;
        auVar65._8_4_ = auVar13._8_4_ * 1.9073486e-06;
        auVar65._12_4_ = auVar13._12_4_ * 1.9073486e-06;
        auVar65._16_4_ = auVar13._16_4_ * 1.9073486e-06;
        auVar65._20_4_ = auVar13._20_4_ * 1.9073486e-06;
        auVar65._24_4_ = auVar13._24_4_ * 1.9073486e-06;
        auVar65._28_4_ = auVar13._28_4_;
        auVar13 = vcmpps_avx(_local_a80,auVar65,1);
        auVar325._8_4_ = 0xff800000;
        auVar325._0_8_ = 0xff800000ff800000;
        auVar325._12_4_ = 0xff800000;
        auVar325._16_4_ = 0xff800000;
        auVar325._20_4_ = 0xff800000;
        auVar325._24_4_ = 0xff800000;
        auVar325._28_4_ = 0xff800000;
        auVar324 = vblendvps_avx(auVar325,auVar59,auVar17);
        auVar14 = auVar17 & auVar13;
        if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar14 >> 0x7f,0) != '\0') ||
              (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar14 >> 0xbf,0) != '\0') ||
            (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar14[0x1f] < '\0') {
          auVar105 = vandps_avx(auVar13,auVar17);
          auVar179 = vpackssdw_avx(auVar105._0_16_,auVar105._16_16_);
          auVar14 = vcmpps_avx(local_960,ZEXT832(0) << 0x20,2);
          auVar143._8_4_ = 0xff800000;
          auVar143._0_8_ = 0xff800000ff800000;
          auVar143._12_4_ = 0xff800000;
          auVar143._16_4_ = 0xff800000;
          auVar143._20_4_ = 0xff800000;
          auVar143._24_4_ = 0xff800000;
          auVar143._28_4_ = 0xff800000;
          auVar191._8_4_ = 0x7f800000;
          auVar191._0_8_ = 0x7f8000007f800000;
          auVar191._12_4_ = 0x7f800000;
          auVar191._16_4_ = 0x7f800000;
          auVar191._20_4_ = 0x7f800000;
          auVar191._24_4_ = 0x7f800000;
          auVar191._28_4_ = 0x7f800000;
          auVar13 = vblendvps_avx(auVar191,auVar143,auVar14);
          auVar10 = vpmovsxwd_avx(auVar179);
          auVar179 = vpunpckhwd_avx(auVar179,auVar179);
          auVar367._16_16_ = auVar179;
          auVar367._0_16_ = auVar10;
          auVar281 = vblendvps_avx(auVar281,auVar13,auVar367);
          auVar13 = vblendvps_avx(auVar143,auVar191,auVar14);
          auVar324 = vblendvps_avx(auVar324,auVar13,auVar367);
          auVar169._0_8_ = auVar105._0_8_ ^ 0xffffffffffffffff;
          auVar169._8_4_ = auVar105._8_4_ ^ 0xffffffff;
          auVar169._12_4_ = auVar105._12_4_ ^ 0xffffffff;
          auVar169._16_4_ = auVar105._16_4_ ^ 0xffffffff;
          auVar169._20_4_ = auVar105._20_4_ ^ 0xffffffff;
          auVar169._24_4_ = auVar105._24_4_ ^ 0xffffffff;
          auVar169._28_4_ = auVar105._28_4_ ^ 0xffffffff;
          auVar105 = vorps_avx(auVar14,auVar169);
          auVar105 = vandps_avx(auVar17,auVar105);
        }
        auVar205 = local_8a0._0_28_;
      }
      fVar210 = (ray->dir).field_0.m128[0];
      auVar356 = ZEXT3264(CONCAT428(fVar210,CONCAT424(fVar210,CONCAT420(fVar210,CONCAT416(fVar210,
                                                  CONCAT412(fVar210,CONCAT48(fVar210,CONCAT44(
                                                  fVar210,fVar210))))))));
      fVar173 = (ray->dir).field_0.m128[1];
      fVar227 = (ray->dir).field_0.m128[2];
      auVar338 = ZEXT3264(CONCAT428(fVar227,CONCAT424(fVar227,CONCAT420(fVar227,CONCAT416(fVar227,
                                                  CONCAT412(fVar227,CONCAT48(fVar227,CONCAT44(
                                                  fVar227,fVar227))))))));
      local_5a0 = local_800;
      local_580 = vminps_avx(local_5c0,auVar281);
      local_7c0 = vmaxps_avx(local_800,auVar324);
      auVar327 = ZEXT3264(local_7c0);
      _local_5e0 = local_7c0;
      auVar17 = vcmpps_avx(local_800,local_580,2);
      local_6e0 = vandps_avx(auVar17,auVar104);
      auVar17 = vcmpps_avx(local_7c0,local_5c0,2);
      _local_980 = vandps_avx(auVar17,auVar104);
      auVar226 = ZEXT3264(_local_980);
      auVar17 = vorps_avx(local_6e0,_local_980);
      if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar17 >> 0x7f,0) != '\0') ||
            (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0xbf,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar17[0x1f] < '\0') {
        fVar192 = auVar104._28_4_;
        auVar109._0_4_ =
             fVar210 * auVar264._0_4_ + fVar173 * auVar240._0_4_ + fVar227 * auVar216._0_4_;
        auVar109._4_4_ =
             fVar210 * auVar264._4_4_ + fVar173 * auVar240._4_4_ + fVar227 * auVar216._4_4_;
        auVar109._8_4_ =
             fVar210 * auVar264._8_4_ + fVar173 * auVar240._8_4_ + fVar227 * auVar216._8_4_;
        auVar109._12_4_ =
             fVar210 * auVar264._12_4_ + fVar173 * auVar240._12_4_ + fVar227 * auVar216._12_4_;
        auVar109._16_4_ =
             fVar210 * auVar264._16_4_ + fVar173 * auVar240._16_4_ + fVar227 * auVar216._16_4_;
        auVar109._20_4_ =
             fVar210 * auVar264._20_4_ + fVar173 * auVar240._20_4_ + fVar227 * auVar216._20_4_;
        auVar109._24_4_ =
             fVar210 * auVar264._24_4_ + fVar173 * auVar240._24_4_ + fVar227 * auVar216._24_4_;
        auVar109._28_4_ = fVar192 + fVar192 + auVar17._28_4_;
        auVar163._0_8_ = auVar105._0_8_ ^ 0xffffffffffffffff;
        auVar163._8_4_ = auVar105._8_4_ ^ 0xffffffff;
        auVar163._12_4_ = auVar105._12_4_ ^ 0xffffffff;
        auVar163._16_4_ = auVar105._16_4_ ^ 0xffffffff;
        auVar163._20_4_ = auVar105._20_4_ ^ 0xffffffff;
        auVar163._24_4_ = auVar105._24_4_ ^ 0xffffffff;
        auVar163._28_4_ = auVar105._28_4_ ^ 0xffffffff;
        auVar207._8_4_ = 0x7fffffff;
        auVar207._0_8_ = 0x7fffffff7fffffff;
        auVar207._12_4_ = 0x7fffffff;
        auVar207._16_4_ = 0x7fffffff;
        auVar207._20_4_ = 0x7fffffff;
        auVar207._24_4_ = 0x7fffffff;
        auVar207._28_4_ = 0x7fffffff;
        auVar104 = vandps_avx(auVar109,auVar207);
        auVar223._8_4_ = 0x3e99999a;
        auVar223._0_8_ = 0x3e99999a3e99999a;
        auVar223._12_4_ = 0x3e99999a;
        auVar223._16_4_ = 0x3e99999a;
        auVar223._20_4_ = 0x3e99999a;
        auVar223._24_4_ = 0x3e99999a;
        auVar223._28_4_ = 0x3e99999a;
        auVar104 = vcmpps_avx(auVar104,auVar223,1);
        local_660 = vorps_avx(auVar104,auVar163);
        auVar110._0_4_ =
             fVar210 * auVar205._0_4_ + fVar173 * (float)local_ae0._0_4_ + auVar318._0_4_ * fVar227;
        auVar110._4_4_ =
             fVar210 * auVar205._4_4_ + fVar173 * (float)local_ae0._4_4_ + auVar318._4_4_ * fVar227;
        auVar110._8_4_ = fVar210 * auVar205._8_4_ + fVar173 * fStack_ad8 + auVar318._8_4_ * fVar227;
        auVar110._12_4_ =
             fVar210 * auVar205._12_4_ + fVar173 * fStack_ad4 + auVar318._12_4_ * fVar227;
        auVar110._16_4_ =
             fVar210 * auVar205._16_4_ + fVar173 * fStack_ad0 + auVar318._16_4_ * fVar227;
        auVar110._20_4_ =
             fVar210 * auVar205._20_4_ + fVar173 * fStack_acc + auVar318._20_4_ * fVar227;
        auVar110._24_4_ =
             fVar210 * auVar205._24_4_ + fVar173 * fStack_ac8 + auVar318._24_4_ * fVar227;
        auVar110._28_4_ = fVar192 + auVar240._28_4_ + local_660._28_4_;
        auVar104 = vandps_avx(auVar110,auVar207);
        auVar104 = vcmpps_avx(auVar104,auVar223,1);
        auVar104 = vorps_avx(auVar104,auVar163);
        auVar137._8_4_ = 3;
        auVar137._0_8_ = 0x300000003;
        auVar137._12_4_ = 3;
        auVar137._16_4_ = 3;
        auVar137._20_4_ = 3;
        auVar137._24_4_ = 3;
        auVar137._28_4_ = 3;
        auVar164._8_4_ = 2;
        auVar164._0_8_ = 0x200000002;
        auVar164._12_4_ = 2;
        auVar164._16_4_ = 2;
        auVar164._20_4_ = 2;
        auVar164._24_4_ = 2;
        auVar164._28_4_ = 2;
        auVar104 = vblendvps_avx(auVar164,auVar137,auVar104);
        local_680 = ZEXT432(local_b54);
        local_700 = vpshufd_avx(ZEXT416(local_b54),0);
        auVar179 = vpcmpgtd_avx(auVar104._16_16_,local_700);
        auVar10 = vpcmpgtd_avx(auVar104._0_16_,local_700);
        auVar138._16_16_ = auVar179;
        auVar138._0_16_ = auVar10;
        local_640 = vblendps_avx(ZEXT1632(auVar10),auVar138,0xf0);
        auVar104 = vandnps_avx(local_640,local_6e0);
        local_7e0._4_4_ = local_800._4_4_ + (float)local_6c0._4_4_;
        local_7e0._0_4_ = local_800._0_4_ + (float)local_6c0._0_4_;
        fStack_7d8 = local_800._8_4_ + fStack_6b8;
        fStack_7d4 = local_800._12_4_ + fStack_6b4;
        fStack_7d0 = local_800._16_4_ + fStack_6b0;
        fStack_7cc = local_800._20_4_ + fStack_6ac;
        fStack_7c8 = local_800._24_4_ + fStack_6a8;
        fStack_7c4 = local_800._28_4_ + fStack_6a4;
        while( true ) {
          local_3e0 = auVar104;
          if ((((((((auVar104 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                   (auVar104 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                  (auVar104 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                 SUB321(auVar104 >> 0x7f,0) == '\0') &&
                (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
               SUB321(auVar104 >> 0xbf,0) == '\0') &&
              (auVar104 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
              -1 < auVar104[0x1f]) break;
          auVar139._8_4_ = 0x7f800000;
          auVar139._0_8_ = 0x7f8000007f800000;
          auVar139._12_4_ = 0x7f800000;
          auVar139._16_4_ = 0x7f800000;
          auVar139._20_4_ = 0x7f800000;
          auVar139._24_4_ = 0x7f800000;
          auVar139._28_4_ = 0x7f800000;
          auVar105 = vblendvps_avx(auVar139,local_800,auVar104);
          auVar17 = vshufps_avx(auVar105,auVar105,0xb1);
          auVar17 = vminps_avx(auVar105,auVar17);
          auVar13 = vshufpd_avx(auVar17,auVar17,5);
          auVar17 = vminps_avx(auVar17,auVar13);
          auVar13 = vperm2f128_avx(auVar17,auVar17,1);
          auVar17 = vminps_avx(auVar17,auVar13);
          auVar105 = vcmpps_avx(auVar105,auVar17,0);
          auVar17 = auVar104 & auVar105;
          if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar17 >> 0x7f,0) != '\0') ||
                (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar17 >> 0xbf,0) != '\0') ||
              (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar17[0x1f] < '\0') {
            auVar104 = vandps_avx(auVar105,auVar104);
          }
          uVar77 = vmovmskps_avx(auVar104);
          uVar85 = 0;
          if (uVar77 != 0) {
            for (; (uVar77 >> uVar85 & 1) == 0; uVar85 = uVar85 + 1) {
            }
          }
          uVar79 = (ulong)uVar85;
          *(undefined4 *)(local_3e0 + uVar79 * 4) = 0;
          aVar2 = (ray->dir).field_0.field_1;
          local_860 = aVar2.x;
          fStack_85c = aVar2.y;
          fStack_858 = aVar2.z;
          aStack_854 = aVar2.field_3;
          auVar179 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
          fVar210 = local_1a0[uVar79];
          uVar85 = *(uint *)(local_5a0 + uVar79 * 4);
          if (auVar179._0_4_ < 0.0) {
            auVar338 = ZEXT1664(auVar338._0_16_);
            auVar356 = ZEXT1664(auVar356._0_16_);
            fVar173 = sqrtf(auVar179._0_4_);
            uVar79 = extraout_RAX;
          }
          else {
            auVar179 = vsqrtss_avx(auVar179,auVar179);
            fVar173 = auVar179._0_4_;
          }
          auVar264 = ZEXT464(uVar85);
          auVar10 = vminps_avx(_local_9c0,_local_9e0);
          auVar179 = vmaxps_avx(_local_9c0,_local_9e0);
          auVar11 = vminps_avx(_local_9d0,_local_9f0);
          auVar93 = vminps_avx(auVar10,auVar11);
          auVar10 = vmaxps_avx(_local_9d0,_local_9f0);
          auVar11 = vmaxps_avx(auVar179,auVar10);
          auVar176._8_4_ = 0x7fffffff;
          auVar176._0_8_ = 0x7fffffff7fffffff;
          auVar176._12_4_ = 0x7fffffff;
          auVar179 = vandps_avx(auVar93,auVar176);
          auVar10 = vandps_avx(auVar11,auVar176);
          auVar179 = vmaxps_avx(auVar179,auVar10);
          auVar10 = vmovshdup_avx(auVar179);
          auVar10 = vmaxss_avx(auVar10,auVar179);
          auVar179 = vshufpd_avx(auVar179,auVar179,1);
          auVar179 = vmaxss_avx(auVar179,auVar10);
          local_880 = auVar179._0_4_ * 1.9073486e-06;
          local_960._0_4_ = fVar173 * 1.9073486e-06;
          local_760._0_16_ = vshufps_avx(auVar11,auVar11,0xff);
          auVar179 = vinsertps_avx(ZEXT416(uVar85),ZEXT416((uint)fVar210),0x10);
          auVar318 = ZEXT1664(auVar179);
          uVar84 = 0;
          while( true ) {
            auVar179 = auVar318._0_16_;
            bVar76 = (byte)uVar79;
            if (uVar84 == 5) break;
            auVar11 = vmovshdup_avx(auVar179);
            fVar210 = auVar11._0_4_;
            fVar229 = 1.0 - fVar210;
            fVar173 = fVar229 * fVar229;
            fVar227 = fVar229 * fVar173;
            fVar192 = fVar210 * fVar210;
            fVar228 = fVar210 * fVar192;
            fVar193 = fVar210 * fVar229;
            auVar10 = vshufps_avx(ZEXT416((uint)(fVar228 * 0.16666667)),
                                  ZEXT416((uint)(fVar228 * 0.16666667)),0);
            auVar93 = ZEXT416((uint)((fVar228 * 4.0 + fVar227 +
                                     fVar210 * fVar193 * 12.0 + fVar229 * fVar193 * 6.0) *
                                    0.16666667));
            auVar93 = vshufps_avx(auVar93,auVar93,0);
            auVar100 = ZEXT416((uint)((fVar227 * 4.0 + fVar228 +
                                      fVar229 * fVar193 * 12.0 + fVar210 * fVar193 * 6.0) *
                                     0.16666667));
            auVar100 = vshufps_avx(auVar100,auVar100,0);
            auVar92 = vshufps_avx(auVar179,auVar179,0);
            auVar155._0_4_ = auVar92._0_4_ * local_860 + 0.0;
            auVar155._4_4_ = auVar92._4_4_ * fStack_85c + 0.0;
            auVar155._8_4_ = auVar92._8_4_ * fStack_858 + 0.0;
            auVar155._12_4_ = auVar92._12_4_ * aStack_854.w + 0.0;
            auVar92 = vshufps_avx(ZEXT416((uint)(fVar227 * 0.16666667)),
                                  ZEXT416((uint)(fVar227 * 0.16666667)),0);
            auVar91._0_4_ =
                 auVar92._0_4_ * (float)local_9c0._0_4_ +
                 auVar100._0_4_ * (float)local_9e0._0_4_ +
                 auVar10._0_4_ * (float)local_9f0._0_4_ + auVar93._0_4_ * (float)local_9d0._0_4_;
            auVar91._4_4_ =
                 auVar92._4_4_ * (float)local_9c0._4_4_ +
                 auVar100._4_4_ * (float)local_9e0._4_4_ +
                 auVar10._4_4_ * (float)local_9f0._4_4_ + auVar93._4_4_ * (float)local_9d0._4_4_;
            auVar91._8_4_ =
                 auVar92._8_4_ * fStack_9b8 +
                 auVar100._8_4_ * fStack_9d8 +
                 auVar10._8_4_ * fStack_9e8 + auVar93._8_4_ * fStack_9c8;
            auVar91._12_4_ =
                 auVar92._12_4_ * fStack_9b4 +
                 auVar100._12_4_ * fStack_9d4 +
                 auVar10._12_4_ * fStack_9e4 + auVar93._12_4_ * fStack_9c4;
            local_8a0._0_16_ = auVar91;
            auVar10 = vsubps_avx(auVar155,auVar91);
            _local_a80 = auVar10;
            auVar10 = vdpps_avx(auVar10,auVar10,0x7f);
            fVar227 = auVar10._0_4_;
            if (fVar227 < 0.0) {
              local_a20._0_16_ = auVar11;
              local_a40._0_4_ = fVar192;
              local_a60._0_4_ = fVar173;
              local_8e0._0_4_ = fVar193;
              fVar228 = sqrtf(fVar227);
              uVar79 = extraout_RAX_00;
              fVar192 = (float)local_a40._0_4_;
              fVar193 = (float)local_8e0._0_4_;
              fVar173 = (float)local_a60._0_4_;
              fVar210 = (float)local_a20._0_4_;
            }
            else {
              auVar11 = vsqrtss_avx(auVar10,auVar10);
              fVar228 = auVar11._0_4_;
            }
            auVar11 = vshufps_avx(ZEXT416((uint)(fVar192 * 0.5)),ZEXT416((uint)(fVar192 * 0.5)),0);
            auVar93 = ZEXT416((uint)((fVar173 + fVar193 * 4.0) * 0.5));
            auVar93 = vshufps_avx(auVar93,auVar93,0);
            auVar100 = ZEXT416((uint)((fVar210 * -fVar210 - fVar193 * 4.0) * 0.5));
            auVar100 = vshufps_avx(auVar100,auVar100,0);
            auVar92 = ZEXT416((uint)(fVar229 * -fVar229 * 0.5));
            auVar92 = vshufps_avx(auVar92,auVar92,0);
            auVar277._0_4_ =
                 (float)local_9c0._0_4_ * auVar92._0_4_ +
                 (float)local_9e0._0_4_ * auVar100._0_4_ +
                 (float)local_9f0._0_4_ * auVar11._0_4_ + (float)local_9d0._0_4_ * auVar93._0_4_;
            auVar277._4_4_ =
                 (float)local_9c0._4_4_ * auVar92._4_4_ +
                 (float)local_9e0._4_4_ * auVar100._4_4_ +
                 (float)local_9f0._4_4_ * auVar11._4_4_ + (float)local_9d0._4_4_ * auVar93._4_4_;
            auVar277._8_4_ =
                 fStack_9b8 * auVar92._8_4_ +
                 fStack_9d8 * auVar100._8_4_ +
                 fStack_9e8 * auVar11._8_4_ + fStack_9c8 * auVar93._8_4_;
            auVar277._12_4_ =
                 fStack_9b4 * auVar92._12_4_ +
                 fStack_9d4 * auVar100._12_4_ +
                 fStack_9e4 * auVar11._12_4_ + fStack_9c4 * auVar93._12_4_;
            auVar11 = vshufps_avx(auVar179,auVar179,0x55);
            auVar93 = ZEXT416((uint)(fVar229 - (fVar210 + fVar210)));
            auVar100 = vshufps_avx(auVar93,auVar93,0);
            auVar93 = ZEXT416((uint)(fVar210 - (fVar229 + fVar229)));
            auVar92 = vshufps_avx(auVar93,auVar93,0);
            auVar99 = vshufps_avx(ZEXT416((uint)fVar229),ZEXT416((uint)fVar229),0);
            auVar93 = vdpps_avx(auVar277,auVar277,0x7f);
            auVar127._0_4_ =
                 (float)local_9c0._0_4_ * auVar99._0_4_ +
                 (float)local_9e0._0_4_ * auVar92._0_4_ +
                 (float)local_9f0._0_4_ * auVar11._0_4_ + (float)local_9d0._0_4_ * auVar100._0_4_;
            auVar127._4_4_ =
                 (float)local_9c0._4_4_ * auVar99._4_4_ +
                 (float)local_9e0._4_4_ * auVar92._4_4_ +
                 (float)local_9f0._4_4_ * auVar11._4_4_ + (float)local_9d0._4_4_ * auVar100._4_4_;
            auVar127._8_4_ =
                 fStack_9b8 * auVar99._8_4_ +
                 fStack_9d8 * auVar92._8_4_ +
                 fStack_9e8 * auVar11._8_4_ + fStack_9c8 * auVar100._8_4_;
            auVar127._12_4_ =
                 fStack_9b4 * auVar99._12_4_ +
                 fStack_9d4 * auVar92._12_4_ +
                 fStack_9e4 * auVar11._12_4_ + fStack_9c4 * auVar100._12_4_;
            auVar11 = vblendps_avx(auVar93,_DAT_01f45a50,0xe);
            auVar100 = vrsqrtss_avx(auVar11,auVar11);
            fVar173 = auVar100._0_4_;
            fVar210 = auVar93._0_4_;
            auVar100 = vdpps_avx(auVar277,auVar127,0x7f);
            auVar92 = vshufps_avx(auVar93,auVar93,0);
            auVar128._0_4_ = auVar127._0_4_ * auVar92._0_4_;
            auVar128._4_4_ = auVar127._4_4_ * auVar92._4_4_;
            auVar128._8_4_ = auVar127._8_4_ * auVar92._8_4_;
            auVar128._12_4_ = auVar127._12_4_ * auVar92._12_4_;
            auVar100 = vshufps_avx(auVar100,auVar100,0);
            auVar197._0_4_ = auVar277._0_4_ * auVar100._0_4_;
            auVar197._4_4_ = auVar277._4_4_ * auVar100._4_4_;
            auVar197._8_4_ = auVar277._8_4_ * auVar100._8_4_;
            auVar197._12_4_ = auVar277._12_4_ * auVar100._12_4_;
            auVar99 = vsubps_avx(auVar128,auVar197);
            auVar100 = vrcpss_avx(auVar11,auVar11);
            auVar11 = vmaxss_avx(ZEXT416((uint)local_880),
                                 ZEXT416((uint)(auVar318._0_4_ * (float)local_960._0_4_)));
            auVar100 = ZEXT416((uint)(auVar100._0_4_ * (2.0 - fVar210 * auVar100._0_4_)));
            auVar100 = vshufps_avx(auVar100,auVar100,0);
            uVar66 = CONCAT44(auVar277._4_4_,auVar277._0_4_);
            auVar213._0_8_ = uVar66 ^ 0x8000000080000000;
            auVar213._8_4_ = -auVar277._8_4_;
            auVar213._12_4_ = -auVar277._12_4_;
            auVar92 = ZEXT416((uint)(fVar173 * 1.5 + fVar210 * -0.5 * fVar173 * fVar173 * fVar173));
            auVar92 = vshufps_avx(auVar92,auVar92,0);
            auVar177._0_4_ = auVar92._0_4_ * auVar99._0_4_ * auVar100._0_4_;
            auVar177._4_4_ = auVar92._4_4_ * auVar99._4_4_ * auVar100._4_4_;
            auVar177._8_4_ = auVar92._8_4_ * auVar99._8_4_ * auVar100._8_4_;
            auVar177._12_4_ = auVar92._12_4_ * auVar99._12_4_ * auVar100._12_4_;
            auVar238._0_4_ = auVar277._0_4_ * auVar92._0_4_;
            auVar238._4_4_ = auVar277._4_4_ * auVar92._4_4_;
            auVar238._8_4_ = auVar277._8_4_ * auVar92._8_4_;
            auVar238._12_4_ = auVar277._12_4_ * auVar92._12_4_;
            local_a20._0_4_ = auVar11._0_4_;
            if (fVar210 < 0.0) {
              local_a40._0_4_ = fVar228;
              local_a60._0_16_ = auVar213;
              local_8e0._0_16_ = auVar238;
              local_900._0_16_ = auVar177;
              fVar173 = sqrtf(fVar210);
              uVar79 = extraout_RAX_01;
              auVar177 = local_900._0_16_;
              auVar213 = local_a60._0_16_;
              auVar238 = local_8e0._0_16_;
              fVar228 = (float)local_a40._0_4_;
              fVar210 = (float)local_a20._0_4_;
            }
            else {
              auVar93 = vsqrtss_avx(auVar93,auVar93);
              fVar173 = auVar93._0_4_;
              fVar210 = auVar11._0_4_;
            }
            auVar11 = vdpps_avx(_local_a80,auVar238,0x7f);
            fVar173 = (local_880 / fVar173) * (fVar228 + 1.0) + fVar210 + fVar228 * local_880;
            auVar93 = vdpps_avx(auVar213,auVar238,0x7f);
            auVar100 = vdpps_avx(_local_a80,auVar177,0x7f);
            auVar70._4_4_ = fStack_85c;
            auVar70._0_4_ = local_860;
            auVar70._8_4_ = fStack_858;
            auVar70._12_4_ = aStack_854.a;
            auVar92 = vdpps_avx(auVar70,auVar238,0x7f);
            auVar99 = vdpps_avx(_local_a80,auVar213,0x7f);
            fVar192 = auVar93._0_4_ + auVar100._0_4_;
            fVar228 = auVar11._0_4_;
            auVar94._0_4_ = fVar228 * fVar228;
            auVar94._4_4_ = auVar11._4_4_ * auVar11._4_4_;
            auVar94._8_4_ = auVar11._8_4_ * auVar11._8_4_;
            auVar94._12_4_ = auVar11._12_4_ * auVar11._12_4_;
            auVar100 = vsubps_avx(auVar10,auVar94);
            auVar93 = vdpps_avx(_local_a80,auVar70,0x7f);
            fVar193 = auVar99._0_4_ - fVar228 * fVar192;
            fVar229 = auVar93._0_4_ - fVar228 * auVar92._0_4_;
            auVar93 = vrsqrtss_avx(auVar100,auVar100);
            fVar194 = auVar100._0_4_;
            fVar228 = auVar93._0_4_;
            fVar228 = fVar228 * 1.5 + fVar194 * -0.5 * fVar228 * fVar228 * fVar228;
            if (fVar194 < 0.0) {
              local_a40._0_16_ = auVar11;
              local_a60._0_4_ = fVar173;
              local_8e0._0_16_ = auVar92;
              local_900._0_16_ = ZEXT416((uint)fVar192);
              local_720._0_4_ = fVar193;
              local_8c0._0_4_ = fVar229;
              local_740._0_4_ = fVar228;
              fVar194 = sqrtf(fVar194);
              uVar79 = extraout_RAX_02;
              fVar228 = (float)local_740._0_4_;
              fVar193 = (float)local_720._0_4_;
              fVar229 = (float)local_8c0._0_4_;
              auVar92 = local_8e0._0_16_;
              fVar173 = (float)local_a60._0_4_;
              auVar11 = local_a40._0_16_;
              fVar210 = (float)local_a20._0_4_;
              auVar93 = local_900._0_16_;
            }
            else {
              auVar93 = vsqrtss_avx(auVar100,auVar100);
              fVar194 = auVar93._0_4_;
              auVar93 = ZEXT416((uint)fVar192);
            }
            auVar356 = ZEXT1664(auVar11);
            auVar338 = ZEXT464((uint)fVar173);
            auVar264 = ZEXT1664(auVar10);
            auVar99 = vpermilps_avx(local_8a0._0_16_,0xff);
            auVar131 = vshufps_avx(auVar277,auVar277,0xff);
            fVar192 = fVar193 * fVar228 - auVar131._0_4_;
            auVar198._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
            auVar198._8_4_ = auVar92._8_4_ ^ 0x80000000;
            auVar198._12_4_ = auVar92._12_4_ ^ 0x80000000;
            auVar214._0_4_ = -fVar192;
            auVar214._4_4_ = 0x80000000;
            auVar214._8_4_ = 0x80000000;
            auVar214._12_4_ = 0x80000000;
            auVar100 = vinsertps_avx(auVar214,ZEXT416((uint)(fVar229 * fVar228)),0x1c);
            auVar92 = vmovsldup_avx(ZEXT416((uint)(auVar93._0_4_ * fVar229 * fVar228 -
                                                  auVar92._0_4_ * fVar192)));
            auVar100 = vdivps_avx(auVar100,auVar92);
            auVar93 = vinsertps_avx(auVar93,auVar198,0x10);
            auVar93 = vdivps_avx(auVar93,auVar92);
            auVar92 = vmovsldup_avx(auVar11);
            auVar88 = ZEXT416((uint)(fVar194 - auVar99._0_4_));
            auVar99 = vmovsldup_avx(auVar88);
            auVar156._0_4_ = auVar92._0_4_ * auVar100._0_4_ + auVar99._0_4_ * auVar93._0_4_;
            auVar156._4_4_ = auVar92._4_4_ * auVar100._4_4_ + auVar99._4_4_ * auVar93._4_4_;
            auVar156._8_4_ = auVar92._8_4_ * auVar100._8_4_ + auVar99._8_4_ * auVar93._8_4_;
            auVar156._12_4_ = auVar92._12_4_ * auVar100._12_4_ + auVar99._12_4_ * auVar93._12_4_;
            auVar93 = vsubps_avx(auVar179,auVar156);
            auVar318 = ZEXT1664(auVar93);
            auVar157._8_4_ = 0x7fffffff;
            auVar157._0_8_ = 0x7fffffff7fffffff;
            auVar157._12_4_ = 0x7fffffff;
            auVar179 = vandps_avx(auVar11,auVar157);
            if (auVar179._0_4_ < fVar173) {
              auVar178._8_4_ = 0x7fffffff;
              auVar178._0_8_ = 0x7fffffff7fffffff;
              auVar178._12_4_ = 0x7fffffff;
              auVar179 = vandps_avx(auVar88,auVar178);
              if (auVar179._0_4_ < (float)local_760._0_4_ * 1.9073486e-06 + fVar210 + fVar173) {
                bVar86 = uVar84 < 5;
                fVar210 = auVar93._0_4_ + (float)local_830._0_4_;
                bVar76 = 0;
                if (fVar210 < (ray->org).field_0.m128[3]) goto LAB_007aca47;
                fVar192 = ray->tfar;
                auVar226 = ZEXT3264(_local_980);
                if (fVar192 < fVar210) goto LAB_007aca50;
                auVar179 = vmovshdup_avx(auVar93);
                bVar76 = 0;
                fVar228 = auVar179._0_4_;
                if (fVar228 < 0.0) goto LAB_007aca50;
                if (fVar228 <= 1.0) {
                  auVar179 = vrsqrtss_avx(auVar10,auVar10);
                  fVar193 = auVar179._0_4_;
                  pGVar6 = (context->scene->geometries).items[uVar80].ptr;
                  if ((pGVar6->mask & ray->mask) == 0) {
                    bVar76 = 0;
                  }
                  else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                          (bVar76 = 1, pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                    auVar179 = ZEXT416((uint)(fVar193 * 1.5 +
                                             fVar227 * -0.5 * fVar193 * fVar193 * fVar193));
                    auVar179 = vshufps_avx(auVar179,auVar179,0);
                    auVar180._0_4_ = auVar179._0_4_ * (float)local_a80._0_4_;
                    auVar180._4_4_ = auVar179._4_4_ * (float)local_a80._4_4_;
                    auVar180._8_4_ = auVar179._8_4_ * fStack_a78;
                    auVar180._12_4_ = auVar179._12_4_ * fStack_a74;
                    auVar95._0_4_ = auVar277._0_4_ + auVar131._0_4_ * auVar180._0_4_;
                    auVar95._4_4_ = auVar277._4_4_ + auVar131._4_4_ * auVar180._4_4_;
                    auVar95._8_4_ = auVar277._8_4_ + auVar131._8_4_ * auVar180._8_4_;
                    auVar95._12_4_ = auVar277._12_4_ + auVar131._12_4_ * auVar180._12_4_;
                    auVar179 = vshufps_avx(auVar180,auVar180,0xc9);
                    auVar100 = vshufps_avx(auVar277,auVar277,0xc9);
                    auVar181._0_4_ = auVar100._0_4_ * auVar180._0_4_;
                    auVar181._4_4_ = auVar100._4_4_ * auVar180._4_4_;
                    auVar181._8_4_ = auVar100._8_4_ * auVar180._8_4_;
                    auVar181._12_4_ = auVar100._12_4_ * auVar180._12_4_;
                    auVar199._0_4_ = auVar277._0_4_ * auVar179._0_4_;
                    auVar199._4_4_ = auVar277._4_4_ * auVar179._4_4_;
                    auVar199._8_4_ = auVar277._8_4_ * auVar179._8_4_;
                    auVar199._12_4_ = auVar277._12_4_ * auVar179._12_4_;
                    auVar92 = vsubps_avx(auVar199,auVar181);
                    auVar179 = vshufps_avx(auVar92,auVar92,0xc9);
                    auVar100 = vshufps_avx(auVar95,auVar95,0xc9);
                    auVar200._0_4_ = auVar100._0_4_ * auVar179._0_4_;
                    auVar200._4_4_ = auVar100._4_4_ * auVar179._4_4_;
                    auVar200._8_4_ = auVar100._8_4_ * auVar179._8_4_;
                    auVar200._12_4_ = auVar100._12_4_ * auVar179._12_4_;
                    auVar179 = vshufps_avx(auVar92,auVar92,0xd2);
                    auVar96._0_4_ = auVar95._0_4_ * auVar179._0_4_;
                    auVar96._4_4_ = auVar95._4_4_ * auVar179._4_4_;
                    auVar96._8_4_ = auVar95._8_4_ * auVar179._8_4_;
                    auVar96._12_4_ = auVar95._12_4_ * auVar179._12_4_;
                    auVar100 = vsubps_avx(auVar200,auVar96);
                    auVar179 = vshufps_avx(auVar100,auVar100,0xe9);
                    local_930 = vmovlps_avx(auVar179);
                    local_928 = auVar100._0_4_;
                    local_920 = 0;
                    local_914 = context->user->instID[0];
                    local_910 = context->user->instPrimID[0];
                    ray->tfar = fVar210;
                    local_6a0._0_4_ = 0xffffffff;
                    local_9b0.valid = (int *)local_6a0;
                    local_9b0.geometryUserPtr = pGVar6->userPtr;
                    local_9b0.context = context->user;
                    local_9b0.hit = (RTCHitN *)&local_930;
                    local_9b0.N = 1;
                    local_9b0.ray = (RTCRayN *)ray;
                    local_924 = fVar228;
                    local_91c = uVar1;
                    local_918 = uVar80;
                    if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_007acc5f:
                      p_Var7 = context->args->filter;
                      if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar264 = ZEXT1664(auVar264._0_16_);
                        auVar318 = ZEXT1664(auVar318._0_16_);
                        auVar338 = ZEXT1664(auVar338._0_16_);
                        auVar356 = ZEXT1664(auVar356._0_16_);
                        (*p_Var7)(&local_9b0);
                        if (*local_9b0.valid == 0) goto LAB_007acca7;
                      }
                      bVar76 = 1;
                    }
                    else {
                      auVar264 = ZEXT1664(auVar10);
                      auVar318 = ZEXT1664(auVar93);
                      auVar338 = ZEXT464((uint)fVar173);
                      auVar356 = ZEXT1664(auVar11);
                      (*pGVar6->occlusionFilterN)(&local_9b0);
                      if (*local_9b0.valid != 0) goto LAB_007acc5f;
LAB_007acca7:
                      ray->tfar = fVar192;
                      bVar76 = 0;
                    }
                  }
                }
                goto LAB_007aca47;
              }
            }
            uVar84 = uVar84 + 1;
          }
          bVar86 = false;
LAB_007aca47:
          auVar226 = ZEXT3264(_local_980);
LAB_007aca50:
          fVar210 = ray->tfar;
          auVar111._4_4_ = fVar210;
          auVar111._0_4_ = fVar210;
          auVar111._8_4_ = fVar210;
          auVar111._12_4_ = fVar210;
          auVar111._16_4_ = fVar210;
          auVar111._20_4_ = fVar210;
          auVar111._24_4_ = fVar210;
          auVar111._28_4_ = fVar210;
          bVar83 = bVar83 | bVar86 & bVar76;
          auVar104 = vcmpps_avx(_local_7e0,auVar111,2);
          auVar104 = vandps_avx(auVar104,local_3e0);
          auVar327 = ZEXT3264(local_7c0);
        }
        auVar140._0_4_ = auVar327._0_4_ + (float)local_6c0._0_4_;
        auVar140._4_4_ = auVar327._4_4_ + (float)local_6c0._4_4_;
        auVar140._8_4_ = auVar327._8_4_ + fStack_6b8;
        auVar140._12_4_ = auVar327._12_4_ + fStack_6b4;
        auVar140._16_4_ = auVar327._16_4_ + fStack_6b0;
        auVar140._20_4_ = auVar327._20_4_ + fStack_6ac;
        auVar140._24_4_ = auVar327._24_4_ + fStack_6a8;
        auVar140._28_4_ = auVar327._28_4_ + fStack_6a4;
        auVar97._0_4_ = ray->tfar;
        auVar97._4_4_ = ray->mask;
        auVar97._8_4_ = ray->id;
        auVar97._12_4_ = ray->flags;
        fVar210 = ray->tfar;
        auVar165._4_4_ = fVar210;
        auVar165._0_4_ = fVar210;
        auVar165._8_4_ = fVar210;
        auVar165._12_4_ = fVar210;
        auVar165._16_4_ = fVar210;
        auVar165._20_4_ = fVar210;
        auVar165._24_4_ = fVar210;
        auVar165._28_4_ = fVar210;
        auVar104 = vcmpps_avx(auVar140,auVar165,2);
        local_7c0 = vandps_avx(auVar104,auVar226._0_32_);
        auVar141._8_4_ = 3;
        auVar141._0_8_ = 0x300000003;
        auVar141._12_4_ = 3;
        auVar141._16_4_ = 3;
        auVar141._20_4_ = 3;
        auVar141._24_4_ = 3;
        auVar141._28_4_ = 3;
        auVar166._8_4_ = 2;
        auVar166._0_8_ = 0x200000002;
        auVar166._12_4_ = 2;
        auVar166._16_4_ = 2;
        auVar166._20_4_ = 2;
        auVar166._24_4_ = 2;
        auVar166._28_4_ = 2;
        auVar104 = vblendvps_avx(auVar166,auVar141,local_660);
        auVar179 = vpcmpgtd_avx(auVar104._16_16_,local_700);
        auVar10 = vpshufd_avx(local_680._0_16_,0);
        auVar10 = vpcmpgtd_avx(auVar104._0_16_,auVar10);
        auVar167._16_16_ = auVar179;
        auVar167._0_16_ = auVar97;
        _local_7e0 = vblendps_avx(ZEXT1632(auVar10),auVar167,0xf0);
        local_6a0 = vandnps_avx(_local_7e0,local_7c0);
        local_800 = _local_5e0;
        local_980._4_4_ = (float)local_6c0._4_4_ + (float)local_5e0._4_4_;
        local_980._0_4_ = (float)local_6c0._0_4_ + (float)local_5e0._0_4_;
        fStack_978 = fStack_6b8 + fStack_5d8;
        fStack_974 = fStack_6b4 + fStack_5d4;
        fStack_970 = fStack_6b0 + fStack_5d0;
        fStack_96c = fStack_6ac + fStack_5cc;
        fStack_968 = fStack_6a8 + fStack_5c8;
        fStack_964 = fStack_6a4 + fStack_5c4;
        for (; (((((((local_6a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                    (local_6a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   (local_6a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  SUB321(local_6a0 >> 0x7f,0) != '\0') ||
                 (local_6a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                SUB321(local_6a0 >> 0xbf,0) != '\0') ||
               (local_6a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               local_6a0[0x1f] < '\0'; local_6a0 = vandps_avx(auVar104,local_6a0)) {
          auVar112._8_4_ = 0x7f800000;
          auVar112._0_8_ = 0x7f8000007f800000;
          auVar112._12_4_ = 0x7f800000;
          auVar112._16_4_ = 0x7f800000;
          auVar112._20_4_ = 0x7f800000;
          auVar112._24_4_ = 0x7f800000;
          auVar112._28_4_ = 0x7f800000;
          auVar104 = vblendvps_avx(auVar112,local_800,local_6a0);
          auVar105 = vshufps_avx(auVar104,auVar104,0xb1);
          auVar105 = vminps_avx(auVar104,auVar105);
          auVar17 = vshufpd_avx(auVar105,auVar105,5);
          auVar105 = vminps_avx(auVar105,auVar17);
          auVar17 = vperm2f128_avx(auVar105,auVar105,1);
          auVar105 = vminps_avx(auVar105,auVar17);
          auVar105 = vcmpps_avx(auVar104,auVar105,0);
          auVar17 = local_6a0 & auVar105;
          auVar104 = local_6a0;
          if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar17 >> 0x7f,0) != '\0') ||
                (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar17 >> 0xbf,0) != '\0') ||
              (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar17[0x1f] < '\0') {
            auVar104 = vandps_avx(auVar105,local_6a0);
          }
          uVar77 = vmovmskps_avx(auVar104);
          uVar85 = 0;
          if (uVar77 != 0) {
            for (; (uVar77 >> uVar85 & 1) == 0; uVar85 = uVar85 + 1) {
            }
          }
          uVar79 = (ulong)uVar85;
          *(undefined4 *)(local_6a0 + uVar79 * 4) = 0;
          aVar2 = (ray->dir).field_0.field_1;
          local_860 = aVar2.x;
          fStack_85c = aVar2.y;
          fStack_858 = aVar2.z;
          aStack_854 = aVar2.field_3;
          auVar179 = vdpps_avx((undefined1  [16])aVar2,(undefined1  [16])aVar2,0x7f);
          fVar210 = local_1c0[uVar79];
          uVar85 = *(uint *)(local_5c0 + uVar79 * 4);
          if (auVar179._0_4_ < 0.0) {
            auVar318 = ZEXT1664(auVar318._0_16_);
            auVar327 = ZEXT1664(auVar327._0_16_);
            auVar338 = ZEXT1664(auVar338._0_16_);
            auVar356 = ZEXT1664(auVar356._0_16_);
            fVar173 = sqrtf(auVar179._0_4_);
            uVar79 = extraout_RAX_03;
          }
          else {
            auVar179 = vsqrtss_avx(auVar179,auVar179);
            fVar173 = auVar179._0_4_;
          }
          auVar264 = ZEXT464(uVar85);
          auVar10 = vminps_avx(_local_9c0,_local_9e0);
          auVar179 = vmaxps_avx(_local_9c0,_local_9e0);
          auVar11 = vminps_avx(_local_9d0,_local_9f0);
          auVar93 = vminps_avx(auVar10,auVar11);
          auVar10 = vmaxps_avx(_local_9d0,_local_9f0);
          auVar11 = vmaxps_avx(auVar179,auVar10);
          auVar182._8_4_ = 0x7fffffff;
          auVar182._0_8_ = 0x7fffffff7fffffff;
          auVar182._12_4_ = 0x7fffffff;
          auVar179 = vandps_avx(auVar93,auVar182);
          auVar10 = vandps_avx(auVar11,auVar182);
          auVar179 = vmaxps_avx(auVar179,auVar10);
          auVar10 = vmovshdup_avx(auVar179);
          auVar10 = vmaxss_avx(auVar10,auVar179);
          auVar179 = vshufpd_avx(auVar179,auVar179,1);
          auVar179 = vmaxss_avx(auVar179,auVar10);
          local_880 = auVar179._0_4_ * 1.9073486e-06;
          local_8e0._0_4_ = fVar173 * 1.9073486e-06;
          local_760._0_16_ = vshufps_avx(auVar11,auVar11,0xff);
          auVar179 = vinsertps_avx(ZEXT416(uVar85),ZEXT416((uint)fVar210),0x10);
          uVar84 = 0;
          while( true ) {
            bVar76 = (byte)uVar79;
            if (uVar84 == 5) break;
            auVar11 = vmovshdup_avx(auVar179);
            fVar229 = auVar11._0_4_;
            fVar193 = 1.0 - fVar229;
            fVar210 = fVar193 * fVar193;
            fVar173 = fVar193 * fVar210;
            fVar227 = fVar229 * fVar229;
            fVar192 = fVar229 * fVar227;
            fVar228 = fVar229 * fVar193;
            auVar10 = vshufps_avx(ZEXT416((uint)(fVar192 * 0.16666667)),
                                  ZEXT416((uint)(fVar192 * 0.16666667)),0);
            auVar93 = ZEXT416((uint)((fVar192 * 4.0 + fVar173 +
                                     fVar229 * fVar228 * 12.0 + fVar193 * fVar228 * 6.0) *
                                    0.16666667));
            auVar93 = vshufps_avx(auVar93,auVar93,0);
            auVar100 = ZEXT416((uint)((fVar173 * 4.0 + fVar192 +
                                      fVar193 * fVar228 * 12.0 + fVar229 * fVar228 * 6.0) *
                                     0.16666667));
            auVar100 = vshufps_avx(auVar100,auVar100,0);
            auVar92 = vshufps_avx(auVar179,auVar179,0);
            auVar158._0_4_ = auVar92._0_4_ * local_860 + 0.0;
            auVar158._4_4_ = auVar92._4_4_ * fStack_85c + 0.0;
            auVar158._8_4_ = auVar92._8_4_ * fStack_858 + 0.0;
            auVar158._12_4_ = auVar92._12_4_ * aStack_854.w + 0.0;
            auVar92 = vshufps_avx(ZEXT416((uint)(fVar173 * 0.16666667)),
                                  ZEXT416((uint)(fVar173 * 0.16666667)),0);
            auVar98._0_4_ =
                 auVar92._0_4_ * (float)local_9c0._0_4_ +
                 auVar100._0_4_ * (float)local_9e0._0_4_ +
                 auVar10._0_4_ * (float)local_9f0._0_4_ + auVar93._0_4_ * (float)local_9d0._0_4_;
            auVar98._4_4_ =
                 auVar92._4_4_ * (float)local_9c0._4_4_ +
                 auVar100._4_4_ * (float)local_9e0._4_4_ +
                 auVar10._4_4_ * (float)local_9f0._4_4_ + auVar93._4_4_ * (float)local_9d0._4_4_;
            auVar98._8_4_ =
                 auVar92._8_4_ * fStack_9b8 +
                 auVar100._8_4_ * fStack_9d8 +
                 auVar10._8_4_ * fStack_9e8 + auVar93._8_4_ * fStack_9c8;
            auVar98._12_4_ =
                 auVar92._12_4_ * fStack_9b4 +
                 auVar100._12_4_ * fStack_9d4 +
                 auVar10._12_4_ * fStack_9e4 + auVar93._12_4_ * fStack_9c4;
            local_8a0._0_16_ = auVar98;
            auVar10 = vsubps_avx(auVar158,auVar98);
            _local_a80 = auVar10;
            auVar10 = vdpps_avx(auVar10,auVar10,0x7f);
            fVar173 = auVar10._0_4_;
            if (fVar173 < 0.0) {
              local_a20._0_16_ = auVar11;
              local_960._0_4_ = fVar227;
              local_a40._0_4_ = fVar210;
              local_a60._0_4_ = fVar228;
              fVar192 = sqrtf(fVar173);
              uVar79 = extraout_RAX_04;
              fVar210 = (float)local_a40._0_4_;
              auVar11 = local_a20._0_16_;
              fVar227 = (float)local_960._0_4_;
            }
            else {
              auVar93 = vsqrtss_avx(auVar10,auVar10);
              fVar192 = auVar93._0_4_;
              local_a60._0_4_ = fVar228;
            }
            auVar356 = ZEXT464((uint)fVar227);
            auVar338 = ZEXT1664(auVar11);
            fVar228 = auVar11._0_4_;
            auVar93 = vshufps_avx(ZEXT416((uint)(fVar227 * 0.5)),ZEXT416((uint)(fVar227 * 0.5)),0);
            auVar100 = ZEXT416((uint)((fVar210 + (float)local_a60._0_4_ * 4.0) * 0.5));
            auVar100 = vshufps_avx(auVar100,auVar100,0);
            auVar92 = ZEXT416((uint)((fVar228 * -fVar228 - (float)local_a60._0_4_ * 4.0) * 0.5));
            auVar92 = vshufps_avx(auVar92,auVar92,0);
            auVar99 = ZEXT416((uint)(fVar193 * -fVar193 * 0.5));
            auVar99 = vshufps_avx(auVar99,auVar99,0);
            auVar278._0_4_ =
                 (float)local_9c0._0_4_ * auVar99._0_4_ +
                 (float)local_9e0._0_4_ * auVar92._0_4_ +
                 (float)local_9f0._0_4_ * auVar93._0_4_ + (float)local_9d0._0_4_ * auVar100._0_4_;
            auVar278._4_4_ =
                 (float)local_9c0._4_4_ * auVar99._4_4_ +
                 (float)local_9e0._4_4_ * auVar92._4_4_ +
                 (float)local_9f0._4_4_ * auVar93._4_4_ + (float)local_9d0._4_4_ * auVar100._4_4_;
            auVar278._8_4_ =
                 fStack_9b8 * auVar99._8_4_ +
                 fStack_9d8 * auVar92._8_4_ +
                 fStack_9e8 * auVar93._8_4_ + fStack_9c8 * auVar100._8_4_;
            auVar278._12_4_ =
                 fStack_9b4 * auVar99._12_4_ +
                 fStack_9d4 * auVar92._12_4_ +
                 fStack_9e4 * auVar93._12_4_ + fStack_9c4 * auVar100._12_4_;
            auVar93 = vshufps_avx(auVar179,auVar179,0x55);
            auVar100 = ZEXT416((uint)(fVar193 - (fVar228 + fVar228)));
            auVar92 = vshufps_avx(auVar100,auVar100,0);
            auVar100 = ZEXT416((uint)(fVar228 - (fVar193 + fVar193)));
            auVar99 = vshufps_avx(auVar100,auVar100,0);
            auVar131 = vshufps_avx(ZEXT416((uint)fVar193),ZEXT416((uint)fVar193),0);
            auVar100 = vdpps_avx(auVar278,auVar278,0x7f);
            auVar129._0_4_ =
                 (float)local_9c0._0_4_ * auVar131._0_4_ +
                 (float)local_9e0._0_4_ * auVar99._0_4_ +
                 (float)local_9f0._0_4_ * auVar93._0_4_ + (float)local_9d0._0_4_ * auVar92._0_4_;
            auVar129._4_4_ =
                 (float)local_9c0._4_4_ * auVar131._4_4_ +
                 (float)local_9e0._4_4_ * auVar99._4_4_ +
                 (float)local_9f0._4_4_ * auVar93._4_4_ + (float)local_9d0._4_4_ * auVar92._4_4_;
            auVar129._8_4_ =
                 fStack_9b8 * auVar131._8_4_ +
                 fStack_9d8 * auVar99._8_4_ +
                 fStack_9e8 * auVar93._8_4_ + fStack_9c8 * auVar92._8_4_;
            auVar129._12_4_ =
                 fStack_9b4 * auVar131._12_4_ +
                 fStack_9d4 * auVar99._12_4_ +
                 fStack_9e4 * auVar93._12_4_ + fStack_9c4 * auVar92._12_4_;
            auVar93 = vblendps_avx(auVar100,_DAT_01f45a50,0xe);
            auVar92 = vrsqrtss_avx(auVar93,auVar93);
            fVar228 = auVar92._0_4_;
            fVar210 = auVar100._0_4_;
            auVar92 = vdpps_avx(auVar278,auVar129,0x7f);
            auVar99 = vshufps_avx(auVar100,auVar100,0);
            auVar130._0_4_ = auVar129._0_4_ * auVar99._0_4_;
            auVar130._4_4_ = auVar129._4_4_ * auVar99._4_4_;
            auVar130._8_4_ = auVar129._8_4_ * auVar99._8_4_;
            auVar130._12_4_ = auVar129._12_4_ * auVar99._12_4_;
            auVar92 = vshufps_avx(auVar92,auVar92,0);
            auVar201._0_4_ = auVar278._0_4_ * auVar92._0_4_;
            auVar201._4_4_ = auVar278._4_4_ * auVar92._4_4_;
            auVar201._8_4_ = auVar278._8_4_ * auVar92._8_4_;
            auVar201._12_4_ = auVar278._12_4_ * auVar92._12_4_;
            auVar131 = vsubps_avx(auVar130,auVar201);
            auVar92 = vrcpss_avx(auVar93,auVar93);
            auVar93 = vmaxss_avx(ZEXT416((uint)local_880),
                                 ZEXT416((uint)(auVar179._0_4_ * (float)local_8e0._0_4_)));
            auVar92 = ZEXT416((uint)(auVar92._0_4_ * (2.0 - fVar210 * auVar92._0_4_)));
            auVar92 = vshufps_avx(auVar92,auVar92,0);
            uVar66 = CONCAT44(auVar278._4_4_,auVar278._0_4_);
            auVar322._0_8_ = uVar66 ^ 0x8000000080000000;
            auVar322._8_4_ = -auVar278._8_4_;
            auVar322._12_4_ = -auVar278._12_4_;
            auVar99 = ZEXT416((uint)(fVar228 * 1.5 + fVar210 * -0.5 * fVar228 * fVar228 * fVar228));
            auVar99 = vshufps_avx(auVar99,auVar99,0);
            auVar183._0_4_ = auVar99._0_4_ * auVar131._0_4_ * auVar92._0_4_;
            auVar183._4_4_ = auVar99._4_4_ * auVar131._4_4_ * auVar92._4_4_;
            auVar183._8_4_ = auVar99._8_4_ * auVar131._8_4_ * auVar92._8_4_;
            auVar183._12_4_ = auVar99._12_4_ * auVar131._12_4_ * auVar92._12_4_;
            local_a60._0_4_ = auVar278._0_4_ * auVar99._0_4_;
            local_a60._4_4_ = auVar278._4_4_ * auVar99._4_4_;
            local_a60._8_4_ = auVar278._8_4_ * auVar99._8_4_;
            local_a60._12_4_ = auVar278._12_4_ * auVar99._12_4_;
            local_a20._0_4_ = auVar93._0_4_;
            if (fVar210 < 0.0) {
              local_960._0_4_ = fVar192;
              local_a40._0_16_ = auVar322;
              local_900._0_16_ = auVar183;
              auVar338 = ZEXT1664(auVar11);
              auVar356 = ZEXT464((uint)fVar227);
              fVar227 = sqrtf(fVar210);
              uVar79 = extraout_RAX_05;
              auVar183 = local_900._0_16_;
              auVar322 = local_a40._0_16_;
              fVar210 = (float)local_a20._0_4_;
            }
            else {
              auVar11 = vsqrtss_avx(auVar100,auVar100);
              fVar227 = auVar11._0_4_;
              local_960._0_4_ = fVar192;
              fVar210 = auVar93._0_4_;
            }
            auVar327 = ZEXT1664(auVar322);
            auVar11 = vdpps_avx(_local_a80,local_a60._0_16_,0x7f);
            local_a40._0_4_ =
                 (local_880 / fVar227) * ((float)local_960._0_4_ + 1.0) +
                 fVar210 + (float)local_960._0_4_ * local_880;
            auVar93 = vdpps_avx(auVar322,local_a60._0_16_,0x7f);
            auVar100 = vdpps_avx(_local_a80,auVar183,0x7f);
            auVar71._4_4_ = fStack_85c;
            auVar71._0_4_ = local_860;
            auVar71._8_4_ = fStack_858;
            auVar71._12_4_ = aStack_854.a;
            auVar92 = vdpps_avx(auVar71,local_a60._0_16_,0x7f);
            auVar99 = vdpps_avx(_local_a80,auVar322,0x7f);
            fVar227 = auVar93._0_4_ + auVar100._0_4_;
            fVar192 = auVar11._0_4_;
            auVar101._0_4_ = fVar192 * fVar192;
            auVar101._4_4_ = auVar11._4_4_ * auVar11._4_4_;
            auVar101._8_4_ = auVar11._8_4_ * auVar11._8_4_;
            auVar101._12_4_ = auVar11._12_4_ * auVar11._12_4_;
            auVar100 = vsubps_avx(auVar10,auVar101);
            local_a60._0_16_ = ZEXT416((uint)fVar227);
            auVar93 = vdpps_avx(_local_a80,auVar71,0x7f);
            fVar228 = auVar99._0_4_ - fVar192 * fVar227;
            local_960._0_16_ = auVar11;
            fVar192 = auVar93._0_4_ - fVar192 * auVar92._0_4_;
            auVar11 = vrsqrtss_avx(auVar100,auVar100);
            fVar193 = auVar100._0_4_;
            fVar227 = auVar11._0_4_;
            fVar227 = fVar227 * 1.5 + fVar193 * -0.5 * fVar227 * fVar227 * fVar227;
            if (fVar193 < 0.0) {
              local_900._0_16_ = auVar92;
              local_720._0_4_ = fVar228;
              local_8c0._0_4_ = fVar192;
              local_740._0_4_ = fVar227;
              auVar327 = ZEXT1664(auVar322);
              auVar338 = ZEXT1664(auVar338._0_16_);
              auVar356 = ZEXT1664(auVar356._0_16_);
              fVar193 = sqrtf(fVar193);
              uVar79 = extraout_RAX_06;
              fVar227 = (float)local_740._0_4_;
              fVar228 = (float)local_720._0_4_;
              fVar192 = (float)local_8c0._0_4_;
              auVar92 = local_900._0_16_;
              fVar210 = (float)local_a20._0_4_;
            }
            else {
              auVar11 = vsqrtss_avx(auVar100,auVar100);
              fVar193 = auVar11._0_4_;
            }
            auVar264 = ZEXT1664(auVar10);
            auVar131 = vpermilps_avx(local_8a0._0_16_,0xff);
            auVar99 = vshufps_avx(auVar278,auVar278,0xff);
            fVar228 = fVar228 * fVar227 - auVar99._0_4_;
            auVar202._0_8_ = auVar92._0_8_ ^ 0x8000000080000000;
            auVar202._8_4_ = auVar92._8_4_ ^ 0x80000000;
            auVar202._12_4_ = auVar92._12_4_ ^ 0x80000000;
            auVar215._0_4_ = -fVar228;
            auVar215._4_4_ = 0x80000000;
            auVar215._8_4_ = 0x80000000;
            auVar215._12_4_ = 0x80000000;
            auVar318 = ZEXT1664(local_a60._0_16_);
            auVar11 = vinsertps_avx(auVar215,ZEXT416((uint)(fVar192 * fVar227)),0x1c);
            auVar100 = vmovsldup_avx(ZEXT416((uint)(local_a60._0_4_ * fVar192 * fVar227 -
                                                   auVar92._0_4_ * fVar228)));
            auVar11 = vdivps_avx(auVar11,auVar100);
            auVar93 = vinsertps_avx(local_a60._0_16_,auVar202,0x10);
            auVar93 = vdivps_avx(auVar93,auVar100);
            auVar100 = vmovsldup_avx(local_960._0_16_);
            auVar131 = ZEXT416((uint)(fVar193 - auVar131._0_4_));
            auVar92 = vmovsldup_avx(auVar131);
            auVar159._0_4_ = auVar100._0_4_ * auVar11._0_4_ + auVar92._0_4_ * auVar93._0_4_;
            auVar159._4_4_ = auVar100._4_4_ * auVar11._4_4_ + auVar92._4_4_ * auVar93._4_4_;
            auVar159._8_4_ = auVar100._8_4_ * auVar11._8_4_ + auVar92._8_4_ * auVar93._8_4_;
            auVar159._12_4_ = auVar100._12_4_ * auVar11._12_4_ + auVar92._12_4_ * auVar93._12_4_;
            auVar179 = vsubps_avx(auVar179,auVar159);
            auVar160._8_4_ = 0x7fffffff;
            auVar160._0_8_ = 0x7fffffff7fffffff;
            auVar160._12_4_ = 0x7fffffff;
            auVar11 = vandps_avx(local_960._0_16_,auVar160);
            if (auVar11._0_4_ < (float)local_a40._0_4_) {
              auVar184._8_4_ = 0x7fffffff;
              auVar184._0_8_ = 0x7fffffff7fffffff;
              auVar184._12_4_ = 0x7fffffff;
              auVar11 = vandps_avx(auVar131,auVar184);
              if (auVar11._0_4_ <
                  (float)local_760._0_4_ * 1.9073486e-06 + fVar210 + (float)local_a40._0_4_) {
                bVar86 = uVar84 < 5;
                fVar210 = auVar179._0_4_ + (float)local_830._0_4_;
                bVar76 = 0;
                if (((ray->org).field_0.m128[3] <= fVar210) &&
                   (fVar227 = ray->tfar, fVar210 <= fVar227)) {
                  auVar179 = vmovshdup_avx(auVar179);
                  fVar192 = auVar179._0_4_;
                  bVar76 = 0;
                  if ((0.0 <= fVar192) && (bVar76 = 0, fVar192 <= 1.0)) {
                    auVar179 = vrsqrtss_avx(auVar10,auVar10);
                    fVar228 = auVar179._0_4_;
                    pGVar6 = (context->scene->geometries).items[uVar80].ptr;
                    if ((pGVar6->mask & ray->mask) == 0) {
                      bVar76 = 0;
                    }
                    else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                            (bVar76 = 1, pGVar6->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                      auVar179 = ZEXT416((uint)(fVar228 * 1.5 +
                                               fVar173 * -0.5 * fVar228 * fVar228 * fVar228));
                      auVar179 = vshufps_avx(auVar179,auVar179,0);
                      auVar185._0_4_ = auVar179._0_4_ * (float)local_a80._0_4_;
                      auVar185._4_4_ = auVar179._4_4_ * (float)local_a80._4_4_;
                      auVar185._8_4_ = auVar179._8_4_ * fStack_a78;
                      auVar185._12_4_ = auVar179._12_4_ * fStack_a74;
                      auVar102._0_4_ = auVar278._0_4_ + auVar99._0_4_ * auVar185._0_4_;
                      auVar102._4_4_ = auVar278._4_4_ + auVar99._4_4_ * auVar185._4_4_;
                      auVar102._8_4_ = auVar278._8_4_ + auVar99._8_4_ * auVar185._8_4_;
                      auVar102._12_4_ = auVar278._12_4_ + auVar99._12_4_ * auVar185._12_4_;
                      auVar179 = vshufps_avx(auVar185,auVar185,0xc9);
                      auVar11 = vshufps_avx(auVar278,auVar278,0xc9);
                      auVar186._0_4_ = auVar11._0_4_ * auVar185._0_4_;
                      auVar186._4_4_ = auVar11._4_4_ * auVar185._4_4_;
                      auVar186._8_4_ = auVar11._8_4_ * auVar185._8_4_;
                      auVar186._12_4_ = auVar11._12_4_ * auVar185._12_4_;
                      auVar203._0_4_ = auVar278._0_4_ * auVar179._0_4_;
                      auVar203._4_4_ = auVar278._4_4_ * auVar179._4_4_;
                      auVar203._8_4_ = auVar278._8_4_ * auVar179._8_4_;
                      auVar203._12_4_ = auVar278._12_4_ * auVar179._12_4_;
                      auVar93 = vsubps_avx(auVar203,auVar186);
                      auVar179 = vshufps_avx(auVar93,auVar93,0xc9);
                      auVar11 = vshufps_avx(auVar102,auVar102,0xc9);
                      auVar204._0_4_ = auVar11._0_4_ * auVar179._0_4_;
                      auVar204._4_4_ = auVar11._4_4_ * auVar179._4_4_;
                      auVar204._8_4_ = auVar11._8_4_ * auVar179._8_4_;
                      auVar204._12_4_ = auVar11._12_4_ * auVar179._12_4_;
                      auVar179 = vshufps_avx(auVar93,auVar93,0xd2);
                      auVar103._0_4_ = auVar102._0_4_ * auVar179._0_4_;
                      auVar103._4_4_ = auVar102._4_4_ * auVar179._4_4_;
                      auVar103._8_4_ = auVar102._8_4_ * auVar179._8_4_;
                      auVar103._12_4_ = auVar102._12_4_ * auVar179._12_4_;
                      auVar11 = vsubps_avx(auVar204,auVar103);
                      auVar179 = vshufps_avx(auVar11,auVar11,0xe9);
                      local_930 = vmovlps_avx(auVar179);
                      local_928 = auVar11._0_4_;
                      local_920 = 0;
                      local_914 = context->user->instID[0];
                      local_910 = context->user->instPrimID[0];
                      ray->tfar = fVar210;
                      local_a84 = -1;
                      local_9b0.valid = &local_a84;
                      local_9b0.geometryUserPtr = pGVar6->userPtr;
                      local_9b0.context = context->user;
                      local_9b0.hit = (RTCHitN *)&local_930;
                      local_9b0.N = 1;
                      local_9b0.ray = (RTCRayN *)ray;
                      local_924 = fVar192;
                      local_91c = uVar1;
                      local_918 = uVar80;
                      if (pGVar6->occlusionFilterN == (RTCFilterFunctionN)0x0) {
LAB_007ad667:
                        p_Var7 = context->args->filter;
                        if ((p_Var7 != (RTCFilterFunctionN)0x0) &&
                           (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                             RTC_RAY_QUERY_FLAG_INCOHERENT ||
                            (((pGVar6->field_8).field_0x2 & 0x40) != 0)))) {
                          auVar264 = ZEXT1664(auVar264._0_16_);
                          auVar318 = ZEXT1664(auVar318._0_16_);
                          auVar327 = ZEXT1664(auVar327._0_16_);
                          auVar338 = ZEXT1664(auVar338._0_16_);
                          auVar356 = ZEXT1664(auVar356._0_16_);
                          (*p_Var7)(&local_9b0);
                          if (*local_9b0.valid == 0) goto LAB_007ad6af;
                        }
                        bVar76 = 1;
                      }
                      else {
                        auVar264 = ZEXT1664(auVar10);
                        auVar318 = ZEXT1664(local_a60._0_16_);
                        auVar327 = ZEXT1664(auVar327._0_16_);
                        auVar338 = ZEXT1664(auVar338._0_16_);
                        auVar356 = ZEXT1664(auVar356._0_16_);
                        (*pGVar6->occlusionFilterN)(&local_9b0);
                        if (*local_9b0.valid != 0) goto LAB_007ad667;
LAB_007ad6af:
                        ray->tfar = fVar227;
                        bVar76 = 0;
                      }
                    }
                  }
                }
                goto LAB_007ad468;
              }
            }
            uVar84 = uVar84 + 1;
          }
          bVar86 = false;
LAB_007ad468:
          bVar83 = bVar83 | bVar86 & bVar76;
          fVar210 = ray->tfar;
          auVar142._4_4_ = fVar210;
          auVar142._0_4_ = fVar210;
          auVar142._8_4_ = fVar210;
          auVar142._12_4_ = fVar210;
          auVar142._16_4_ = fVar210;
          auVar142._20_4_ = fVar210;
          auVar142._24_4_ = fVar210;
          auVar142._28_4_ = fVar210;
          auVar97._0_4_ = ray->tfar;
          auVar97._4_4_ = ray->mask;
          auVar97._8_4_ = ray->id;
          auVar97._12_4_ = ray->flags;
          auVar104 = vcmpps_avx(_local_980,auVar142,2);
        }
        auVar104 = vandps_avx(local_640,local_6e0);
        auVar105 = vandps_avx(_local_7e0,local_7c0);
        auVar240 = ZEXT3264(_local_6c0);
        auVar208._0_4_ = local_6c0._0_4_ + local_5a0._0_4_;
        auVar208._4_4_ = local_6c0._4_4_ + local_5a0._4_4_;
        auVar208._8_4_ = local_6c0._8_4_ + local_5a0._8_4_;
        auVar208._12_4_ = local_6c0._12_4_ + local_5a0._12_4_;
        auVar208._16_4_ = local_6c0._16_4_ + local_5a0._16_4_;
        auVar208._20_4_ = local_6c0._20_4_ + local_5a0._20_4_;
        auVar208._24_4_ = local_6c0._24_4_ + local_5a0._24_4_;
        auVar208._28_4_ = local_6c0._28_4_ + local_5a0._28_4_;
        auVar179 = vshufps_avx(auVar97,auVar97,0);
        auVar224._16_16_ = auVar179;
        auVar224._0_16_ = auVar179;
        auVar17 = vcmpps_avx(auVar208,auVar224,2);
        auVar104 = vandps_avx(auVar17,auVar104);
        auVar209._0_4_ = local_6c0._0_4_ + local_5e0._0_4_;
        auVar209._4_4_ = local_6c0._4_4_ + local_5e0._4_4_;
        auVar209._8_4_ = local_6c0._8_4_ + local_5e0._8_4_;
        auVar209._12_4_ = local_6c0._12_4_ + local_5e0._12_4_;
        auVar209._16_4_ = local_6c0._16_4_ + local_5e0._16_4_;
        auVar209._20_4_ = local_6c0._20_4_ + local_5e0._20_4_;
        auVar209._24_4_ = local_6c0._24_4_ + local_5e0._24_4_;
        auVar209._28_4_ = local_6c0._28_4_ + local_5e0._28_4_;
        auVar17 = vcmpps_avx(auVar209,auVar224,2);
        auVar105 = vandps_avx(auVar17,auVar105);
        auVar105 = vorps_avx(auVar104,auVar105);
        if ((((((((auVar105 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar105 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar105 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar105 >> 0x7f,0) != '\0') ||
              (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar105 >> 0xbf,0) != '\0') ||
            (auVar105 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar105[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar82 * 0x60) = auVar105;
          auVar104 = vblendvps_avx(_local_5e0,local_5a0,auVar104);
          *(undefined1 (*) [32])(auStack_160 + uVar82 * 0x60) = auVar104;
          uVar79 = vmovlps_avx(local_5f0);
          (&uStack_140)[uVar82 * 0xc] = uVar79;
          auStack_138[uVar82 * 0x18] = local_b54 + 1;
          uVar82 = (ulong)((int)uVar82 + 1);
        }
      }
    }
    auVar4._0_4_ = ray->tfar;
    auVar4._4_4_ = ray->mask;
    auVar4._8_4_ = ray->id;
    auVar4._12_4_ = ray->flags;
    fVar210 = ray->tfar;
    auVar162._4_4_ = fVar210;
    auVar162._0_4_ = fVar210;
    auVar162._8_4_ = fVar210;
    auVar162._12_4_ = fVar210;
    auVar162._16_4_ = fVar210;
    auVar162._20_4_ = fVar210;
    auVar162._24_4_ = fVar210;
    auVar162._28_4_ = fVar210;
    while( true ) {
      uVar85 = (uint)uVar82;
      if (uVar85 == 0) {
        if (bVar83 != 0) goto LAB_007ad8b8;
        auVar16 = vshufps_avx(auVar4,auVar4,0);
        auVar16 = vcmpps_avx(local_600,auVar16,2);
        uVar80 = vmovmskps_avx(auVar16);
        uVar80 = (uint)local_810 & uVar80;
        goto LAB_007ab087;
      }
      uVar82 = (ulong)(uVar85 - 1);
      lVar78 = uVar82 * 0x60;
      auVar104 = *(undefined1 (*) [32])(auStack_160 + lVar78);
      auVar136._0_4_ = auVar104._0_4_ + (float)local_6c0._0_4_;
      auVar136._4_4_ = auVar104._4_4_ + (float)local_6c0._4_4_;
      auVar136._8_4_ = auVar104._8_4_ + fStack_6b8;
      auVar136._12_4_ = auVar104._12_4_ + fStack_6b4;
      auVar136._16_4_ = auVar104._16_4_ + fStack_6b0;
      auVar136._20_4_ = auVar104._20_4_ + fStack_6ac;
      auVar136._24_4_ = auVar104._24_4_ + fStack_6a8;
      auVar136._28_4_ = auVar104._28_4_ + fStack_6a4;
      auVar17 = vcmpps_avx(auVar136,auVar162,2);
      auVar226 = ZEXT3264(auVar17);
      auVar105 = vandps_avx(auVar17,*(undefined1 (*) [32])(auStack_180 + lVar78));
      local_5a0 = auVar105;
      auVar17 = *(undefined1 (*) [32])(auStack_180 + lVar78) & auVar17;
      if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar17 >> 0x7f,0) != '\0') ||
            (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0xbf,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar17[0x1f] < '\0') break;
      uVar82 = (ulong)(uVar85 - 1);
    }
    auVar108._8_4_ = 0x7f800000;
    auVar108._0_8_ = 0x7f8000007f800000;
    auVar108._12_4_ = 0x7f800000;
    auVar108._16_4_ = 0x7f800000;
    auVar108._20_4_ = 0x7f800000;
    auVar108._24_4_ = 0x7f800000;
    auVar108._28_4_ = 0x7f800000;
    auVar104 = vblendvps_avx(auVar108,auVar104,auVar105);
    auVar17 = vshufps_avx(auVar104,auVar104,0xb1);
    auVar17 = vminps_avx(auVar104,auVar17);
    auVar13 = vshufpd_avx(auVar17,auVar17,5);
    auVar17 = vminps_avx(auVar17,auVar13);
    auVar13 = vperm2f128_avx(auVar17,auVar17,1);
    auVar17 = vminps_avx(auVar17,auVar13);
    auVar104 = vcmpps_avx(auVar104,auVar17,0);
    auVar17 = auVar105 & auVar104;
    if ((((((((auVar17 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar17 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar17 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar17 >> 0x7f,0) != '\0') ||
          (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar17 >> 0xbf,0) != '\0') ||
        (auVar17 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) || auVar17[0x1f] < '\0')
    {
      auVar105 = vandps_avx(auVar104,auVar105);
    }
    auVar90._8_8_ = 0;
    auVar90._0_8_ = (&uStack_140)[uVar82 * 0xc];
    local_b54 = auStack_138[uVar82 * 0x18];
    uVar81 = vmovmskps_avx(auVar105);
    uVar77 = 0;
    if (uVar81 != 0) {
      for (; (uVar81 >> uVar77 & 1) == 0; uVar77 = uVar77 + 1) {
      }
    }
    *(undefined4 *)(local_5a0 + (ulong)uVar77 * 4) = 0;
    *(undefined1 (*) [32])(auStack_180 + lVar78) = local_5a0;
    uVar81 = uVar85 - 1;
    if ((((((((local_5a0 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_5a0 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_5a0 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_5a0 >> 0x7f,0) != '\0') ||
          (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_5a0 >> 0xbf,0) != '\0') ||
        (local_5a0 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_5a0[0x1f] < '\0') {
      uVar81 = uVar85;
    }
    auVar179 = vshufps_avx(auVar90,auVar90,0);
    auVar10 = vshufps_avx(auVar90,auVar90,0x55);
    auVar10 = vsubps_avx(auVar10,auVar179);
    local_5e0._4_4_ = auVar179._4_4_ + auVar10._4_4_ * 0.14285715;
    local_5e0._0_4_ = auVar179._0_4_ + auVar10._0_4_ * 0.0;
    fStack_5d8 = auVar179._8_4_ + auVar10._8_4_ * 0.2857143;
    fStack_5d4 = auVar179._12_4_ + auVar10._12_4_ * 0.42857146;
    fStack_5d0 = auVar179._0_4_ + auVar10._0_4_ * 0.5714286;
    fStack_5cc = auVar179._4_4_ + auVar10._4_4_ * 0.71428573;
    fStack_5c8 = auVar179._8_4_ + auVar10._8_4_ * 0.8571429;
    fStack_5c4 = auVar179._12_4_ + auVar10._12_4_;
    local_5f0._8_8_ = 0;
    local_5f0._0_8_ = *(ulong *)(local_5e0 + (ulong)uVar77 * 4);
    uVar82 = (ulong)uVar81;
  } while( true );
}

Assistant:

static __forceinline bool occluded_t(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = CurveNiIntersector1<M>::intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = (CurveGeometry*) context->scene->get(geomID);
          const Vec3ff a0 = Vec3ff::loadu(&prim.vertices(i,N)[0]);
          const Vec3ff a1 = Vec3ff::loadu(&prim.vertices(i,N)[1]);
          const Vec3ff a2 = Vec3ff::loadu(&prim.vertices(i,N)[2]);
          const Vec3ff a3 = Vec3ff::loadu(&prim.vertices(i,N)[3]);

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            prefetchL1(&prim.vertices(i1,N)[0]);
            prefetchL1(&prim.vertices(i1,N)[4]);
            if (mask1) {
              const size_t i2 = bsf(mask1);
              prefetchL2(&prim.vertices(i2,N)[0]);
              prefetchL2(&prim.vertices(i2,N)[4]);
            }
          }
          
          if (Intersector().intersect(pre,ray,context,geom,primID,a0,a1,a2,a3,Epilog(ray,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }